

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx::CurveNiMBIntersectorK<8,4>::
     occluded_t<embree::avx::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  Primitive PVar23;
  Geometry *pGVar24;
  __int_type_conflict _Var25;
  long lVar26;
  RTCFilterFunctionN p_Var27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [16];
  ulong uVar93;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  uint uVar103;
  uint uVar104;
  undefined1 (*pauVar105) [32];
  ulong uVar106;
  uint uVar107;
  uint uVar108;
  int iVar109;
  ulong uVar110;
  long lVar111;
  long lVar112;
  long lVar113;
  bool bVar114;
  bool bVar115;
  byte bVar116;
  float fVar117;
  float fVar146;
  float fVar147;
  __m128 a;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar120 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar148;
  float fVar174;
  float fVar177;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar178;
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  float fVar175;
  float fVar176;
  float fVar179;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar155 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar161 [16];
  undefined1 auVar173 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  float fVar205;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar186 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  float fVar206;
  float fVar230;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [28];
  float fVar229;
  float fVar231;
  float fVar232;
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  float fVar233;
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  float fVar234;
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  float fVar235;
  float fVar248;
  float fVar249;
  float fVar250;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar242 [28];
  float fVar251;
  float fVar252;
  float fVar253;
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar241 [16];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  float fVar254;
  float fVar265;
  float fVar266;
  undefined1 auVar255 [16];
  float fVar267;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar268;
  float fVar270;
  float fVar272;
  undefined1 auVar261 [32];
  float fVar269;
  float fVar271;
  float fVar273;
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  float fVar274;
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  float fVar286;
  float fVar287;
  float fVar291;
  float fVar292;
  float fVar294;
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  float fVar289;
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  float fVar288;
  float fVar290;
  float fVar293;
  float fVar295;
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  float fVar296;
  float fVar297;
  undefined1 auVar298 [16];
  float fVar310;
  float fVar312;
  float fVar318;
  float fVar321;
  float fVar324;
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  float fVar311;
  float fVar313;
  float fVar315;
  float fVar316;
  float fVar319;
  float fVar322;
  float fVar325;
  float fVar327;
  undefined1 auVar304 [32];
  float fVar314;
  float fVar317;
  float fVar320;
  float fVar323;
  float fVar326;
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  float fVar328;
  float fVar329;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar345;
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar349;
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  float fVar350;
  undefined1 auVar336 [64];
  undefined1 auVar337 [64];
  float s;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar359;
  float fVar362;
  float fVar365;
  float fVar368;
  float fVar371;
  float fVar374;
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  float fVar360;
  float fVar361;
  float fVar363;
  float fVar364;
  float fVar366;
  float fVar367;
  float fVar369;
  float fVar370;
  float fVar372;
  float fVar373;
  float fVar375;
  float fVar376;
  float fVar377;
  float fVar378;
  float fVar379;
  undefined1 auVar358 [32];
  float fVar380;
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  float fVar394;
  undefined1 auVar395 [16];
  float fVar393;
  float fVar405;
  float fVar408;
  float fVar412;
  float fVar414;
  float fVar416;
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  float fVar418;
  undefined1 auVar401 [32];
  float fVar406;
  float fVar407;
  float fVar409;
  float fVar410;
  float fVar411;
  float fVar413;
  float fVar415;
  float fVar417;
  float fVar419;
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  undefined1 auVar404 [64];
  undefined1 auVar423 [16];
  float fVar420;
  float fVar421;
  float fVar422;
  float fVar428;
  float fVar429;
  float fVar430;
  float fVar431;
  float fVar432;
  float fVar433;
  float fVar434;
  float fVar435;
  float fVar436;
  float fVar437;
  float fVar438;
  float fVar439;
  float fVar440;
  float fVar441;
  float fVar442;
  float in_register_0000151c;
  undefined1 auVar424 [32];
  undefined1 auVar425 [32];
  undefined1 auVar426 [32];
  undefined1 auVar427 [32];
  float fVar443;
  undefined1 auVar444 [16];
  float fVar450;
  float fVar452;
  float fVar456;
  float fVar457;
  float fVar458;
  undefined1 auVar445 [32];
  undefined1 auVar446 [32];
  float fVar454;
  undefined1 auVar447 [32];
  float fVar451;
  float fVar453;
  float fVar455;
  undefined1 auVar448 [32];
  undefined1 auVar449 [32];
  undefined1 auVar460 [16];
  float fVar459;
  float fVar467;
  float in_register_0000159c;
  undefined1 auVar461 [32];
  undefined1 auVar462 [32];
  undefined1 auVar464 [32];
  undefined1 auVar465 [32];
  undefined1 auVar466 [32];
  float in_register_000015dc;
  undefined1 auVar468 [32];
  undefined1 auVar469 [32];
  undefined1 auVar470 [32];
  undefined1 auVar471 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_be8;
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  float fStack_b44;
  float local_a80;
  float fStack_a7c;
  float fStack_a78;
  float fStack_a74;
  float local_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  float local_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  RTCFilterFunctionNArguments local_9b0;
  undefined1 local_980 [32];
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [16];
  undefined1 local_8f0 [8];
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_870 [16];
  undefined1 local_860 [16];
  Primitive *local_850;
  ulong local_848;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [16];
  undefined1 local_750 [16];
  RTCHitN local_740 [16];
  undefined1 auStack_730 [16];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  uint local_6d0;
  uint uStack_6cc;
  uint uStack_6c8;
  uint uStack_6c4;
  uint uStack_6c0;
  uint uStack_6bc;
  uint uStack_6b8;
  uint uStack_6b4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [16];
  undefined1 auStack_610 [16];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar463 [32];
  
  PVar23 = prim[1];
  uVar110 = (ulong)(byte)PVar23;
  lVar113 = uVar110 * 0x25;
  auVar298 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar298 = vinsertps_avx(auVar298,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar33 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar33 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar298 = vsubps_avx(auVar298,*(undefined1 (*) [16])(prim + lVar113 + 6));
  fVar206 = *(float *)(prim + lVar113 + 0x12);
  auVar149._0_4_ = fVar206 * auVar298._0_4_;
  auVar149._4_4_ = fVar206 * auVar298._4_4_;
  auVar149._8_4_ = fVar206 * auVar298._8_4_;
  auVar149._12_4_ = fVar206 * auVar298._12_4_;
  auVar298 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 4 + 6)));
  auVar255._0_4_ = fVar206 * auVar33._0_4_;
  auVar255._4_4_ = fVar206 * auVar33._4_4_;
  auVar255._8_4_ = fVar206 * auVar33._8_4_;
  auVar255._12_4_ = fVar206 * auVar33._12_4_;
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 4 + 10)));
  auVar130._16_16_ = auVar33;
  auVar130._0_16_ = auVar298;
  auVar130 = vcvtdq2ps_avx(auVar130);
  lVar26 = uVar110 * 5;
  auVar298 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar26 + 6)));
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar26 + 10)));
  auVar194._16_16_ = auVar33;
  auVar194._0_16_ = auVar298;
  auVar298 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 6 + 6)));
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 6 + 10)));
  auVar471 = vcvtdq2ps_avx(auVar194);
  auVar221._16_16_ = auVar33;
  auVar221._0_16_ = auVar298;
  auVar28 = vcvtdq2ps_avx(auVar221);
  auVar298 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 0xf + 6)));
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 0xf + 10)));
  auVar222._16_16_ = auVar33;
  auVar222._0_16_ = auVar298;
  auVar469 = vcvtdq2ps_avx(auVar222);
  lVar111 = (ulong)(byte)PVar23 * 0x10;
  auVar298 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar111 + 6)));
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar111 + 10)));
  auVar279._16_16_ = auVar33;
  auVar279._0_16_ = auVar298;
  auVar298 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar111 + uVar110 + 6)));
  auVar29 = vcvtdq2ps_avx(auVar279);
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar111 + uVar110 + 10)));
  auVar299._16_16_ = auVar33;
  auVar299._0_16_ = auVar298;
  auVar298 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 0x1a + 6)));
  auVar30 = vcvtdq2ps_avx(auVar299);
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 0x1a + 10)));
  auVar300._16_16_ = auVar33;
  auVar300._0_16_ = auVar298;
  auVar165 = vcvtdq2ps_avx(auVar300);
  auVar298 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 0x1b + 6)));
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 0x1b + 10)));
  auVar354._16_16_ = auVar33;
  auVar354._0_16_ = auVar298;
  auVar298 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 0x1c + 6)));
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 0x1c + 10)));
  auVar31 = vcvtdq2ps_avx(auVar354);
  auVar383._16_16_ = auVar33;
  auVar383._0_16_ = auVar298;
  auVar32 = vcvtdq2ps_avx(auVar383);
  auVar298 = vshufps_avx(auVar255,auVar255,0);
  auVar33 = vshufps_avx(auVar255,auVar255,0x55);
  auVar152 = vshufps_avx(auVar255,auVar255,0xaa);
  fVar206 = auVar152._0_4_;
  fVar174 = auVar152._4_4_;
  fVar229 = auVar152._8_4_;
  fVar178 = auVar152._12_4_;
  fVar205 = auVar33._0_4_;
  fVar405 = auVar33._4_4_;
  fVar230 = auVar33._8_4_;
  fVar176 = auVar33._12_4_;
  fVar231 = auVar298._0_4_;
  fVar232 = auVar298._4_4_;
  fVar233 = auVar298._8_4_;
  fVar235 = auVar298._12_4_;
  auVar424._0_4_ = fVar231 * auVar130._0_4_ + fVar205 * auVar471._0_4_ + fVar206 * auVar28._0_4_;
  auVar424._4_4_ = fVar232 * auVar130._4_4_ + fVar405 * auVar471._4_4_ + fVar174 * auVar28._4_4_;
  auVar424._8_4_ = fVar233 * auVar130._8_4_ + fVar230 * auVar471._8_4_ + fVar229 * auVar28._8_4_;
  auVar424._12_4_ = fVar235 * auVar130._12_4_ + fVar176 * auVar471._12_4_ + fVar178 * auVar28._12_4_
  ;
  auVar424._16_4_ = fVar231 * auVar130._16_4_ + fVar205 * auVar471._16_4_ + fVar206 * auVar28._16_4_
  ;
  auVar424._20_4_ = fVar232 * auVar130._20_4_ + fVar405 * auVar471._20_4_ + fVar174 * auVar28._20_4_
  ;
  auVar424._24_4_ = fVar233 * auVar130._24_4_ + fVar230 * auVar471._24_4_ + fVar229 * auVar28._24_4_
  ;
  auVar424._28_4_ = fVar176 + in_register_000015dc + in_register_0000151c;
  auVar396._0_4_ = fVar231 * auVar469._0_4_ + fVar205 * auVar29._0_4_ + auVar30._0_4_ * fVar206;
  auVar396._4_4_ = fVar232 * auVar469._4_4_ + fVar405 * auVar29._4_4_ + auVar30._4_4_ * fVar174;
  auVar396._8_4_ = fVar233 * auVar469._8_4_ + fVar230 * auVar29._8_4_ + auVar30._8_4_ * fVar229;
  auVar396._12_4_ = fVar235 * auVar469._12_4_ + fVar176 * auVar29._12_4_ + auVar30._12_4_ * fVar178;
  auVar396._16_4_ = fVar231 * auVar469._16_4_ + fVar205 * auVar29._16_4_ + auVar30._16_4_ * fVar206;
  auVar396._20_4_ = fVar232 * auVar469._20_4_ + fVar405 * auVar29._20_4_ + auVar30._20_4_ * fVar174;
  auVar396._24_4_ = fVar233 * auVar469._24_4_ + fVar230 * auVar29._24_4_ + auVar30._24_4_ * fVar229;
  auVar396._28_4_ = fVar176 + in_register_000015dc + in_register_0000159c;
  auVar261._0_4_ = fVar231 * auVar165._0_4_ + fVar205 * auVar31._0_4_ + auVar32._0_4_ * fVar206;
  auVar261._4_4_ = fVar232 * auVar165._4_4_ + fVar405 * auVar31._4_4_ + auVar32._4_4_ * fVar174;
  auVar261._8_4_ = fVar233 * auVar165._8_4_ + fVar230 * auVar31._8_4_ + auVar32._8_4_ * fVar229;
  auVar261._12_4_ = fVar235 * auVar165._12_4_ + fVar176 * auVar31._12_4_ + auVar32._12_4_ * fVar178;
  auVar261._16_4_ = fVar231 * auVar165._16_4_ + fVar205 * auVar31._16_4_ + auVar32._16_4_ * fVar206;
  auVar261._20_4_ = fVar232 * auVar165._20_4_ + fVar405 * auVar31._20_4_ + auVar32._20_4_ * fVar174;
  auVar261._24_4_ = fVar233 * auVar165._24_4_ + fVar230 * auVar31._24_4_ + auVar32._24_4_ * fVar229;
  auVar261._28_4_ = fVar235 + fVar176 + fVar178;
  auVar298 = vshufps_avx(auVar149,auVar149,0);
  auVar33 = vshufps_avx(auVar149,auVar149,0x55);
  auVar152 = vshufps_avx(auVar149,auVar149,0xaa);
  fVar206 = auVar152._0_4_;
  fVar174 = auVar152._4_4_;
  fVar229 = auVar152._8_4_;
  fVar178 = auVar152._12_4_;
  fVar232 = auVar33._0_4_;
  fVar233 = auVar33._4_4_;
  fVar235 = auVar33._8_4_;
  fVar248 = auVar33._12_4_;
  fVar205 = auVar471._28_4_ + auVar28._28_4_;
  fVar405 = auVar298._0_4_;
  fVar230 = auVar298._4_4_;
  fVar176 = auVar298._8_4_;
  fVar231 = auVar298._12_4_;
  auVar162._0_4_ = fVar405 * auVar130._0_4_ + fVar232 * auVar471._0_4_ + fVar206 * auVar28._0_4_;
  auVar162._4_4_ = fVar230 * auVar130._4_4_ + fVar233 * auVar471._4_4_ + fVar174 * auVar28._4_4_;
  auVar162._8_4_ = fVar176 * auVar130._8_4_ + fVar235 * auVar471._8_4_ + fVar229 * auVar28._8_4_;
  auVar162._12_4_ = fVar231 * auVar130._12_4_ + fVar248 * auVar471._12_4_ + fVar178 * auVar28._12_4_
  ;
  auVar162._16_4_ = fVar405 * auVar130._16_4_ + fVar232 * auVar471._16_4_ + fVar206 * auVar28._16_4_
  ;
  auVar162._20_4_ = fVar230 * auVar130._20_4_ + fVar233 * auVar471._20_4_ + fVar174 * auVar28._20_4_
  ;
  auVar162._24_4_ = fVar176 * auVar130._24_4_ + fVar235 * auVar471._24_4_ + fVar229 * auVar28._24_4_
  ;
  auVar162._28_4_ = auVar130._28_4_ + fVar205;
  auVar131._0_4_ = fVar405 * auVar469._0_4_ + auVar30._0_4_ * fVar206 + fVar232 * auVar29._0_4_;
  auVar131._4_4_ = fVar230 * auVar469._4_4_ + auVar30._4_4_ * fVar174 + fVar233 * auVar29._4_4_;
  auVar131._8_4_ = fVar176 * auVar469._8_4_ + auVar30._8_4_ * fVar229 + fVar235 * auVar29._8_4_;
  auVar131._12_4_ = fVar231 * auVar469._12_4_ + auVar30._12_4_ * fVar178 + fVar248 * auVar29._12_4_;
  auVar131._16_4_ = fVar405 * auVar469._16_4_ + auVar30._16_4_ * fVar206 + fVar232 * auVar29._16_4_;
  auVar131._20_4_ = fVar230 * auVar469._20_4_ + auVar30._20_4_ * fVar174 + fVar233 * auVar29._20_4_;
  auVar131._24_4_ = fVar176 * auVar469._24_4_ + auVar30._24_4_ * fVar229 + fVar235 * auVar29._24_4_;
  auVar131._28_4_ = auVar130._28_4_ + auVar30._28_4_ + auVar28._28_4_;
  auVar301._8_4_ = 0x7fffffff;
  auVar301._0_8_ = 0x7fffffff7fffffff;
  auVar301._12_4_ = 0x7fffffff;
  auVar301._16_4_ = 0x7fffffff;
  auVar301._20_4_ = 0x7fffffff;
  auVar301._24_4_ = 0x7fffffff;
  auVar301._28_4_ = 0x7fffffff;
  auVar330._8_4_ = 0x219392ef;
  auVar330._0_8_ = 0x219392ef219392ef;
  auVar330._12_4_ = 0x219392ef;
  auVar330._16_4_ = 0x219392ef;
  auVar330._20_4_ = 0x219392ef;
  auVar330._24_4_ = 0x219392ef;
  auVar330._28_4_ = 0x219392ef;
  auVar130 = vandps_avx(auVar424,auVar301);
  auVar130 = vcmpps_avx(auVar130,auVar330,1);
  auVar471 = vblendvps_avx(auVar424,auVar330,auVar130);
  auVar130 = vandps_avx(auVar396,auVar301);
  auVar130 = vcmpps_avx(auVar130,auVar330,1);
  auVar28 = vblendvps_avx(auVar396,auVar330,auVar130);
  auVar130 = vandps_avx(auVar261,auVar301);
  auVar130 = vcmpps_avx(auVar130,auVar330,1);
  auVar130 = vblendvps_avx(auVar261,auVar330,auVar130);
  auVar195._0_4_ = fVar405 * auVar165._0_4_ + fVar232 * auVar31._0_4_ + auVar32._0_4_ * fVar206;
  auVar195._4_4_ = fVar230 * auVar165._4_4_ + fVar233 * auVar31._4_4_ + auVar32._4_4_ * fVar174;
  auVar195._8_4_ = fVar176 * auVar165._8_4_ + fVar235 * auVar31._8_4_ + auVar32._8_4_ * fVar229;
  auVar195._12_4_ = fVar231 * auVar165._12_4_ + fVar248 * auVar31._12_4_ + auVar32._12_4_ * fVar178;
  auVar195._16_4_ = fVar405 * auVar165._16_4_ + fVar232 * auVar31._16_4_ + auVar32._16_4_ * fVar206;
  auVar195._20_4_ = fVar230 * auVar165._20_4_ + fVar233 * auVar31._20_4_ + auVar32._20_4_ * fVar174;
  auVar195._24_4_ = fVar176 * auVar165._24_4_ + fVar235 * auVar31._24_4_ + auVar32._24_4_ * fVar229;
  auVar195._28_4_ = fVar205 + auVar29._28_4_ + fVar178;
  auVar469 = vrcpps_avx(auVar471);
  fVar206 = auVar469._0_4_;
  fVar229 = auVar469._4_4_;
  auVar29._4_4_ = auVar471._4_4_ * fVar229;
  auVar29._0_4_ = auVar471._0_4_ * fVar206;
  fVar205 = auVar469._8_4_;
  auVar29._8_4_ = auVar471._8_4_ * fVar205;
  fVar230 = auVar469._12_4_;
  auVar29._12_4_ = auVar471._12_4_ * fVar230;
  fVar231 = auVar469._16_4_;
  auVar29._16_4_ = auVar471._16_4_ * fVar231;
  fVar232 = auVar469._20_4_;
  auVar29._20_4_ = auVar471._20_4_ * fVar232;
  fVar233 = auVar469._24_4_;
  auVar29._24_4_ = auVar471._24_4_ * fVar233;
  auVar29._28_4_ = auVar471._28_4_;
  auVar331._8_4_ = 0x3f800000;
  auVar331._0_8_ = 0x3f8000003f800000;
  auVar331._12_4_ = 0x3f800000;
  auVar331._16_4_ = 0x3f800000;
  auVar331._20_4_ = 0x3f800000;
  auVar331._24_4_ = 0x3f800000;
  auVar331._28_4_ = 0x3f800000;
  auVar30 = vsubps_avx(auVar331,auVar29);
  auVar29 = vrcpps_avx(auVar28);
  fVar206 = fVar206 + fVar206 * auVar30._0_4_;
  fVar229 = fVar229 + fVar229 * auVar30._4_4_;
  fVar205 = fVar205 + fVar205 * auVar30._8_4_;
  fVar230 = fVar230 + fVar230 * auVar30._12_4_;
  fVar231 = fVar231 + fVar231 * auVar30._16_4_;
  fVar232 = fVar232 + fVar232 * auVar30._20_4_;
  fVar233 = fVar233 + fVar233 * auVar30._24_4_;
  fVar235 = auVar29._0_4_;
  fVar248 = auVar29._4_4_;
  auVar471._4_4_ = fVar248 * auVar28._4_4_;
  auVar471._0_4_ = fVar235 * auVar28._0_4_;
  fVar249 = auVar29._8_4_;
  auVar471._8_4_ = fVar249 * auVar28._8_4_;
  fVar250 = auVar29._12_4_;
  auVar471._12_4_ = fVar250 * auVar28._12_4_;
  fVar251 = auVar29._16_4_;
  auVar471._16_4_ = fVar251 * auVar28._16_4_;
  fVar252 = auVar29._20_4_;
  auVar471._20_4_ = fVar252 * auVar28._20_4_;
  fVar253 = auVar29._24_4_;
  auVar471._24_4_ = fVar253 * auVar28._24_4_;
  auVar471._28_4_ = auVar28._28_4_;
  auVar28 = vsubps_avx(auVar331,auVar471);
  fVar235 = fVar235 + fVar235 * auVar28._0_4_;
  fVar248 = fVar248 + fVar248 * auVar28._4_4_;
  fVar249 = fVar249 + fVar249 * auVar28._8_4_;
  fVar250 = fVar250 + fVar250 * auVar28._12_4_;
  fVar251 = fVar251 + fVar251 * auVar28._16_4_;
  fVar252 = fVar252 + fVar252 * auVar28._20_4_;
  fVar253 = fVar253 + fVar253 * auVar28._24_4_;
  auVar471 = vrcpps_avx(auVar130);
  fVar254 = auVar471._0_4_;
  fVar265 = auVar471._4_4_;
  auVar165._4_4_ = fVar265 * auVar130._4_4_;
  auVar165._0_4_ = fVar254 * auVar130._0_4_;
  fVar266 = auVar471._8_4_;
  auVar165._8_4_ = fVar266 * auVar130._8_4_;
  fVar267 = auVar471._12_4_;
  auVar165._12_4_ = fVar267 * auVar130._12_4_;
  fVar268 = auVar471._16_4_;
  auVar165._16_4_ = fVar268 * auVar130._16_4_;
  fVar270 = auVar471._20_4_;
  auVar165._20_4_ = fVar270 * auVar130._20_4_;
  fVar272 = auVar471._24_4_;
  auVar165._24_4_ = fVar272 * auVar130._24_4_;
  auVar165._28_4_ = auVar130._28_4_;
  auVar130 = vsubps_avx(auVar331,auVar165);
  fVar254 = fVar254 + fVar254 * auVar130._0_4_;
  fVar265 = fVar265 + fVar265 * auVar130._4_4_;
  fVar266 = fVar266 + fVar266 * auVar130._8_4_;
  fVar267 = fVar267 + fVar267 * auVar130._12_4_;
  fVar268 = fVar268 + fVar268 * auVar130._16_4_;
  fVar270 = fVar270 + fVar270 * auVar130._20_4_;
  fVar272 = fVar272 + fVar272 * auVar130._24_4_;
  auVar298 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar113 + 0x16)) *
                           *(float *)(prim + lVar113 + 0x1a)));
  auVar34 = vshufps_avx(auVar298,auVar298,0);
  auVar298._8_8_ = 0;
  auVar298._0_8_ = *(ulong *)(prim + uVar110 * 7 + 6);
  auVar298 = vpmovsxwd_avx(auVar298);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar110 * 7 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar33);
  auVar302._16_16_ = auVar33;
  auVar302._0_16_ = auVar298;
  auVar130 = vcvtdq2ps_avx(auVar302);
  auVar152._8_8_ = 0;
  auVar152._0_8_ = *(ulong *)(prim + uVar110 * 0xb + 6);
  auVar298 = vpmovsxwd_avx(auVar152);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar110 * 0xb + 0xe);
  auVar33 = vpmovsxwd_avx(auVar10);
  auVar332._16_16_ = auVar33;
  auVar332._0_16_ = auVar298;
  auVar471 = vcvtdq2ps_avx(auVar332);
  auVar471 = vsubps_avx(auVar471,auVar130);
  fVar174 = auVar34._0_4_;
  fVar178 = auVar34._4_4_;
  fVar405 = auVar34._8_4_;
  fVar176 = auVar34._12_4_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar110 * 9 + 6);
  auVar298 = vpmovsxwd_avx(auVar34);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar110 * 9 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar11);
  auVar303._0_4_ = auVar471._0_4_ * fVar174 + auVar130._0_4_;
  auVar303._4_4_ = auVar471._4_4_ * fVar178 + auVar130._4_4_;
  auVar303._8_4_ = auVar471._8_4_ * fVar405 + auVar130._8_4_;
  auVar303._12_4_ = auVar471._12_4_ * fVar176 + auVar130._12_4_;
  auVar303._16_4_ = auVar471._16_4_ * fVar174 + auVar130._16_4_;
  auVar303._20_4_ = auVar471._20_4_ * fVar178 + auVar130._20_4_;
  auVar303._24_4_ = auVar471._24_4_ * fVar405 + auVar130._24_4_;
  auVar303._28_4_ = auVar471._28_4_ + auVar130._28_4_;
  auVar333._16_16_ = auVar33;
  auVar333._0_16_ = auVar298;
  auVar130 = vcvtdq2ps_avx(auVar333);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar110 * 0xd + 6);
  auVar298 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar110 * 0xd + 0xe);
  auVar33 = vpmovsxwd_avx(auVar13);
  auVar355._16_16_ = auVar33;
  auVar355._0_16_ = auVar298;
  auVar471 = vcvtdq2ps_avx(auVar355);
  auVar471 = vsubps_avx(auVar471,auVar130);
  auVar190._8_8_ = 0;
  auVar190._0_8_ = *(ulong *)(prim + uVar110 * 0x12 + 6);
  auVar298 = vpmovsxwd_avx(auVar190);
  auVar215._8_8_ = 0;
  auVar215._0_8_ = *(ulong *)(prim + uVar110 * 0x12 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar215);
  auVar334._0_4_ = auVar130._0_4_ + auVar471._0_4_ * fVar174;
  auVar334._4_4_ = auVar130._4_4_ + auVar471._4_4_ * fVar178;
  auVar334._8_4_ = auVar130._8_4_ + auVar471._8_4_ * fVar405;
  auVar334._12_4_ = auVar130._12_4_ + auVar471._12_4_ * fVar176;
  auVar334._16_4_ = auVar130._16_4_ + auVar471._16_4_ * fVar174;
  auVar334._20_4_ = auVar130._20_4_ + auVar471._20_4_ * fVar178;
  auVar334._24_4_ = auVar130._24_4_ + auVar471._24_4_ * fVar405;
  auVar334._28_4_ = auVar130._28_4_ + auVar471._28_4_;
  auVar356._16_16_ = auVar33;
  auVar356._0_16_ = auVar298;
  auVar130 = vcvtdq2ps_avx(auVar356);
  uVar106 = (ulong)(uint)((int)lVar26 << 2);
  lVar113 = uVar110 * 2 + uVar106;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = *(ulong *)(prim + lVar113 + 6);
  auVar298 = vpmovsxwd_avx(auVar126);
  auVar156._8_8_ = 0;
  auVar156._0_8_ = *(ulong *)(prim + lVar113 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar156);
  auVar384._16_16_ = auVar33;
  auVar384._0_16_ = auVar298;
  auVar471 = vcvtdq2ps_avx(auVar384);
  auVar471 = vsubps_avx(auVar471,auVar130);
  auVar395._8_8_ = 0;
  auVar395._0_8_ = *(ulong *)(prim + uVar106 + 6);
  auVar298 = vpmovsxwd_avx(auVar395);
  auVar357._0_4_ = auVar130._0_4_ + auVar471._0_4_ * fVar174;
  auVar357._4_4_ = auVar130._4_4_ + auVar471._4_4_ * fVar178;
  auVar357._8_4_ = auVar130._8_4_ + auVar471._8_4_ * fVar405;
  auVar357._12_4_ = auVar130._12_4_ + auVar471._12_4_ * fVar176;
  auVar357._16_4_ = auVar130._16_4_ + auVar471._16_4_ * fVar174;
  auVar357._20_4_ = auVar130._20_4_ + auVar471._20_4_ * fVar178;
  auVar357._24_4_ = auVar130._24_4_ + auVar471._24_4_ * fVar405;
  auVar357._28_4_ = auVar130._28_4_ + auVar471._28_4_;
  auVar157._8_8_ = 0;
  auVar157._0_8_ = *(ulong *)(prim + uVar106 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar157);
  auVar385._16_16_ = auVar33;
  auVar385._0_16_ = auVar298;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar110 * 0x18 + 6);
  auVar298 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar110 * 0x18 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar15);
  auVar130 = vcvtdq2ps_avx(auVar385);
  auVar397._16_16_ = auVar33;
  auVar397._0_16_ = auVar298;
  auVar471 = vcvtdq2ps_avx(auVar397);
  auVar471 = vsubps_avx(auVar471,auVar130);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar110 * 0x1d + 6);
  auVar298 = vpmovsxwd_avx(auVar16);
  auVar386._0_4_ = auVar130._0_4_ + auVar471._0_4_ * fVar174;
  auVar386._4_4_ = auVar130._4_4_ + auVar471._4_4_ * fVar178;
  auVar386._8_4_ = auVar130._8_4_ + auVar471._8_4_ * fVar405;
  auVar386._12_4_ = auVar130._12_4_ + auVar471._12_4_ * fVar176;
  auVar386._16_4_ = auVar130._16_4_ + auVar471._16_4_ * fVar174;
  auVar386._20_4_ = auVar130._20_4_ + auVar471._20_4_ * fVar178;
  auVar386._24_4_ = auVar130._24_4_ + auVar471._24_4_ * fVar405;
  auVar386._28_4_ = auVar130._28_4_ + auVar471._28_4_;
  auVar160._8_8_ = 0;
  auVar160._0_8_ = *(ulong *)(prim + uVar110 * 0x1d + 0xe);
  auVar33 = vpmovsxwd_avx(auVar160);
  lVar113 = uVar110 + (ulong)(byte)PVar23 * 0x20;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + lVar113 + 6);
  auVar152 = vpmovsxwd_avx(auVar17);
  auVar398._16_16_ = auVar33;
  auVar398._0_16_ = auVar298;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + lVar113 + 0xe);
  auVar298 = vpmovsxwd_avx(auVar18);
  auVar425._16_16_ = auVar298;
  auVar425._0_16_ = auVar152;
  auVar130 = vcvtdq2ps_avx(auVar398);
  auVar471 = vcvtdq2ps_avx(auVar425);
  auVar471 = vsubps_avx(auVar471,auVar130);
  auVar399._0_4_ = auVar130._0_4_ + auVar471._0_4_ * fVar174;
  auVar399._4_4_ = auVar130._4_4_ + auVar471._4_4_ * fVar178;
  auVar399._8_4_ = auVar130._8_4_ + auVar471._8_4_ * fVar405;
  auVar399._12_4_ = auVar130._12_4_ + auVar471._12_4_ * fVar176;
  auVar399._16_4_ = auVar130._16_4_ + auVar471._16_4_ * fVar174;
  auVar399._20_4_ = auVar130._20_4_ + auVar471._20_4_ * fVar178;
  auVar399._24_4_ = auVar130._24_4_ + auVar471._24_4_ * fVar405;
  auVar399._28_4_ = auVar130._28_4_ + auVar471._28_4_;
  lVar113 = (ulong)(byte)PVar23 * 0x20 - uVar110;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + lVar113 + 6);
  auVar298 = vpmovsxwd_avx(auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + lVar113 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar20);
  auVar426._16_16_ = auVar33;
  auVar426._0_16_ = auVar298;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar110 * 0x23 + 6);
  auVar298 = vpmovsxwd_avx(auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar110 * 0x23 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar22);
  auVar445._16_16_ = auVar33;
  auVar445._0_16_ = auVar298;
  auVar130 = vcvtdq2ps_avx(auVar426);
  auVar471 = vcvtdq2ps_avx(auVar445);
  auVar471 = vsubps_avx(auVar471,auVar130);
  auVar427._0_4_ = auVar130._0_4_ + auVar471._0_4_ * fVar174;
  auVar427._4_4_ = auVar130._4_4_ + auVar471._4_4_ * fVar178;
  auVar427._8_4_ = auVar130._8_4_ + auVar471._8_4_ * fVar405;
  auVar427._12_4_ = auVar130._12_4_ + auVar471._12_4_ * fVar176;
  auVar427._16_4_ = auVar130._16_4_ + auVar471._16_4_ * fVar174;
  auVar427._20_4_ = auVar130._20_4_ + auVar471._20_4_ * fVar178;
  auVar427._24_4_ = auVar130._24_4_ + auVar471._24_4_ * fVar405;
  auVar427._28_4_ = auVar130._28_4_ + fVar176;
  auVar130 = vsubps_avx(auVar303,auVar162);
  auVar275._0_4_ = fVar206 * auVar130._0_4_;
  auVar275._4_4_ = fVar229 * auVar130._4_4_;
  auVar275._8_4_ = fVar205 * auVar130._8_4_;
  auVar275._12_4_ = fVar230 * auVar130._12_4_;
  auVar31._16_4_ = fVar231 * auVar130._16_4_;
  auVar31._0_16_ = auVar275;
  auVar31._20_4_ = fVar232 * auVar130._20_4_;
  auVar31._24_4_ = fVar233 * auVar130._24_4_;
  auVar31._28_4_ = auVar130._28_4_;
  auVar130 = vsubps_avx(auVar334,auVar162);
  auVar207._0_4_ = fVar206 * auVar130._0_4_;
  auVar207._4_4_ = fVar229 * auVar130._4_4_;
  auVar207._8_4_ = fVar205 * auVar130._8_4_;
  auVar207._12_4_ = fVar230 * auVar130._12_4_;
  auVar32._16_4_ = fVar231 * auVar130._16_4_;
  auVar32._0_16_ = auVar207;
  auVar32._20_4_ = fVar232 * auVar130._20_4_;
  auVar32._24_4_ = fVar233 * auVar130._24_4_;
  auVar32._28_4_ = auVar469._28_4_ + auVar30._28_4_;
  auVar130 = vsubps_avx(auVar357,auVar131);
  auVar150._0_4_ = fVar235 * auVar130._0_4_;
  auVar150._4_4_ = fVar248 * auVar130._4_4_;
  auVar150._8_4_ = fVar249 * auVar130._8_4_;
  auVar150._12_4_ = fVar250 * auVar130._12_4_;
  auVar469._16_4_ = fVar251 * auVar130._16_4_;
  auVar469._0_16_ = auVar150;
  auVar469._20_4_ = fVar252 * auVar130._20_4_;
  auVar469._24_4_ = fVar253 * auVar130._24_4_;
  auVar469._28_4_ = auVar130._28_4_;
  auVar130 = vsubps_avx(auVar386,auVar131);
  auVar236._0_4_ = fVar235 * auVar130._0_4_;
  auVar236._4_4_ = fVar248 * auVar130._4_4_;
  auVar236._8_4_ = fVar249 * auVar130._8_4_;
  auVar236._12_4_ = fVar250 * auVar130._12_4_;
  auVar30._16_4_ = fVar251 * auVar130._16_4_;
  auVar30._0_16_ = auVar236;
  auVar30._20_4_ = fVar252 * auVar130._20_4_;
  auVar30._24_4_ = fVar253 * auVar130._24_4_;
  auVar30._28_4_ = auVar29._28_4_ + auVar28._28_4_;
  auVar130 = vsubps_avx(auVar399,auVar195);
  auVar118._0_4_ = fVar254 * auVar130._0_4_;
  auVar118._4_4_ = fVar265 * auVar130._4_4_;
  auVar118._8_4_ = fVar266 * auVar130._8_4_;
  auVar118._12_4_ = fVar267 * auVar130._12_4_;
  auVar28._16_4_ = fVar268 * auVar130._16_4_;
  auVar28._0_16_ = auVar118;
  auVar28._20_4_ = fVar270 * auVar130._20_4_;
  auVar28._24_4_ = fVar272 * auVar130._24_4_;
  auVar28._28_4_ = auVar130._28_4_;
  auVar130 = vsubps_avx(auVar427,auVar195);
  auVar180._0_4_ = fVar254 * auVar130._0_4_;
  auVar180._4_4_ = fVar265 * auVar130._4_4_;
  auVar180._8_4_ = fVar266 * auVar130._8_4_;
  auVar180._12_4_ = fVar267 * auVar130._12_4_;
  auVar390._16_4_ = fVar268 * auVar130._16_4_;
  auVar390._0_16_ = auVar180;
  auVar390._20_4_ = fVar270 * auVar130._20_4_;
  auVar390._24_4_ = fVar272 * auVar130._24_4_;
  auVar390._28_4_ = auVar130._28_4_;
  auVar298 = vpminsd_avx(auVar31._16_16_,auVar32._16_16_);
  auVar33 = vpminsd_avx(auVar275,auVar207);
  auVar335._16_16_ = auVar298;
  auVar335._0_16_ = auVar33;
  auVar298 = vpminsd_avx(auVar469._16_16_,auVar30._16_16_);
  auVar33 = vpminsd_avx(auVar150,auVar236);
  auVar400._16_16_ = auVar298;
  auVar400._0_16_ = auVar33;
  auVar130 = vmaxps_avx(auVar335,auVar400);
  auVar298 = vpminsd_avx(auVar28._16_16_,auVar390._16_16_);
  auVar33 = vpminsd_avx(auVar118,auVar180);
  auVar446._16_16_ = auVar298;
  auVar446._0_16_ = auVar33;
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar461._4_4_ = uVar8;
  auVar461._0_4_ = uVar8;
  auVar461._8_4_ = uVar8;
  auVar461._12_4_ = uVar8;
  auVar461._16_4_ = uVar8;
  auVar461._20_4_ = uVar8;
  auVar461._24_4_ = uVar8;
  auVar461._28_4_ = uVar8;
  auVar471 = vmaxps_avx(auVar446,auVar461);
  auVar130 = vmaxps_avx(auVar130,auVar471);
  local_2c0._4_4_ = auVar130._4_4_ * 0.99999964;
  local_2c0._0_4_ = auVar130._0_4_ * 0.99999964;
  local_2c0._8_4_ = auVar130._8_4_ * 0.99999964;
  local_2c0._12_4_ = auVar130._12_4_ * 0.99999964;
  local_2c0._16_4_ = auVar130._16_4_ * 0.99999964;
  local_2c0._20_4_ = auVar130._20_4_ * 0.99999964;
  local_2c0._24_4_ = auVar130._24_4_ * 0.99999964;
  local_2c0._28_4_ = auVar130._28_4_;
  auVar298 = vpmaxsd_avx(auVar31._16_16_,auVar32._16_16_);
  auVar33 = vpmaxsd_avx(auVar275,auVar207);
  auVar223._16_16_ = auVar298;
  auVar223._0_16_ = auVar33;
  auVar298 = vpmaxsd_avx(auVar469._16_16_,auVar30._16_16_);
  auVar33 = vpmaxsd_avx(auVar150,auVar236);
  auVar163._16_16_ = auVar298;
  auVar163._0_16_ = auVar33;
  auVar130 = vminps_avx(auVar223,auVar163);
  auVar298 = vpmaxsd_avx(auVar28._16_16_,auVar390._16_16_);
  auVar33 = vpmaxsd_avx(auVar118,auVar180);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar196._4_4_ = uVar8;
  auVar196._0_4_ = uVar8;
  auVar196._8_4_ = uVar8;
  auVar196._12_4_ = uVar8;
  auVar196._16_4_ = uVar8;
  auVar196._20_4_ = uVar8;
  auVar196._24_4_ = uVar8;
  auVar196._28_4_ = uVar8;
  auVar132._16_16_ = auVar298;
  auVar132._0_16_ = auVar33;
  auVar471 = vminps_avx(auVar132,auVar196);
  auVar130 = vminps_avx(auVar130,auVar471);
  auVar35._4_4_ = auVar130._4_4_ * 1.0000004;
  auVar35._0_4_ = auVar130._0_4_ * 1.0000004;
  auVar35._8_4_ = auVar130._8_4_ * 1.0000004;
  auVar35._12_4_ = auVar130._12_4_ * 1.0000004;
  auVar35._16_4_ = auVar130._16_4_ * 1.0000004;
  auVar35._20_4_ = auVar130._20_4_ * 1.0000004;
  auVar35._24_4_ = auVar130._24_4_ * 1.0000004;
  auVar35._28_4_ = auVar130._28_4_;
  auVar130 = vcmpps_avx(local_2c0,auVar35,2);
  auVar298 = vpshufd_avx(ZEXT116((byte)PVar23),0);
  auVar164._16_16_ = auVar298;
  auVar164._0_16_ = auVar298;
  auVar471 = vcvtdq2ps_avx(auVar164);
  auVar471 = vcmpps_avx(_DAT_01faff40,auVar471,1);
  auVar130 = vandps_avx(auVar130,auVar471);
  uVar103 = vmovmskps_avx(auVar130);
  if (uVar103 == 0) {
    return false;
  }
  auVar133._16_16_ = mm_lookupmask_ps._240_16_;
  auVar133._0_16_ = mm_lookupmask_ps._240_16_;
  uVar103 = uVar103 & 0xff;
  local_280 = vblendps_avx(auVar133,ZEXT832(0) << 0x20,0x80);
  local_850 = prim;
LAB_011a841d:
  local_848 = (ulong)uVar103;
  lVar113 = 0;
  if (local_848 != 0) {
    for (; (uVar103 >> lVar113 & 1) == 0; lVar113 = lVar113 + 1) {
    }
  }
  uVar103 = *(uint *)(local_850 + 2);
  pGVar24 = (context->scene->geometries).items[uVar103].ptr;
  uVar110 = (ulong)*(uint *)(*(long *)&pGVar24->field_0x58 +
                            (ulong)*(uint *)(local_850 + lVar113 * 4 + 6) *
                            pGVar24[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar206 = (pGVar24->time_range).lower;
  fVar206 = pGVar24->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar206) / ((pGVar24->time_range).upper - fVar206));
  auVar298 = vroundss_avx(ZEXT416((uint)fVar206),ZEXT416((uint)fVar206),9);
  auVar298 = vminss_avx(auVar298,ZEXT416((uint)(pGVar24->fnumTimeSegments + -1.0)));
  auVar298 = vmaxss_avx(ZEXT816(0) << 0x20,auVar298);
  fVar206 = fVar206 - auVar298._0_4_;
  _Var25 = pGVar24[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar112 = (long)(int)auVar298._0_4_ * 0x38;
  lVar26 = *(long *)(_Var25 + lVar112);
  lVar111 = *(long *)(_Var25 + 0x10 + lVar112);
  auVar298 = vshufps_avx(ZEXT416((uint)(1.0 - fVar206)),ZEXT416((uint)(1.0 - fVar206)),0);
  pfVar1 = (float *)(lVar26 + lVar111 * uVar110);
  fVar231 = auVar298._0_4_;
  fVar232 = auVar298._4_4_;
  fVar233 = auVar298._8_4_;
  fVar235 = auVar298._12_4_;
  pfVar2 = (float *)(lVar26 + lVar111 * (uVar110 + 1));
  pfVar3 = (float *)(lVar26 + lVar111 * (uVar110 + 2));
  pfVar4 = (float *)(lVar26 + lVar111 * (uVar110 + 3));
  lVar26 = *(long *)(_Var25 + 0x38 + lVar112);
  lVar111 = *(long *)(_Var25 + 0x48 + lVar112);
  auVar298 = vshufps_avx(ZEXT416((uint)fVar206),ZEXT416((uint)fVar206),0);
  pfVar5 = (float *)(lVar26 + uVar110 * lVar111);
  fVar248 = auVar298._0_4_;
  fVar249 = auVar298._4_4_;
  fVar250 = auVar298._8_4_;
  fVar251 = auVar298._12_4_;
  pfVar6 = (float *)(lVar26 + (uVar110 + 1) * lVar111);
  pfVar7 = (float *)(lVar26 + (uVar110 + 2) * lVar111);
  auVar237._0_4_ = fVar248 * *pfVar5 + fVar231 * *pfVar1;
  auVar237._4_4_ = fVar249 * pfVar5[1] + fVar232 * pfVar1[1];
  auVar237._8_4_ = fVar250 * pfVar5[2] + fVar233 * pfVar1[2];
  auVar237._12_4_ = fVar251 * pfVar5[3] + fVar235 * pfVar1[3];
  auVar298 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar33 = vinsertps_avx(auVar298,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar336 = ZEXT1664(auVar33);
  fVar206 = *(float *)(ray + k * 4 + 0x40);
  auVar423._4_4_ = fVar206;
  auVar423._0_4_ = fVar206;
  auVar423._8_4_ = fVar206;
  auVar423._12_4_ = fVar206;
  fVar174 = *(float *)(ray + k * 4 + 0x50);
  auVar444._4_4_ = fVar174;
  auVar444._0_4_ = fVar174;
  auVar444._8_4_ = fVar174;
  auVar444._12_4_ = fVar174;
  fStack_7d0 = fVar174;
  _local_7e0 = auVar444;
  fStack_7cc = fVar174;
  fStack_7c8 = fVar174;
  fStack_7c4 = fVar174;
  auVar256._0_4_ = fVar231 * *pfVar2 + fVar248 * *pfVar6;
  auVar256._4_4_ = fVar232 * pfVar2[1] + fVar249 * pfVar6[1];
  auVar256._8_4_ = fVar233 * pfVar2[2] + fVar250 * pfVar6[2];
  auVar256._12_4_ = fVar235 * pfVar2[3] + fVar251 * pfVar6[3];
  auVar298 = vunpcklps_avx(auVar423,auVar444);
  fVar229 = *(float *)(ray + k * 4 + 0x60);
  auVar460._4_4_ = fVar229;
  auVar460._0_4_ = fVar229;
  auVar460._8_4_ = fVar229;
  auVar460._12_4_ = fVar229;
  fStack_950 = fVar229;
  _local_960 = auVar460;
  fStack_94c = fVar229;
  fStack_948 = fVar229;
  register0x0000159c = fVar229;
  _local_8f0 = vinsertps_avx(auVar298,auVar460,0x28);
  auVar119._0_4_ = (auVar237._0_4_ + auVar256._0_4_) * 0.5;
  auVar119._4_4_ = (auVar237._4_4_ + auVar256._4_4_) * 0.5;
  auVar119._8_4_ = (auVar237._8_4_ + auVar256._8_4_) * 0.5;
  auVar119._12_4_ = (auVar237._12_4_ + auVar256._12_4_) * 0.5;
  auVar298 = vsubps_avx(auVar119,auVar33);
  auVar298 = vdpps_avx(auVar298,_local_8f0,0x7f);
  local_900 = vdpps_avx(_local_8f0,_local_8f0,0x7f);
  auVar404 = ZEXT1664(local_900);
  auVar208._0_4_ = fVar231 * *pfVar3 + fVar248 * *pfVar7;
  auVar208._4_4_ = fVar232 * pfVar3[1] + fVar249 * pfVar7[1];
  auVar208._8_4_ = fVar233 * pfVar3[2] + fVar250 * pfVar7[2];
  auVar208._12_4_ = fVar235 * pfVar3[3] + fVar251 * pfVar7[3];
  auVar152 = vrcpss_avx(local_900,local_900);
  fVar176 = auVar298._0_4_ * auVar152._0_4_ * (2.0 - local_900._0_4_ * auVar152._0_4_);
  auVar298 = vshufps_avx(ZEXT416((uint)fVar176),ZEXT416((uint)fVar176),0);
  fVar178 = auVar298._0_4_;
  fVar205 = auVar298._4_4_;
  fVar405 = auVar298._8_4_;
  fVar230 = auVar298._12_4_;
  auVar276._0_4_ = auVar33._0_4_ + local_8f0._0_4_ * fVar178;
  auVar276._4_4_ = auVar33._4_4_ + local_8f0._4_4_ * fVar205;
  auVar276._8_4_ = auVar33._8_4_ + local_8f0._8_4_ * fVar405;
  auVar276._12_4_ = auVar33._12_4_ + local_8f0._12_4_ * fVar230;
  auVar298 = vblendps_avx(auVar276,_DAT_01f7aa10,8);
  auVar34 = vsubps_avx(auVar237,auVar298);
  auVar11 = vsubps_avx(auVar208,auVar298);
  pfVar1 = (float *)(lVar26 + lVar111 * (uVar110 + 3));
  auVar151._0_4_ = fVar231 * *pfVar4 + fVar248 * *pfVar1;
  auVar151._4_4_ = fVar232 * pfVar4[1] + fVar249 * pfVar1[1];
  auVar151._8_4_ = fVar233 * pfVar4[2] + fVar250 * pfVar1[2];
  auVar151._12_4_ = fVar235 * pfVar4[3] + fVar251 * pfVar1[3];
  auVar12 = vsubps_avx(auVar256,auVar298);
  auVar13 = vsubps_avx(auVar151,auVar298);
  auVar298 = vshufps_avx(auVar34,auVar34,0);
  register0x00001250 = auVar298;
  _local_3c0 = auVar298;
  auVar298 = vshufps_avx(auVar34,auVar34,0x55);
  register0x00001250 = auVar298;
  _local_1e0 = auVar298;
  auVar298 = vshufps_avx(auVar34,auVar34,0xaa);
  register0x00001250 = auVar298;
  _local_200 = auVar298;
  auVar298 = vshufps_avx(auVar34,auVar34,0xff);
  register0x00001290 = auVar298;
  _local_220 = auVar298;
  auVar298 = vshufps_avx(auVar12,auVar12,0);
  register0x00001290 = auVar298;
  _local_3e0 = auVar298;
  auVar298 = vshufps_avx(auVar12,auVar12,0x55);
  register0x00001290 = auVar298;
  _local_400 = auVar298;
  auVar298 = vshufps_avx(auVar12,auVar12,0xaa);
  register0x00001290 = auVar298;
  _local_420 = auVar298;
  auVar298 = vshufps_avx(auVar12,auVar12,0xff);
  register0x00001290 = auVar298;
  _local_440 = auVar298;
  auVar298 = vshufps_avx(auVar11,auVar11,0);
  register0x00001290 = auVar298;
  _local_460 = auVar298;
  auVar298 = vshufps_avx(auVar11,auVar11,0x55);
  register0x00001290 = auVar298;
  _local_480 = auVar298;
  auVar298 = vshufps_avx(auVar11,auVar11,0xaa);
  register0x00001290 = auVar298;
  _local_4a0 = auVar298;
  auVar298 = vshufps_avx(auVar11,auVar11,0xff);
  register0x00001290 = auVar298;
  _local_4c0 = auVar298;
  auVar298 = vshufps_avx(auVar13,auVar13,0);
  auVar33 = vshufps_avx(auVar13,auVar13,0x55);
  auVar152 = vshufps_avx(auVar13,auVar13,0xaa);
  register0x00001290 = auVar152;
  _local_4e0 = auVar152;
  auVar152 = vshufps_avx(auVar13,auVar13,0xff);
  register0x00001290 = auVar152;
  _local_240 = auVar152;
  auVar152 = ZEXT416((uint)(fVar206 * fVar206 + fVar174 * fVar174 + fVar229 * fVar229));
  auVar152 = vshufps_avx(auVar152,auVar152,0);
  local_260._16_16_ = auVar152;
  local_260._0_16_ = auVar152;
  fVar174 = *(float *)(ray + k * 4 + 0x30);
  local_870 = ZEXT416((uint)fVar176);
  auVar152 = vshufps_avx(ZEXT416((uint)(fVar174 - fVar176)),ZEXT416((uint)(fVar174 - fVar176)),0);
  local_2a0._16_16_ = auVar152;
  local_2a0._0_16_ = auVar152;
  local_750 = vpshufd_avx(ZEXT416(uVar103),0);
  local_760 = vpshufd_avx(ZEXT416(*(uint *)(local_850 + lVar113 * 4 + 6)),0);
  uVar110 = 0;
  bVar114 = false;
  local_be8 = 1;
  auVar134._8_4_ = 0x7fffffff;
  auVar134._0_8_ = 0x7fffffff7fffffff;
  auVar134._12_4_ = 0x7fffffff;
  auVar134._16_4_ = 0x7fffffff;
  auVar134._20_4_ = 0x7fffffff;
  auVar134._24_4_ = 0x7fffffff;
  auVar134._28_4_ = 0x7fffffff;
  local_500 = vandps_avx(local_260,auVar134);
  auVar152 = vsqrtss_avx(local_900,local_900);
  auVar10 = vsqrtss_avx(local_900,local_900);
  local_550 = ZEXT816(0x3f80000000000000);
  do {
    auVar243._8_4_ = 0x3f800000;
    auVar243._0_8_ = 0x3f8000003f800000;
    auVar243._12_4_ = 0x3f800000;
    auVar243._16_4_ = 0x3f800000;
    auVar243._20_4_ = 0x3f800000;
    auVar243._24_4_ = 0x3f800000;
    auVar243._28_4_ = 0x3f800000;
    iVar109 = (int)uVar110;
    auVar190 = vmovshdup_avx(local_550);
    auVar126 = vsubps_avx(auVar190,local_550);
    auVar190 = vshufps_avx(local_550,local_550,0);
    local_7a0._16_16_ = auVar190;
    local_7a0._0_16_ = auVar190;
    auVar215 = vshufps_avx(auVar126,auVar126,0);
    local_7c0._16_16_ = auVar215;
    local_7c0._0_16_ = auVar215;
    fVar148 = auVar215._0_4_;
    fVar175 = auVar215._4_4_;
    fVar177 = auVar215._8_4_;
    fVar179 = auVar215._12_4_;
    fVar117 = auVar190._0_4_;
    auVar224._0_4_ = fVar117 + fVar148 * 0.0;
    fVar146 = auVar190._4_4_;
    auVar224._4_4_ = fVar146 + fVar175 * 0.14285715;
    fVar147 = auVar190._8_4_;
    auVar224._8_4_ = fVar147 + fVar177 * 0.2857143;
    fStack_b44 = auVar190._12_4_;
    auVar224._12_4_ = fStack_b44 + fVar179 * 0.42857146;
    auVar224._16_4_ = fVar117 + fVar148 * 0.5714286;
    auVar224._20_4_ = fVar146 + fVar175 * 0.71428573;
    auVar224._24_4_ = fVar147 + fVar177 * 0.8571429;
    auVar224._28_4_ = fStack_b44 + fVar179;
    auVar130 = vsubps_avx(auVar243,auVar224);
    local_b60._4_4_ = auVar224._4_4_ * auVar224._4_4_;
    local_b60._0_4_ = auVar224._0_4_ * auVar224._0_4_;
    fStack_b58 = auVar224._8_4_ * auVar224._8_4_;
    fStack_b54 = auVar224._12_4_ * auVar224._12_4_;
    fStack_b50 = auVar224._16_4_ * auVar224._16_4_;
    fStack_b4c = auVar224._20_4_ * auVar224._20_4_;
    fStack_b48 = auVar224._24_4_ * auVar224._24_4_;
    fVar250 = auVar224._0_4_ * 3.0;
    fVar251 = auVar224._4_4_ * 3.0;
    fVar252 = auVar224._8_4_ * 3.0;
    fVar253 = auVar224._12_4_ * 3.0;
    fVar254 = auVar224._16_4_ * 3.0;
    fVar265 = auVar224._20_4_ * 3.0;
    fVar266 = auVar224._24_4_ * 3.0;
    fVar229 = auVar130._0_4_;
    auVar337._0_4_ = fVar229 * fVar229;
    fVar176 = auVar130._4_4_;
    auVar337._4_4_ = fVar176 * fVar176;
    fVar231 = auVar130._8_4_;
    auVar337._8_4_ = fVar231 * fVar231;
    fVar232 = auVar130._12_4_;
    auVar337._12_4_ = fVar232 * fVar232;
    fVar233 = auVar130._16_4_;
    auVar337._16_4_ = fVar233 * fVar233;
    fVar235 = auVar130._20_4_;
    auVar337._20_4_ = fVar235 * fVar235;
    fVar248 = auVar130._24_4_;
    auVar337._28_36_ = auVar336._28_36_;
    auVar337._24_4_ = fVar248 * fVar248;
    fVar249 = auVar130._28_4_;
    fVar267 = (auVar337._0_4_ * (fVar229 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar268 = (auVar337._4_4_ * (fVar176 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar270 = (auVar337._8_4_ * (fVar231 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar272 = (auVar337._12_4_ * (fVar232 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar269 = (auVar337._16_4_ * (fVar233 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar271 = (auVar337._20_4_ * (fVar235 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar273 = (auVar337._24_4_ * (fVar248 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar351 = -fVar229 * auVar224._0_4_ * auVar224._0_4_ * 0.5;
    fVar359 = -fVar176 * auVar224._4_4_ * auVar224._4_4_ * 0.5;
    fVar362 = -fVar231 * auVar224._8_4_ * auVar224._8_4_ * 0.5;
    fVar365 = -fVar232 * auVar224._12_4_ * auVar224._12_4_ * 0.5;
    fVar368 = -fVar233 * auVar224._16_4_ * auVar224._16_4_ * 0.5;
    fVar371 = -fVar235 * auVar224._20_4_ * auVar224._20_4_ * 0.5;
    fVar374 = -fVar248 * auVar224._24_4_ * auVar224._24_4_ * 0.5;
    fVar380 = auVar298._0_4_;
    fVar451 = auVar298._4_4_;
    fVar453 = auVar298._8_4_;
    fVar455 = auVar298._12_4_;
    fVar420 = auVar33._0_4_;
    fVar428 = auVar33._4_4_;
    fVar431 = auVar33._8_4_;
    fVar434 = auVar33._12_4_;
    fVar418 = auVar404._28_4_ + -0.0;
    fVar443 = (auVar224._0_4_ * auVar224._0_4_ * (fVar250 + -5.0) + 2.0) * 0.5;
    fVar450 = (auVar224._4_4_ * auVar224._4_4_ * (fVar251 + -5.0) + 2.0) * 0.5;
    fVar452 = (auVar224._8_4_ * auVar224._8_4_ * (fVar252 + -5.0) + 2.0) * 0.5;
    fVar454 = (auVar224._12_4_ * auVar224._12_4_ * (fVar253 + -5.0) + 2.0) * 0.5;
    fVar456 = (auVar224._16_4_ * auVar224._16_4_ * (fVar254 + -5.0) + 2.0) * 0.5;
    fVar457 = (auVar224._20_4_ * auVar224._20_4_ * (fVar265 + -5.0) + 2.0) * 0.5;
    fVar458 = (auVar224._24_4_ * auVar224._24_4_ * (fVar266 + -5.0) + 2.0) * 0.5;
    fVar421 = -auVar224._0_4_ * fVar229 * fVar229 * 0.5;
    fVar429 = -auVar224._4_4_ * fVar176 * fVar176 * 0.5;
    fVar432 = -auVar224._8_4_ * fVar231 * fVar231 * 0.5;
    fVar435 = -auVar224._12_4_ * fVar232 * fVar232 * 0.5;
    fVar437 = -auVar224._16_4_ * fVar233 * fVar233 * 0.5;
    fVar439 = -auVar224._20_4_ * fVar235 * fVar235 * 0.5;
    fVar441 = -auVar224._24_4_ * fVar248 * fVar248 * 0.5;
    fVar352 = fVar421 * (float)local_3c0._0_4_ +
              fVar443 * (float)local_3e0._0_4_ +
              fVar380 * fVar351 + fVar267 * (float)local_460._0_4_;
    fVar360 = fVar429 * (float)local_3c0._4_4_ +
              fVar450 * (float)local_3e0._4_4_ +
              fVar451 * fVar359 + fVar268 * (float)local_460._4_4_;
    fVar363 = fVar432 * fStack_3b8 + fVar452 * fStack_3d8 + fVar453 * fVar362 + fVar270 * fStack_458
    ;
    fVar366 = fVar435 * fStack_3b4 + fVar454 * fStack_3d4 + fVar455 * fVar365 + fVar272 * fStack_454
    ;
    fVar369 = fVar437 * fStack_3b0 + fVar456 * fStack_3d0 + fVar380 * fVar368 + fVar269 * fStack_450
    ;
    fVar372 = fVar439 * fStack_3ac + fVar457 * fStack_3cc + fVar451 * fVar371 + fVar271 * fStack_44c
    ;
    fVar375 = fVar441 * fStack_3a8 + fVar458 * fStack_3c8 + fVar453 * fVar374 + fVar273 * fStack_448
    ;
    fVar378 = -fVar249 + fVar455 + -0.0 + 2.0;
    fVar353 = (float)local_1e0._0_4_ * fVar421 +
              fVar443 * (float)local_400._0_4_ +
              fVar420 * fVar351 + fVar267 * (float)local_480._0_4_;
    fVar361 = (float)local_1e0._4_4_ * fVar429 +
              fVar450 * (float)local_400._4_4_ +
              fVar428 * fVar359 + fVar268 * (float)local_480._4_4_;
    fVar364 = fStack_1d8 * fVar432 + fVar452 * fStack_3f8 + fVar431 * fVar362 + fVar270 * fStack_478
    ;
    fVar367 = fStack_1d4 * fVar435 + fVar454 * fStack_3f4 + fVar434 * fVar365 + fVar272 * fStack_474
    ;
    fVar370 = fStack_1d0 * fVar437 + fVar456 * fStack_3f0 + fVar420 * fVar368 + fVar269 * fStack_470
    ;
    fVar373 = fStack_1cc * fVar439 + fVar457 * fStack_3ec + fVar428 * fVar371 + fVar271 * fStack_46c
    ;
    fVar376 = fStack_1c8 * fVar441 + fVar458 * fStack_3e8 + fVar431 * fVar374 + fVar273 * fStack_468
    ;
    fVar379 = fVar378 + fVar455 + -0.0 + fVar418;
    local_8c0 = (float)local_200._0_4_ * fVar421 +
                fVar443 * (float)local_420._0_4_ +
                fVar351 * (float)local_4e0._0_4_ + fVar267 * (float)local_4a0._0_4_;
    fStack_8bc = (float)local_200._4_4_ * fVar429 +
                 fVar450 * (float)local_420._4_4_ +
                 fVar359 * (float)local_4e0._4_4_ + fVar268 * (float)local_4a0._4_4_;
    fStack_8b8 = fStack_1f8 * fVar432 +
                 fVar452 * fStack_418 + fVar362 * fStack_4d8 + fVar270 * fStack_498;
    fStack_8b4 = fStack_1f4 * fVar435 +
                 fVar454 * fStack_414 + fVar365 * fStack_4d4 + fVar272 * fStack_494;
    fStack_8b0 = fStack_1f0 * fVar437 +
                 fVar456 * fStack_410 + fVar368 * fStack_4d0 + fVar269 * fStack_490;
    fStack_8ac = fStack_1ec * fVar439 +
                 fVar457 * fStack_40c + fVar371 * fStack_4cc + fVar271 * fStack_48c;
    fStack_8a8 = fStack_1e8 * fVar441 +
                 fVar458 * fStack_408 + fVar374 * fStack_4c8 + fVar273 * fStack_488;
    fStack_8a4 = fVar379 + fVar418 + fVar434 + -0.0;
    auVar262._0_4_ =
         (float)local_220._0_4_ * fVar421 +
         fVar443 * (float)local_440._0_4_ +
         fVar351 * (float)local_240._0_4_ + fVar267 * (float)local_4c0._0_4_;
    auVar262._4_4_ =
         (float)local_220._4_4_ * fVar429 +
         fVar450 * (float)local_440._4_4_ +
         fVar359 * (float)local_240._4_4_ + fVar268 * (float)local_4c0._4_4_;
    auVar262._8_4_ =
         fStack_218 * fVar432 + fVar452 * fStack_438 + fVar362 * fStack_238 + fVar270 * fStack_4b8;
    auVar262._12_4_ =
         fStack_214 * fVar435 + fVar454 * fStack_434 + fVar365 * fStack_234 + fVar272 * fStack_4b4;
    auVar262._16_4_ =
         fStack_210 * fVar437 + fVar456 * fStack_430 + fVar368 * fStack_230 + fVar269 * fStack_4b0;
    auVar262._20_4_ =
         fStack_20c * fVar439 + fVar457 * fStack_42c + fVar371 * fStack_22c + fVar271 * fStack_4ac;
    auVar262._24_4_ =
         fStack_208 * fVar441 + fVar458 * fStack_428 + fVar374 * fStack_228 + fVar273 * fStack_4a8;
    auVar262._28_4_ = fVar379 + -fVar249 + -3.0 + 2.0;
    fVar435 = auVar224._28_4_ + auVar224._28_4_;
    auVar36._4_4_ = (fVar176 + fVar176) * auVar224._4_4_;
    auVar36._0_4_ = (fVar229 + fVar229) * auVar224._0_4_;
    auVar36._8_4_ = (fVar231 + fVar231) * auVar224._8_4_;
    auVar36._12_4_ = (fVar232 + fVar232) * auVar224._12_4_;
    auVar36._16_4_ = (fVar233 + fVar233) * auVar224._16_4_;
    auVar36._20_4_ = (fVar235 + fVar235) * auVar224._20_4_;
    auVar36._24_4_ = (fVar248 + fVar248) * auVar224._24_4_;
    auVar36._28_4_ = fVar435;
    auVar130 = vsubps_avx(auVar36,auVar337._0_32_);
    auVar37._4_4_ = (fVar176 + fVar176) * (fVar251 + 2.0);
    auVar37._0_4_ = (fVar229 + fVar229) * (fVar250 + 2.0);
    auVar37._8_4_ = (fVar231 + fVar231) * (fVar252 + 2.0);
    auVar37._12_4_ = (fVar232 + fVar232) * (fVar253 + 2.0);
    auVar37._16_4_ = (fVar233 + fVar233) * (fVar254 + 2.0);
    auVar37._20_4_ = (fVar235 + fVar235) * (fVar265 + 2.0);
    auVar37._24_4_ = (fVar248 + fVar248) * (fVar266 + 2.0);
    auVar37._28_4_ = 0x40400000;
    auVar38._4_4_ = fVar176 * fVar176 * 3.0;
    auVar38._0_4_ = fVar229 * fVar229 * 3.0;
    auVar38._8_4_ = fVar231 * fVar231 * 3.0;
    auVar38._12_4_ = fVar232 * fVar232 * 3.0;
    auVar38._16_4_ = fVar233 * fVar233 * 3.0;
    auVar38._20_4_ = fVar235 * fVar235 * 3.0;
    auVar38._24_4_ = fVar248 * fVar248 * 3.0;
    auVar38._28_4_ = fVar249;
    auVar471 = vsubps_avx(auVar37,auVar38);
    auVar28 = vsubps_avx(_local_b60,auVar36);
    fVar368 = auVar130._0_4_ * 0.5;
    fVar371 = auVar130._4_4_ * 0.5;
    fVar374 = auVar130._8_4_ * 0.5;
    fVar418 = auVar130._12_4_ * 0.5;
    fVar421 = auVar130._16_4_ * 0.5;
    fVar429 = auVar130._20_4_ * 0.5;
    fVar432 = auVar130._24_4_ * 0.5;
    fVar270 = (auVar224._0_4_ * fVar250 + (auVar224._0_4_ + auVar224._0_4_) * (fVar250 + -5.0)) *
              0.5;
    fVar271 = (auVar224._4_4_ * fVar251 + (auVar224._4_4_ + auVar224._4_4_) * (fVar251 + -5.0)) *
              0.5;
    fVar273 = (auVar224._8_4_ * fVar252 + (auVar224._8_4_ + auVar224._8_4_) * (fVar252 + -5.0)) *
              0.5;
    fVar351 = (auVar224._12_4_ * fVar253 + (auVar224._12_4_ + auVar224._12_4_) * (fVar253 + -5.0)) *
              0.5;
    fVar359 = (auVar224._16_4_ * fVar254 + (auVar224._16_4_ + auVar224._16_4_) * (fVar254 + -5.0)) *
              0.5;
    fVar362 = (auVar224._20_4_ * fVar265 + (auVar224._20_4_ + auVar224._20_4_) * (fVar265 + -5.0)) *
              0.5;
    fVar365 = (auVar224._24_4_ * fVar266 + (auVar224._24_4_ + auVar224._24_4_) * (fVar266 + -5.0)) *
              0.5;
    fVar229 = auVar471._0_4_ * 0.5;
    fVar176 = auVar471._4_4_ * 0.5;
    fVar231 = auVar471._8_4_ * 0.5;
    fVar232 = auVar471._12_4_ * 0.5;
    fVar250 = auVar471._16_4_ * 0.5;
    fVar251 = auVar471._20_4_ * 0.5;
    fVar265 = auVar471._24_4_ * 0.5;
    fVar235 = auVar28._0_4_ * 0.5;
    fVar252 = auVar28._4_4_ * 0.5;
    fVar254 = auVar28._8_4_ * 0.5;
    fVar266 = auVar28._12_4_ * 0.5;
    fVar267 = auVar28._16_4_ * 0.5;
    fVar272 = auVar28._20_4_ * 0.5;
    fVar269 = auVar28._24_4_ * 0.5;
    fVar350 = fVar249 + fVar249 + auVar130._28_4_;
    fVar327 = fVar350 + fVar249 + fVar249 + -4.0;
    auVar190 = vpermilps_avx(ZEXT416((uint)(auVar126._0_4_ * 0.04761905)),0);
    fVar233 = auVar190._0_4_;
    fVar296 = fVar233 * (fVar368 * (float)local_3c0._0_4_ +
                        fVar270 * (float)local_3e0._0_4_ +
                        fVar229 * (float)local_460._0_4_ + fVar380 * fVar235);
    fVar248 = auVar190._4_4_;
    fVar310 = fVar248 * (fVar371 * (float)local_3c0._4_4_ +
                        fVar271 * (float)local_3e0._4_4_ +
                        fVar176 * (float)local_460._4_4_ + fVar451 * fVar252);
    auVar39._4_4_ = fVar310;
    auVar39._0_4_ = fVar296;
    fVar253 = auVar190._8_4_;
    fVar312 = fVar253 * (fVar374 * fStack_3b8 +
                        fVar273 * fStack_3d8 + fVar231 * fStack_458 + fVar453 * fVar254);
    auVar39._8_4_ = fVar312;
    fVar268 = auVar190._12_4_;
    fVar315 = fVar268 * (fVar418 * fStack_3b4 +
                        fVar351 * fStack_3d4 + fVar232 * fStack_454 + fVar455 * fVar266);
    auVar39._12_4_ = fVar315;
    fVar318 = fVar233 * (fVar421 * fStack_3b0 +
                        fVar359 * fStack_3d0 + fVar250 * fStack_450 + fVar380 * fVar267);
    auVar39._16_4_ = fVar318;
    fVar321 = fVar248 * (fVar429 * fStack_3ac +
                        fVar362 * fStack_3cc + fVar251 * fStack_44c + fVar451 * fVar272);
    auVar39._20_4_ = fVar321;
    fVar324 = fVar253 * (fVar432 * fStack_3a8 +
                        fVar365 * fStack_3c8 + fVar265 * fStack_448 + fVar453 * fVar269);
    auVar39._24_4_ = fVar324;
    auVar39._28_4_ = fVar327;
    fVar328 = fVar233 * ((float)local_1e0._0_4_ * fVar368 +
                        fVar270 * (float)local_400._0_4_ +
                        fVar229 * (float)local_480._0_4_ + fVar235 * fVar420);
    fVar338 = fVar248 * ((float)local_1e0._4_4_ * fVar371 +
                        fVar271 * (float)local_400._4_4_ +
                        fVar176 * (float)local_480._4_4_ + fVar252 * fVar428);
    auVar40._4_4_ = fVar338;
    auVar40._0_4_ = fVar328;
    fVar340 = fVar253 * (fStack_1d8 * fVar374 +
                        fVar273 * fStack_3f8 + fVar231 * fStack_478 + fVar254 * fVar431);
    auVar40._8_4_ = fVar340;
    fVar342 = fVar268 * (fStack_1d4 * fVar418 +
                        fVar351 * fStack_3f4 + fVar232 * fStack_474 + fVar266 * fVar434);
    auVar40._12_4_ = fVar342;
    fVar344 = fVar233 * (fStack_1d0 * fVar421 +
                        fVar359 * fStack_3f0 + fVar250 * fStack_470 + fVar267 * fVar420);
    auVar40._16_4_ = fVar344;
    fVar346 = fVar248 * (fStack_1cc * fVar429 +
                        fVar362 * fStack_3ec + fVar251 * fStack_46c + fVar272 * fVar428);
    auVar40._20_4_ = fVar346;
    fVar348 = fVar253 * (fStack_1c8 * fVar432 +
                        fVar365 * fStack_3e8 + fVar265 * fStack_468 + fVar269 * fVar431);
    auVar40._24_4_ = fVar348;
    auVar40._28_4_ = fVar350;
    fVar422 = fVar233 * ((float)local_200._0_4_ * fVar368 +
                        fVar229 * (float)local_4a0._0_4_ + fVar235 * (float)local_4e0._0_4_ +
                        fVar270 * (float)local_420._0_4_);
    fVar430 = fVar248 * ((float)local_200._4_4_ * fVar371 +
                        fVar176 * (float)local_4a0._4_4_ + fVar252 * (float)local_4e0._4_4_ +
                        fVar271 * (float)local_420._4_4_);
    auVar41._4_4_ = fVar430;
    auVar41._0_4_ = fVar422;
    fVar433 = fVar253 * (fStack_1f8 * fVar374 +
                        fVar231 * fStack_498 + fVar254 * fStack_4d8 + fVar273 * fStack_418);
    auVar41._8_4_ = fVar433;
    fVar436 = fVar268 * (fStack_1f4 * fVar418 +
                        fVar232 * fStack_494 + fVar266 * fStack_4d4 + fVar351 * fStack_414);
    auVar41._12_4_ = fVar436;
    fVar438 = fVar233 * (fStack_1f0 * fVar421 +
                        fVar250 * fStack_490 + fVar267 * fStack_4d0 + fVar359 * fStack_410);
    auVar41._16_4_ = fVar438;
    fVar440 = fVar248 * (fStack_1ec * fVar429 +
                        fVar251 * fStack_48c + fVar272 * fStack_4cc + fVar362 * fStack_40c);
    auVar41._20_4_ = fVar440;
    fVar442 = fVar253 * (fStack_1e8 * fVar432 +
                        fVar265 * fStack_488 + fVar269 * fStack_4c8 + fVar365 * fStack_408);
    auVar41._24_4_ = fVar442;
    auVar41._28_4_ = -auVar224._28_4_;
    fVar235 = fVar233 * ((float)local_220._0_4_ * fVar368 +
                        fVar270 * (float)local_440._0_4_ +
                        fVar229 * (float)local_4c0._0_4_ + (float)local_240._0_4_ * fVar235);
    fVar252 = fVar248 * ((float)local_220._4_4_ * fVar371 +
                        fVar271 * (float)local_440._4_4_ +
                        fVar176 * (float)local_4c0._4_4_ + (float)local_240._4_4_ * fVar252);
    auVar42._4_4_ = fVar252;
    auVar42._0_4_ = fVar235;
    fVar254 = fVar253 * (fStack_218 * fVar374 +
                        fVar273 * fStack_438 + fVar231 * fStack_4b8 + fStack_238 * fVar254);
    auVar42._8_4_ = fVar254;
    fVar270 = fVar268 * (fStack_214 * fVar418 +
                        fVar351 * fStack_434 + fVar232 * fStack_4b4 + fStack_234 * fVar266);
    auVar42._12_4_ = fVar270;
    fVar233 = fVar233 * (fStack_210 * fVar421 +
                        fVar359 * fStack_430 + fVar250 * fStack_4b0 + fStack_230 * fVar267);
    auVar42._16_4_ = fVar233;
    fVar248 = fVar248 * (fStack_20c * fVar429 +
                        fVar362 * fStack_42c + fVar251 * fStack_4ac + fStack_22c * fVar272);
    auVar42._20_4_ = fVar248;
    fVar253 = fVar253 * (fStack_208 * fVar432 +
                        fVar365 * fStack_428 + fVar265 * fStack_4a8 + fStack_228 * fVar269);
    auVar42._24_4_ = fVar253;
    auVar42._28_4_ = fVar268;
    auVar94._4_4_ = fVar361;
    auVar94._0_4_ = fVar353;
    auVar94._8_4_ = fVar364;
    auVar94._12_4_ = fVar367;
    auVar94._16_4_ = fVar370;
    auVar94._20_4_ = fVar373;
    auVar94._24_4_ = fVar376;
    auVar94._28_4_ = fVar379;
    auVar130 = vperm2f128_avx(auVar94,auVar94,1);
    auVar130 = vshufps_avx(auVar130,auVar94,0x30);
    auVar469 = vshufps_avx(auVar94,auVar130,0x29);
    auVar100._4_4_ = fStack_8bc;
    auVar100._0_4_ = local_8c0;
    auVar100._8_4_ = fStack_8b8;
    auVar100._12_4_ = fStack_8b4;
    auVar100._16_4_ = fStack_8b0;
    auVar100._20_4_ = fStack_8ac;
    auVar100._24_4_ = fStack_8a8;
    auVar100._28_4_ = fStack_8a4;
    auVar130 = vperm2f128_avx(auVar100,auVar100,1);
    auVar130 = vshufps_avx(auVar130,auVar100,0x30);
    local_980 = vshufps_avx(auVar100,auVar130,0x29);
    auVar471 = vsubps_avx(auVar262,auVar42);
    auVar130 = vperm2f128_avx(auVar471,auVar471,1);
    auVar130 = vshufps_avx(auVar130,auVar471,0x30);
    auVar29 = vshufps_avx(auVar471,auVar130,0x29);
    auVar28 = vsubps_avx(auVar469,auVar94);
    auVar165 = vsubps_avx(local_980,auVar100);
    fVar176 = auVar28._0_4_;
    fVar249 = auVar28._4_4_;
    auVar43._4_4_ = fVar430 * fVar249;
    auVar43._0_4_ = fVar422 * fVar176;
    fVar265 = auVar28._8_4_;
    auVar43._8_4_ = fVar433 * fVar265;
    fVar269 = auVar28._12_4_;
    auVar43._12_4_ = fVar436 * fVar269;
    fVar365 = auVar28._16_4_;
    auVar43._16_4_ = fVar438 * fVar365;
    fVar429 = auVar28._20_4_;
    auVar43._20_4_ = fVar440 * fVar429;
    fVar420 = auVar28._24_4_;
    auVar43._24_4_ = fVar442 * fVar420;
    auVar43._28_4_ = auVar471._28_4_;
    fVar231 = auVar165._0_4_;
    fVar250 = auVar165._4_4_;
    auVar44._4_4_ = fVar338 * fVar250;
    auVar44._0_4_ = fVar328 * fVar231;
    fVar266 = auVar165._8_4_;
    auVar44._8_4_ = fVar340 * fVar266;
    fVar271 = auVar165._12_4_;
    auVar44._12_4_ = fVar342 * fVar271;
    fVar368 = auVar165._16_4_;
    auVar44._16_4_ = fVar344 * fVar368;
    fVar432 = auVar165._20_4_;
    auVar44._20_4_ = fVar346 * fVar432;
    fVar428 = auVar165._24_4_;
    auVar44._24_4_ = fVar348 * fVar428;
    auVar44._28_4_ = auVar130._28_4_;
    auVar30 = vsubps_avx(auVar44,auVar43);
    auVar96._4_4_ = fVar360;
    auVar96._0_4_ = fVar352;
    auVar96._8_4_ = fVar363;
    auVar96._12_4_ = fVar366;
    auVar96._16_4_ = fVar369;
    auVar96._20_4_ = fVar372;
    auVar96._24_4_ = fVar375;
    auVar96._28_4_ = fVar378;
    auVar130 = vperm2f128_avx(auVar96,auVar96,1);
    auVar130 = vshufps_avx(auVar130,auVar96,0x30);
    local_780 = vshufps_avx(auVar96,auVar130,0x29);
    auVar31 = vsubps_avx(local_780,auVar96);
    auVar45._4_4_ = fVar310 * fVar250;
    auVar45._0_4_ = fVar296 * fVar231;
    auVar45._8_4_ = fVar312 * fVar266;
    auVar45._12_4_ = fVar315 * fVar271;
    auVar45._16_4_ = fVar318 * fVar368;
    auVar45._20_4_ = fVar321 * fVar432;
    auVar45._24_4_ = fVar324 * fVar428;
    auVar45._28_4_ = local_780._28_4_;
    fVar232 = auVar31._0_4_;
    fVar251 = auVar31._4_4_;
    auVar46._4_4_ = fVar430 * fVar251;
    auVar46._0_4_ = fVar422 * fVar232;
    fVar267 = auVar31._8_4_;
    auVar46._8_4_ = fVar433 * fVar267;
    fVar273 = auVar31._12_4_;
    auVar46._12_4_ = fVar436 * fVar273;
    fVar371 = auVar31._16_4_;
    auVar46._16_4_ = fVar438 * fVar371;
    fVar380 = auVar31._20_4_;
    auVar46._20_4_ = fVar440 * fVar380;
    fVar431 = auVar31._24_4_;
    auVar46._24_4_ = fVar442 * fVar431;
    auVar46._28_4_ = fVar378;
    auVar32 = vsubps_avx(auVar46,auVar45);
    auVar47._4_4_ = fVar338 * fVar251;
    auVar47._0_4_ = fVar328 * fVar232;
    auVar47._8_4_ = fVar340 * fVar267;
    auVar47._12_4_ = fVar342 * fVar273;
    auVar47._16_4_ = fVar344 * fVar371;
    auVar47._20_4_ = fVar346 * fVar380;
    auVar47._24_4_ = fVar348 * fVar431;
    auVar47._28_4_ = fVar378;
    auVar48._4_4_ = fVar310 * fVar249;
    auVar48._0_4_ = fVar296 * fVar176;
    auVar48._8_4_ = fVar312 * fVar265;
    auVar48._12_4_ = fVar315 * fVar269;
    auVar48._16_4_ = fVar318 * fVar365;
    auVar48._20_4_ = fVar321 * fVar429;
    auVar48._24_4_ = fVar324 * fVar420;
    auVar48._28_4_ = fVar435;
    auVar390 = vsubps_avx(auVar48,auVar47);
    fVar229 = auVar390._28_4_;
    fVar272 = auVar32._28_4_ + fVar229;
    auVar225._0_4_ = fVar232 * fVar232 + fVar176 * fVar176 + fVar231 * fVar231;
    auVar225._4_4_ = fVar251 * fVar251 + fVar249 * fVar249 + fVar250 * fVar250;
    auVar225._8_4_ = fVar267 * fVar267 + fVar265 * fVar265 + fVar266 * fVar266;
    auVar225._12_4_ = fVar273 * fVar273 + fVar269 * fVar269 + fVar271 * fVar271;
    auVar225._16_4_ = fVar371 * fVar371 + fVar365 * fVar365 + fVar368 * fVar368;
    auVar225._20_4_ = fVar380 * fVar380 + fVar429 * fVar429 + fVar432 * fVar432;
    auVar225._24_4_ = fVar431 * fVar431 + fVar420 * fVar420 + fVar428 * fVar428;
    auVar225._28_4_ = fVar229 + fVar229 + fVar272;
    auVar130 = vrcpps_avx(auVar225);
    fVar229 = auVar130._0_4_;
    fVar351 = auVar130._4_4_;
    auVar49._4_4_ = fVar351 * auVar225._4_4_;
    auVar49._0_4_ = fVar229 * auVar225._0_4_;
    fVar359 = auVar130._8_4_;
    auVar49._8_4_ = fVar359 * auVar225._8_4_;
    fVar362 = auVar130._12_4_;
    auVar49._12_4_ = fVar362 * auVar225._12_4_;
    fVar374 = auVar130._16_4_;
    auVar49._16_4_ = fVar374 * auVar225._16_4_;
    fVar418 = auVar130._20_4_;
    auVar49._20_4_ = fVar418 * auVar225._20_4_;
    fVar421 = auVar130._24_4_;
    auVar49._24_4_ = fVar421 * auVar225._24_4_;
    auVar49._28_4_ = fVar435;
    auVar401._8_4_ = 0x3f800000;
    auVar401._0_8_ = 0x3f8000003f800000;
    auVar401._12_4_ = 0x3f800000;
    auVar401._16_4_ = 0x3f800000;
    auVar401._20_4_ = 0x3f800000;
    auVar401._24_4_ = 0x3f800000;
    auVar401._28_4_ = 0x3f800000;
    auVar35 = vsubps_avx(auVar401,auVar49);
    fVar229 = auVar35._0_4_ * fVar229 + fVar229;
    fVar351 = auVar35._4_4_ * fVar351 + fVar351;
    fVar359 = auVar35._8_4_ * fVar359 + fVar359;
    fVar362 = auVar35._12_4_ * fVar362 + fVar362;
    fVar374 = auVar35._16_4_ * fVar374 + fVar374;
    fVar418 = auVar35._20_4_ * fVar418 + fVar418;
    fVar421 = auVar35._24_4_ * fVar421 + fVar421;
    auVar471 = vperm2f128_avx(auVar40,auVar40,1);
    auVar471 = vshufps_avx(auVar471,auVar40,0x30);
    auVar471 = vshufps_avx(auVar40,auVar471,0x29);
    auVar28 = vperm2f128_avx(auVar41,auVar41,1);
    auVar28 = vshufps_avx(auVar28,auVar41,0x30);
    local_920 = vshufps_avx(auVar41,auVar28,0x29);
    fVar393 = local_920._0_4_;
    fVar406 = local_920._4_4_;
    auVar50._4_4_ = fVar406 * fVar249;
    auVar50._0_4_ = fVar393 * fVar176;
    fVar408 = local_920._8_4_;
    auVar50._8_4_ = fVar408 * fVar265;
    fVar410 = local_920._12_4_;
    auVar50._12_4_ = fVar410 * fVar269;
    fVar412 = local_920._16_4_;
    auVar50._16_4_ = fVar412 * fVar365;
    fVar414 = local_920._20_4_;
    auVar50._20_4_ = fVar414 * fVar429;
    fVar416 = local_920._24_4_;
    auVar50._24_4_ = fVar416 * fVar420;
    auVar50._28_4_ = auVar28._28_4_;
    fVar329 = auVar471._0_4_;
    fVar339 = auVar471._4_4_;
    auVar51._4_4_ = fVar339 * fVar250;
    auVar51._0_4_ = fVar329 * fVar231;
    fVar341 = auVar471._8_4_;
    auVar51._8_4_ = fVar341 * fVar266;
    fVar343 = auVar471._12_4_;
    auVar51._12_4_ = fVar343 * fVar271;
    fVar345 = auVar471._16_4_;
    auVar51._16_4_ = fVar345 * fVar368;
    fVar347 = auVar471._20_4_;
    auVar51._20_4_ = fVar347 * fVar432;
    fVar349 = auVar471._24_4_;
    auVar51._24_4_ = fVar349 * fVar428;
    auVar51._28_4_ = -auVar224._28_4_;
    auVar131 = vsubps_avx(auVar51,auVar50);
    auVar471 = vperm2f128_avx(auVar39,auVar39,1);
    auVar471 = vshufps_avx(auVar471,auVar39,0x30);
    auVar28 = vshufps_avx(auVar39,auVar471,0x29);
    fVar297 = auVar28._0_4_;
    fVar311 = auVar28._4_4_;
    auVar52._4_4_ = fVar311 * fVar250;
    auVar52._0_4_ = fVar297 * fVar231;
    fVar313 = auVar28._8_4_;
    auVar52._8_4_ = fVar313 * fVar266;
    fVar316 = auVar28._12_4_;
    auVar52._12_4_ = fVar316 * fVar271;
    fVar319 = auVar28._16_4_;
    auVar52._16_4_ = fVar319 * fVar368;
    fVar322 = auVar28._20_4_;
    auVar52._20_4_ = fVar322 * fVar432;
    fVar325 = auVar28._24_4_;
    auVar52._24_4_ = fVar325 * fVar428;
    auVar52._28_4_ = auVar471._28_4_;
    auVar53._4_4_ = fVar406 * fVar251;
    auVar53._0_4_ = fVar393 * fVar232;
    auVar53._8_4_ = fVar408 * fVar267;
    auVar53._12_4_ = fVar410 * fVar273;
    auVar53._16_4_ = fVar412 * fVar371;
    auVar53._20_4_ = fVar414 * fVar380;
    auVar53._24_4_ = fVar416 * fVar431;
    auVar53._28_4_ = uStack_1c4;
    auVar471 = vsubps_avx(auVar53,auVar52);
    auVar54._4_4_ = fVar339 * fVar251;
    auVar54._0_4_ = fVar329 * fVar232;
    auVar54._8_4_ = fVar341 * fVar267;
    auVar54._12_4_ = fVar343 * fVar273;
    auVar54._16_4_ = fVar345 * fVar371;
    auVar54._20_4_ = fVar347 * fVar380;
    auVar54._24_4_ = fVar349 * fVar431;
    auVar54._28_4_ = uStack_1c4;
    auVar55._4_4_ = fVar311 * fVar249;
    auVar55._0_4_ = fVar297 * fVar176;
    auVar55._8_4_ = fVar313 * fVar265;
    auVar55._12_4_ = fVar316 * fVar269;
    auVar55._16_4_ = fVar319 * fVar365;
    auVar55._20_4_ = fVar322 * fVar429;
    auVar55._24_4_ = fVar325 * fVar420;
    auVar55._28_4_ = 0x3f000000;
    auVar132 = vsubps_avx(auVar55,auVar54);
    auVar56._4_4_ =
         (auVar30._4_4_ * auVar30._4_4_ +
         auVar32._4_4_ * auVar32._4_4_ + auVar390._4_4_ * auVar390._4_4_) * fVar351;
    auVar56._0_4_ =
         (auVar30._0_4_ * auVar30._0_4_ +
         auVar32._0_4_ * auVar32._0_4_ + auVar390._0_4_ * auVar390._0_4_) * fVar229;
    auVar56._8_4_ =
         (auVar30._8_4_ * auVar30._8_4_ +
         auVar32._8_4_ * auVar32._8_4_ + auVar390._8_4_ * auVar390._8_4_) * fVar359;
    auVar56._12_4_ =
         (auVar30._12_4_ * auVar30._12_4_ +
         auVar32._12_4_ * auVar32._12_4_ + auVar390._12_4_ * auVar390._12_4_) * fVar362;
    auVar56._16_4_ =
         (auVar30._16_4_ * auVar30._16_4_ +
         auVar32._16_4_ * auVar32._16_4_ + auVar390._16_4_ * auVar390._16_4_) * fVar374;
    auVar56._20_4_ =
         (auVar30._20_4_ * auVar30._20_4_ +
         auVar32._20_4_ * auVar32._20_4_ + auVar390._20_4_ * auVar390._20_4_) * fVar418;
    auVar56._24_4_ =
         (auVar30._24_4_ * auVar30._24_4_ +
         auVar32._24_4_ * auVar32._24_4_ + auVar390._24_4_ * auVar390._24_4_) * fVar421;
    auVar56._28_4_ = auVar30._28_4_ + fVar272;
    auVar57._4_4_ =
         (auVar131._4_4_ * auVar131._4_4_ +
         auVar471._4_4_ * auVar471._4_4_ + auVar132._4_4_ * auVar132._4_4_) * fVar351;
    auVar57._0_4_ =
         (auVar131._0_4_ * auVar131._0_4_ +
         auVar471._0_4_ * auVar471._0_4_ + auVar132._0_4_ * auVar132._0_4_) * fVar229;
    auVar57._8_4_ =
         (auVar131._8_4_ * auVar131._8_4_ +
         auVar471._8_4_ * auVar471._8_4_ + auVar132._8_4_ * auVar132._8_4_) * fVar359;
    auVar57._12_4_ =
         (auVar131._12_4_ * auVar131._12_4_ +
         auVar471._12_4_ * auVar471._12_4_ + auVar132._12_4_ * auVar132._12_4_) * fVar362;
    auVar57._16_4_ =
         (auVar131._16_4_ * auVar131._16_4_ +
         auVar471._16_4_ * auVar471._16_4_ + auVar132._16_4_ * auVar132._16_4_) * fVar374;
    auVar57._20_4_ =
         (auVar131._20_4_ * auVar131._20_4_ +
         auVar471._20_4_ * auVar471._20_4_ + auVar132._20_4_ * auVar132._20_4_) * fVar418;
    auVar57._24_4_ =
         (auVar131._24_4_ * auVar131._24_4_ +
         auVar471._24_4_ * auVar471._24_4_ + auVar132._24_4_ * auVar132._24_4_) * fVar421;
    auVar57._28_4_ = auVar35._28_4_ + auVar130._28_4_;
    auVar130 = vmaxps_avx(auVar56,auVar57);
    auVar471 = vperm2f128_avx(auVar262,auVar262,1);
    auVar471 = vshufps_avx(auVar471,auVar262,0x30);
    auVar30 = vshufps_avx(auVar262,auVar471,0x29);
    auVar135._0_4_ = auVar262._0_4_ + fVar235;
    auVar135._4_4_ = auVar262._4_4_ + fVar252;
    auVar135._8_4_ = auVar262._8_4_ + fVar254;
    auVar135._12_4_ = auVar262._12_4_ + fVar270;
    auVar135._16_4_ = auVar262._16_4_ + fVar233;
    auVar135._20_4_ = auVar262._20_4_ + fVar248;
    auVar135._24_4_ = auVar262._24_4_ + fVar253;
    auVar135._28_4_ = auVar262._28_4_ + fVar268;
    auVar471 = vmaxps_avx(auVar262,auVar135);
    auVar28 = vmaxps_avx(auVar29,auVar30);
    auVar471 = vmaxps_avx(auVar471,auVar28);
    auVar28 = vrsqrtps_avx(auVar225);
    fVar229 = auVar28._0_4_;
    fVar233 = auVar28._4_4_;
    fVar235 = auVar28._8_4_;
    fVar248 = auVar28._12_4_;
    fVar252 = auVar28._16_4_;
    fVar253 = auVar28._20_4_;
    fVar254 = auVar28._24_4_;
    auVar58._4_4_ = fVar233 * fVar233 * fVar233 * auVar225._4_4_ * 0.5;
    auVar58._0_4_ = fVar229 * fVar229 * fVar229 * auVar225._0_4_ * 0.5;
    auVar58._8_4_ = fVar235 * fVar235 * fVar235 * auVar225._8_4_ * 0.5;
    auVar58._12_4_ = fVar248 * fVar248 * fVar248 * auVar225._12_4_ * 0.5;
    auVar58._16_4_ = fVar252 * fVar252 * fVar252 * auVar225._16_4_ * 0.5;
    auVar58._20_4_ = fVar253 * fVar253 * fVar253 * auVar225._20_4_ * 0.5;
    auVar58._24_4_ = fVar254 * fVar254 * fVar254 * auVar225._24_4_ * 0.5;
    auVar58._28_4_ = auVar225._28_4_;
    auVar59._4_4_ = fVar233 * 1.5;
    auVar59._0_4_ = fVar229 * 1.5;
    auVar59._8_4_ = fVar235 * 1.5;
    auVar59._12_4_ = fVar248 * 1.5;
    auVar59._16_4_ = fVar252 * 1.5;
    auVar59._20_4_ = fVar253 * 1.5;
    auVar59._24_4_ = fVar254 * 1.5;
    auVar59._28_4_ = auVar28._28_4_;
    local_2e0 = vsubps_avx(auVar59,auVar58);
    auVar336 = ZEXT3264(local_2e0);
    auVar95._4_4_ = fVar361;
    auVar95._0_4_ = fVar353;
    auVar95._8_4_ = fVar364;
    auVar95._12_4_ = fVar367;
    auVar95._16_4_ = fVar370;
    auVar95._20_4_ = fVar373;
    auVar95._24_4_ = fVar376;
    auVar95._28_4_ = fVar379;
    local_940 = vsubps_avx(ZEXT832(0) << 0x20,auVar95);
    auVar32 = vsubps_avx(ZEXT832(0) << 0x20,auVar100);
    fVar233 = auVar32._0_4_;
    fVar252 = auVar32._4_4_;
    fVar268 = auVar32._8_4_;
    fVar351 = auVar32._12_4_;
    fVar374 = auVar32._16_4_;
    fVar451 = auVar32._20_4_;
    fVar435 = auVar32._24_4_;
    fVar235 = local_940._0_4_;
    fVar253 = local_940._4_4_;
    fVar270 = local_940._8_4_;
    fVar359 = local_940._12_4_;
    fVar418 = local_940._16_4_;
    fVar453 = local_940._20_4_;
    fVar437 = local_940._24_4_;
    auVar97._4_4_ = fVar360;
    auVar97._0_4_ = fVar352;
    auVar97._8_4_ = fVar363;
    auVar97._12_4_ = fVar366;
    auVar97._16_4_ = fVar369;
    auVar97._20_4_ = fVar372;
    auVar97._24_4_ = fVar375;
    auVar97._28_4_ = fVar378;
    auVar390 = vsubps_avx(ZEXT832(0) << 0x20,auVar97);
    fVar248 = auVar390._0_4_;
    fVar254 = auVar390._4_4_;
    fVar272 = auVar390._8_4_;
    fVar362 = auVar390._12_4_;
    fVar421 = auVar390._16_4_;
    fVar455 = auVar390._20_4_;
    fVar439 = auVar390._24_4_;
    auVar447._0_4_ =
         fVar206 * fVar248 + (float)local_7e0._0_4_ * fVar235 + (float)local_960._0_4_ * fVar233;
    auVar447._4_4_ =
         fVar206 * fVar254 + (float)local_7e0._4_4_ * fVar253 + (float)local_960._4_4_ * fVar252;
    auVar447._8_4_ = fVar206 * fVar272 + fStack_7d8 * fVar270 + fStack_958 * fVar268;
    auVar447._12_4_ = fVar206 * fVar362 + fStack_7d4 * fVar359 + fStack_954 * fVar351;
    auVar447._16_4_ = fVar206 * fVar421 + fStack_7d0 * fVar418 + fStack_950 * fVar374;
    auVar447._20_4_ = fVar206 * fVar455 + fStack_7cc * fVar453 + fStack_94c * fVar451;
    auVar447._24_4_ = fVar206 * fVar439 + fStack_7c8 * fVar437 + fStack_948 * fVar435;
    auVar447._28_4_ = auVar132._28_4_ + auVar28._28_4_ + 0.5;
    auVar462._0_4_ = fVar248 * fVar248 + fVar235 * fVar235 + fVar233 * fVar233;
    auVar462._4_4_ = fVar254 * fVar254 + fVar253 * fVar253 + fVar252 * fVar252;
    auVar462._8_4_ = fVar272 * fVar272 + fVar270 * fVar270 + fVar268 * fVar268;
    auVar462._12_4_ = fVar362 * fVar362 + fVar359 * fVar359 + fVar351 * fVar351;
    auVar462._16_4_ = fVar421 * fVar421 + fVar418 * fVar418 + fVar374 * fVar374;
    auVar462._20_4_ = fVar455 * fVar455 + fVar453 * fVar453 + fVar451 * fVar451;
    auVar462._24_4_ = fVar439 * fVar439 + fVar437 * fVar437 + fVar435 * fVar435;
    auVar462._28_4_ = fStack_8a4 + fStack_8a4 + 0.5;
    fVar457 = local_2e0._0_4_;
    fVar458 = local_2e0._4_4_;
    fVar288 = local_2e0._8_4_;
    fVar290 = local_2e0._12_4_;
    fVar291 = local_2e0._16_4_;
    fVar293 = local_2e0._20_4_;
    fVar295 = local_2e0._24_4_;
    fVar229 = fStack_7c4 + auVar165._28_4_;
    local_540 = fVar206 * fVar232 * fVar457 +
                fVar457 * fVar176 * (float)local_7e0._0_4_ +
                (float)local_960._0_4_ * fVar457 * fVar231;
    fStack_53c = fVar206 * fVar251 * fVar458 +
                 fVar458 * fVar249 * (float)local_7e0._4_4_ +
                 (float)local_960._4_4_ * fVar458 * fVar250;
    fStack_538 = fVar206 * fVar267 * fVar288 +
                 fVar288 * fVar265 * fStack_7d8 + fStack_958 * fVar288 * fVar266;
    fStack_534 = fVar206 * fVar273 * fVar290 +
                 fVar290 * fVar269 * fStack_7d4 + fStack_954 * fVar290 * fVar271;
    fStack_530 = fVar206 * fVar371 * fVar291 +
                 fVar291 * fVar365 * fStack_7d0 + fStack_950 * fVar291 * fVar368;
    fStack_52c = fVar206 * fVar380 * fVar293 +
                 fVar293 * fVar429 * fStack_7cc + fStack_94c * fVar293 * fVar432;
    fStack_528 = fVar206 * fVar431 * fVar295 +
                 fVar295 * fVar420 * fStack_7c8 + fStack_948 * fVar295 * fVar428;
    fStack_524 = fVar206 + fVar229;
    fVar229 = fVar206 + fVar229;
    fVar394 = fVar248 * fVar232 * fVar457 +
              fVar457 * fVar176 * fVar235 + fVar457 * fVar231 * fVar233;
    fVar407 = fVar254 * fVar251 * fVar458 +
              fVar458 * fVar249 * fVar253 + fVar458 * fVar250 * fVar252;
    fVar409 = fVar272 * fVar267 * fVar288 +
              fVar288 * fVar265 * fVar270 + fVar288 * fVar266 * fVar268;
    fVar411 = fVar362 * fVar273 * fVar290 +
              fVar290 * fVar269 * fVar359 + fVar290 * fVar271 * fVar351;
    fVar413 = fVar421 * fVar371 * fVar291 +
              fVar291 * fVar365 * fVar418 + fVar291 * fVar368 * fVar374;
    fVar415 = fVar455 * fVar380 * fVar293 +
              fVar293 * fVar429 * fVar453 + fVar293 * fVar432 * fVar451;
    fVar417 = fVar439 * fVar431 * fVar295 +
              fVar295 * fVar420 * fVar437 + fVar295 * fVar428 * fVar435;
    fVar419 = fStack_7c4 + fVar229;
    auVar60._4_4_ = fVar407 * fStack_53c;
    auVar60._0_4_ = fVar394 * local_540;
    auVar60._8_4_ = fVar409 * fStack_538;
    auVar60._12_4_ = fVar411 * fStack_534;
    auVar60._16_4_ = fVar413 * fStack_530;
    auVar60._20_4_ = fVar415 * fStack_52c;
    auVar60._24_4_ = fVar417 * fStack_528;
    auVar60._28_4_ = fVar229;
    auVar165 = vsubps_avx(auVar447,auVar60);
    auVar61._4_4_ = fVar407 * fVar407;
    auVar61._0_4_ = fVar394 * fVar394;
    auVar61._8_4_ = fVar409 * fVar409;
    auVar61._12_4_ = fVar411 * fVar411;
    auVar61._16_4_ = fVar413 * fVar413;
    auVar61._20_4_ = fVar415 * fVar415;
    auVar61._24_4_ = fVar417 * fVar417;
    auVar61._28_4_ = fStack_7c4;
    auVar35 = vsubps_avx(auVar462,auVar61);
    auVar28 = vsqrtps_avx(auVar130);
    fVar229 = (auVar471._0_4_ + auVar28._0_4_) * 1.0000002;
    fVar441 = (auVar471._4_4_ + auVar28._4_4_) * 1.0000002;
    fVar443 = (auVar471._8_4_ + auVar28._8_4_) * 1.0000002;
    fVar450 = (auVar471._12_4_ + auVar28._12_4_) * 1.0000002;
    fVar452 = (auVar471._16_4_ + auVar28._16_4_) * 1.0000002;
    fVar454 = (auVar471._20_4_ + auVar28._20_4_) * 1.0000002;
    fVar456 = (auVar471._24_4_ + auVar28._24_4_) * 1.0000002;
    auVar62._4_4_ = fVar441 * fVar441;
    auVar62._0_4_ = fVar229 * fVar229;
    auVar62._8_4_ = fVar443 * fVar443;
    auVar62._12_4_ = fVar450 * fVar450;
    auVar62._16_4_ = fVar452 * fVar452;
    auVar62._20_4_ = fVar454 * fVar454;
    auVar62._24_4_ = fVar456 * fVar456;
    auVar62._28_4_ = auVar471._28_4_ + auVar28._28_4_;
    fVar459 = auVar165._0_4_ + auVar165._0_4_;
    fVar467 = auVar165._4_4_ + auVar165._4_4_;
    auVar463._0_8_ = CONCAT44(fVar467,fVar459);
    auVar463._8_4_ = auVar165._8_4_ + auVar165._8_4_;
    auVar463._12_4_ = auVar165._12_4_ + auVar165._12_4_;
    auVar463._16_4_ = auVar165._16_4_ + auVar165._16_4_;
    auVar463._20_4_ = auVar165._20_4_ + auVar165._20_4_;
    auVar463._24_4_ = auVar165._24_4_ + auVar165._24_4_;
    fVar229 = auVar165._28_4_;
    auVar463._28_4_ = fVar229 + fVar229;
    auVar471 = vsubps_avx(auVar35,auVar62);
    auVar63._4_4_ = fStack_53c * fStack_53c;
    auVar63._0_4_ = local_540 * local_540;
    auVar63._8_4_ = fStack_538 * fStack_538;
    auVar63._12_4_ = fStack_534 * fStack_534;
    auVar63._16_4_ = fStack_530 * fStack_530;
    auVar63._20_4_ = fStack_52c * fStack_52c;
    auVar63._24_4_ = fStack_528 * fStack_528;
    auVar63._28_4_ = local_940._28_4_;
    local_520 = vsubps_avx(local_260,auVar63);
    auVar64._4_4_ = fVar467 * fVar467;
    auVar64._0_4_ = fVar459 * fVar459;
    auVar64._8_4_ = auVar463._8_4_ * auVar463._8_4_;
    auVar64._12_4_ = auVar463._12_4_ * auVar463._12_4_;
    auVar64._16_4_ = auVar463._16_4_ * auVar463._16_4_;
    auVar64._20_4_ = auVar463._20_4_ * auVar463._20_4_;
    auVar64._24_4_ = auVar463._24_4_ * auVar463._24_4_;
    auVar64._28_4_ = fVar229;
    fVar441 = local_520._0_4_;
    fVar443 = local_520._4_4_;
    fVar450 = local_520._8_4_;
    fVar452 = local_520._12_4_;
    fVar454 = local_520._16_4_;
    fVar456 = local_520._20_4_;
    fVar377 = local_520._24_4_;
    auVar65._4_4_ = auVar471._4_4_ * fVar443 * 4.0;
    auVar65._0_4_ = auVar471._0_4_ * fVar441 * 4.0;
    auVar65._8_4_ = auVar471._8_4_ * fVar450 * 4.0;
    auVar65._12_4_ = auVar471._12_4_ * fVar452 * 4.0;
    auVar65._16_4_ = auVar471._16_4_ * fVar454 * 4.0;
    auVar65._20_4_ = auVar471._20_4_ * fVar456 * 4.0;
    auVar65._24_4_ = auVar471._24_4_ * fVar377 * 4.0;
    auVar65._28_4_ = 0x40800000;
    auVar165 = vsubps_avx(auVar64,auVar65);
    auVar130 = vcmpps_avx(auVar165,ZEXT432(0) << 0x20,5);
    fVar229 = local_520._28_4_;
    if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar130 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar130 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar130 >> 0x7f,0) == '\0') &&
          (auVar130 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar130 >> 0xbf,0) == '\0') &&
        (auVar130 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar130[0x1f])
    {
      auVar402._8_4_ = 0x7f800000;
      auVar402._0_8_ = 0x7f8000007f800000;
      auVar402._12_4_ = 0x7f800000;
      auVar402._16_4_ = 0x7f800000;
      auVar402._20_4_ = 0x7f800000;
      auVar402._24_4_ = 0x7f800000;
      auVar402._28_4_ = 0x7f800000;
      auVar464._8_4_ = 0xff800000;
      auVar464._0_8_ = 0xff800000ff800000;
      auVar464._12_4_ = 0xff800000;
      auVar464._16_4_ = 0xff800000;
      auVar464._20_4_ = 0xff800000;
      auVar464._24_4_ = 0xff800000;
      auVar464._28_4_ = 0xff800000;
      auVar92 = ZEXT816(0);
    }
    else {
      auVar131 = vcmpps_avx(auVar165,ZEXT432(0) << 0x20,5);
      auVar132 = vsqrtps_avx(auVar165);
      auVar280._0_4_ = fVar441 + fVar441;
      auVar280._4_4_ = fVar443 + fVar443;
      auVar280._8_4_ = fVar450 + fVar450;
      auVar280._12_4_ = fVar452 + fVar452;
      auVar280._16_4_ = fVar454 + fVar454;
      auVar280._20_4_ = fVar456 + fVar456;
      auVar280._24_4_ = fVar377 + fVar377;
      auVar280._28_4_ = fVar229 + fVar229;
      auVar165 = vrcpps_avx(auVar280);
      fVar274 = auVar165._0_4_;
      fVar286 = auVar165._4_4_;
      auVar66._4_4_ = auVar280._4_4_ * fVar286;
      auVar66._0_4_ = auVar280._0_4_ * fVar274;
      fVar287 = auVar165._8_4_;
      auVar66._8_4_ = auVar280._8_4_ * fVar287;
      fVar289 = auVar165._12_4_;
      auVar66._12_4_ = auVar280._12_4_ * fVar289;
      fVar234 = auVar165._16_4_;
      auVar66._16_4_ = auVar280._16_4_ * fVar234;
      fVar292 = auVar165._20_4_;
      auVar66._20_4_ = auVar280._20_4_ * fVar292;
      fVar294 = auVar165._24_4_;
      auVar66._24_4_ = auVar280._24_4_ * fVar294;
      auVar66._28_4_ = auVar280._28_4_;
      auVar197._8_4_ = 0x3f800000;
      auVar197._0_8_ = 0x3f8000003f800000;
      auVar197._12_4_ = 0x3f800000;
      auVar197._16_4_ = 0x3f800000;
      auVar197._20_4_ = 0x3f800000;
      auVar197._24_4_ = 0x3f800000;
      auVar197._28_4_ = 0x3f800000;
      auVar162 = vsubps_avx(auVar197,auVar66);
      fVar274 = fVar274 + fVar274 * auVar162._0_4_;
      fVar286 = fVar286 + fVar286 * auVar162._4_4_;
      fVar287 = fVar287 + fVar287 * auVar162._8_4_;
      fVar289 = fVar289 + fVar289 * auVar162._12_4_;
      fVar234 = fVar234 + fVar234 * auVar162._16_4_;
      fVar292 = fVar292 + fVar292 * auVar162._20_4_;
      fVar294 = fVar294 + fVar294 * auVar162._24_4_;
      auVar304._0_8_ = CONCAT44(fVar467,fVar459) ^ 0x8000000080000000;
      auVar304._8_4_ = -auVar463._8_4_;
      auVar304._12_4_ = -auVar463._12_4_;
      auVar304._16_4_ = -auVar463._16_4_;
      auVar304._20_4_ = -auVar463._20_4_;
      auVar304._24_4_ = -auVar463._24_4_;
      auVar304._28_4_ = -auVar463._28_4_;
      auVar163 = vsubps_avx(auVar304,auVar132);
      fVar459 = auVar163._0_4_ * fVar274;
      fVar467 = auVar163._4_4_ * fVar286;
      auVar67._4_4_ = fVar467;
      auVar67._0_4_ = fVar459;
      fVar314 = auVar163._8_4_ * fVar287;
      auVar67._8_4_ = fVar314;
      fVar317 = auVar163._12_4_ * fVar289;
      auVar67._12_4_ = fVar317;
      fVar320 = auVar163._16_4_ * fVar234;
      auVar67._16_4_ = fVar320;
      fVar323 = auVar163._20_4_ * fVar292;
      auVar67._20_4_ = fVar323;
      fVar326 = auVar163._24_4_ * fVar294;
      auVar67._24_4_ = fVar326;
      auVar67._28_4_ = auVar163._28_4_;
      auVar132 = vsubps_avx(auVar132,auVar463);
      fVar274 = auVar132._0_4_ * fVar274;
      fVar286 = auVar132._4_4_ * fVar286;
      auVar68._4_4_ = fVar286;
      auVar68._0_4_ = fVar274;
      fVar287 = auVar132._8_4_ * fVar287;
      auVar68._8_4_ = fVar287;
      fVar289 = auVar132._12_4_ * fVar289;
      auVar68._12_4_ = fVar289;
      fVar234 = auVar132._16_4_ * fVar234;
      auVar68._16_4_ = fVar234;
      fVar292 = auVar132._20_4_ * fVar292;
      auVar68._20_4_ = fVar292;
      fVar294 = auVar132._24_4_ * fVar294;
      auVar68._24_4_ = fVar294;
      auVar68._28_4_ = auVar132._28_4_;
      local_300 = fVar457 * (fVar394 + local_540 * fVar459);
      fStack_2fc = fVar458 * (fVar407 + fStack_53c * fVar467);
      fStack_2f8 = fVar288 * (fVar409 + fStack_538 * fVar314);
      fStack_2f4 = fVar290 * (fVar411 + fStack_534 * fVar317);
      fStack_2f0 = fVar291 * (fVar413 + fStack_530 * fVar320);
      fStack_2ec = fVar293 * (fVar415 + fStack_52c * fVar323);
      fStack_2e8 = fVar295 * (fVar417 + fStack_528 * fVar326);
      fStack_2e4 = fVar419 + auVar165._28_4_ + auVar162._28_4_;
      auVar387._8_4_ = 0x7fffffff;
      auVar387._0_8_ = 0x7fffffff7fffffff;
      auVar387._12_4_ = 0x7fffffff;
      auVar387._16_4_ = 0x7fffffff;
      auVar387._20_4_ = 0x7fffffff;
      auVar387._24_4_ = 0x7fffffff;
      auVar387._28_4_ = 0x7fffffff;
      auVar165 = vandps_avx(auVar387,auVar63);
      auVar132 = vmaxps_avx(local_500,auVar165);
      auVar69._4_4_ = auVar132._4_4_ * 1.9073486e-06;
      auVar69._0_4_ = auVar132._0_4_ * 1.9073486e-06;
      auVar69._8_4_ = auVar132._8_4_ * 1.9073486e-06;
      auVar69._12_4_ = auVar132._12_4_ * 1.9073486e-06;
      auVar69._16_4_ = auVar132._16_4_ * 1.9073486e-06;
      auVar69._20_4_ = auVar132._20_4_ * 1.9073486e-06;
      auVar69._24_4_ = auVar132._24_4_ * 1.9073486e-06;
      auVar69._28_4_ = auVar132._28_4_;
      auVar165 = vandps_avx(local_520,auVar387);
      auVar165 = vcmpps_avx(auVar165,auVar69,1);
      auVar388._8_4_ = 0x7f800000;
      auVar388._0_8_ = 0x7f8000007f800000;
      auVar388._12_4_ = 0x7f800000;
      auVar388._16_4_ = 0x7f800000;
      auVar388._20_4_ = 0x7f800000;
      auVar388._24_4_ = 0x7f800000;
      auVar388._28_4_ = 0x7f800000;
      auVar402 = vblendvps_avx(auVar388,auVar67,auVar131);
      local_320 = fVar457 * (fVar394 + local_540 * fVar274);
      fStack_31c = fVar458 * (fVar407 + fStack_53c * fVar286);
      fStack_318 = fVar288 * (fVar409 + fStack_538 * fVar287);
      fStack_314 = fVar290 * (fVar411 + fStack_534 * fVar289);
      fStack_310 = fVar291 * (fVar413 + fStack_530 * fVar234);
      fStack_30c = fVar293 * (fVar415 + fStack_52c * fVar292);
      fStack_308 = fVar295 * (fVar417 + fStack_528 * fVar294);
      fStack_304 = fVar419 + auVar132._28_4_;
      auVar281._8_4_ = 0xff800000;
      auVar281._0_8_ = 0xff800000ff800000;
      auVar281._12_4_ = 0xff800000;
      auVar281._16_4_ = 0xff800000;
      auVar281._20_4_ = 0xff800000;
      auVar281._24_4_ = 0xff800000;
      auVar281._28_4_ = 0xff800000;
      auVar464 = vblendvps_avx(auVar281,auVar68,auVar131);
      auVar132 = auVar131 & auVar165;
      if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar132 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar132 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar132 >> 0x7f,0) == '\0') &&
            (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar132 >> 0xbf,0) == '\0') &&
          (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar132[0x1f]) {
        auVar92 = ZEXT816(0);
      }
      else {
        auVar130 = vandps_avx(auVar165,auVar131);
        auVar190 = vpackssdw_avx(auVar130._0_16_,auVar130._16_16_);
        auVar165 = vcmpps_avx(auVar471,ZEXT832(0) << 0x20,2);
        auVar448._8_4_ = 0xff800000;
        auVar448._0_8_ = 0xff800000ff800000;
        auVar448._12_4_ = 0xff800000;
        auVar448._16_4_ = 0xff800000;
        auVar448._20_4_ = 0xff800000;
        auVar448._24_4_ = 0xff800000;
        auVar448._28_4_ = 0xff800000;
        auVar470._8_4_ = 0x7f800000;
        auVar470._0_8_ = 0x7f8000007f800000;
        auVar470._12_4_ = 0x7f800000;
        auVar470._16_4_ = 0x7f800000;
        auVar470._20_4_ = 0x7f800000;
        auVar470._24_4_ = 0x7f800000;
        auVar470._28_4_ = 0x7f800000;
        auVar471 = vblendvps_avx(auVar470,auVar448,auVar165);
        auVar215 = vpmovsxwd_avx(auVar190);
        auVar190 = vpunpckhwd_avx(auVar190,auVar190);
        auVar264._16_16_ = auVar190;
        auVar264._0_16_ = auVar215;
        auVar402 = vblendvps_avx(auVar402,auVar471,auVar264);
        auVar471 = vblendvps_avx(auVar448,auVar470,auVar165);
        auVar92._12_4_ = 0;
        auVar92._0_12_ = ZEXT812(0);
        auVar464 = vblendvps_avx(auVar464,auVar471,auVar264);
        auVar471 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar471 = vcmpps_avx(auVar471,auVar471,0xf);
        auVar173._0_4_ = auVar130._0_4_ ^ auVar471._0_4_;
        auVar173._4_4_ = auVar130._4_4_ ^ auVar471._4_4_;
        auVar173._8_4_ = auVar130._8_4_ ^ auVar471._8_4_;
        auVar173._12_4_ = auVar130._12_4_ ^ auVar471._12_4_;
        auVar173._16_4_ = auVar130._16_4_ ^ auVar471._16_4_;
        auVar173._20_4_ = auVar130._20_4_ ^ auVar471._20_4_;
        auVar173._24_4_ = auVar130._24_4_ ^ auVar471._24_4_;
        auVar173._28_4_ = auVar130._28_4_ ^ auVar471._28_4_;
        auVar130 = vorps_avx(auVar165,auVar173);
        auVar130 = vandps_avx(auVar131,auVar130);
      }
    }
    auVar404 = ZEXT3264(auVar402);
    auVar471 = local_280 & auVar130;
    if ((((((((auVar471 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar471 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar471 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar471 >> 0x7f,0) != '\0') ||
          (auVar471 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar471 >> 0xbf,0) != '\0') ||
        (auVar471 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar471[0x1f] < '\0') {
      local_560 = ZEXT416((uint)*(float *)(ray + k * 4 + 0x80));
      auVar190 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_870._0_4_));
      auVar190 = vshufps_avx(auVar190,auVar190,0);
      auVar263._16_16_ = auVar190;
      auVar263._0_16_ = auVar190;
      auVar131 = vminps_avx(auVar263,auVar464);
      fVar234 = local_940._28_4_ + auVar32._28_4_;
      auVar198._0_4_ =
           fVar206 * fVar296 + (float)local_7e0._0_4_ * fVar328 + (float)local_960._0_4_ * fVar422;
      auVar198._4_4_ =
           fVar206 * fVar310 + (float)local_7e0._4_4_ * fVar338 + (float)local_960._4_4_ * fVar430;
      auVar198._8_4_ = fVar206 * fVar312 + fStack_7d8 * fVar340 + fStack_958 * fVar433;
      auVar198._12_4_ = fVar206 * fVar315 + fStack_7d4 * fVar342 + fStack_954 * fVar436;
      auVar198._16_4_ = fVar206 * fVar318 + fStack_7d0 * fVar344 + fStack_950 * fVar438;
      auVar198._20_4_ = fVar206 * fVar321 + fStack_7cc * fVar346 + fStack_94c * fVar440;
      auVar198._24_4_ = fVar206 * fVar324 + fStack_7c8 * fVar348 + fStack_948 * fVar442;
      auVar198._28_4_ = fVar234 + fVar350 + fVar234;
      auVar471 = vrcpps_avx(auVar198);
      fVar350 = auVar471._0_4_;
      fVar459 = auVar471._4_4_;
      auVar70._4_4_ = auVar198._4_4_ * fVar459;
      auVar70._0_4_ = auVar198._0_4_ * fVar350;
      fVar467 = auVar471._8_4_;
      auVar70._8_4_ = auVar198._8_4_ * fVar467;
      fVar274 = auVar471._12_4_;
      auVar70._12_4_ = auVar198._12_4_ * fVar274;
      fVar286 = auVar471._16_4_;
      auVar70._16_4_ = auVar198._16_4_ * fVar286;
      fVar287 = auVar471._20_4_;
      auVar70._20_4_ = auVar198._20_4_ * fVar287;
      fVar289 = auVar471._24_4_;
      auVar70._24_4_ = auVar198._24_4_ * fVar289;
      auVar70._28_4_ = fVar327;
      auVar389._8_4_ = 0x3f800000;
      auVar389._0_8_ = 0x3f8000003f800000;
      auVar389._12_4_ = 0x3f800000;
      auVar389._16_4_ = 0x3f800000;
      auVar389._20_4_ = 0x3f800000;
      auVar389._24_4_ = 0x3f800000;
      auVar389._28_4_ = 0x3f800000;
      auVar32 = vsubps_avx(auVar389,auVar70);
      auVar305._8_4_ = 0x7fffffff;
      auVar305._0_8_ = 0x7fffffff7fffffff;
      auVar305._12_4_ = 0x7fffffff;
      auVar305._16_4_ = 0x7fffffff;
      auVar305._20_4_ = 0x7fffffff;
      auVar305._24_4_ = 0x7fffffff;
      auVar305._28_4_ = 0x7fffffff;
      auVar471 = vandps_avx(auVar198,auVar305);
      auVar358._8_4_ = 0x219392ef;
      auVar358._0_8_ = 0x219392ef219392ef;
      auVar358._12_4_ = 0x219392ef;
      auVar358._16_4_ = 0x219392ef;
      auVar358._20_4_ = 0x219392ef;
      auVar358._24_4_ = 0x219392ef;
      auVar358._28_4_ = 0x219392ef;
      auVar165 = vcmpps_avx(auVar471,auVar358,1);
      auVar404 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar71._4_4_ =
           (fVar459 + fVar459 * auVar32._4_4_) *
           -(fVar310 * fVar254 + fVar338 * fVar253 + fVar430 * fVar252);
      auVar71._0_4_ =
           (fVar350 + fVar350 * auVar32._0_4_) *
           -(fVar296 * fVar248 + fVar328 * fVar235 + fVar422 * fVar233);
      auVar71._8_4_ =
           (fVar467 + fVar467 * auVar32._8_4_) *
           -(fVar312 * fVar272 + fVar340 * fVar270 + fVar433 * fVar268);
      auVar71._12_4_ =
           (fVar274 + fVar274 * auVar32._12_4_) *
           -(fVar315 * fVar362 + fVar342 * fVar359 + fVar436 * fVar351);
      auVar71._16_4_ =
           (fVar286 + fVar286 * auVar32._16_4_) *
           -(fVar318 * fVar421 + fVar344 * fVar418 + fVar438 * fVar374);
      auVar71._20_4_ =
           (fVar287 + fVar287 * auVar32._20_4_) *
           -(fVar321 * fVar455 + fVar346 * fVar453 + fVar440 * fVar451);
      auVar71._24_4_ =
           (fVar289 + fVar289 * auVar32._24_4_) *
           -(fVar324 * fVar439 + fVar348 * fVar437 + fVar442 * fVar435);
      auVar71._28_4_ = -(auVar390._28_4_ + fVar234);
      auVar471 = vcmpps_avx(auVar198,ZEXT1632(auVar92 << 0x20),1);
      auVar471 = vorps_avx(auVar165,auVar471);
      auVar465._8_4_ = 0xff800000;
      auVar465._0_8_ = 0xff800000ff800000;
      auVar465._12_4_ = 0xff800000;
      auVar465._16_4_ = 0xff800000;
      auVar465._20_4_ = 0xff800000;
      auVar465._24_4_ = 0xff800000;
      auVar465._28_4_ = 0xff800000;
      auVar471 = vblendvps_avx(auVar71,auVar465,auVar471);
      auVar32 = vcmpps_avx(auVar198,ZEXT1632(auVar92 << 0x20),6);
      auVar165 = vorps_avx(auVar165,auVar32);
      auVar468._8_4_ = 0x7f800000;
      auVar468._0_8_ = 0x7f8000007f800000;
      auVar468._12_4_ = 0x7f800000;
      auVar468._16_4_ = 0x7f800000;
      auVar468._20_4_ = 0x7f800000;
      auVar468._24_4_ = 0x7f800000;
      auVar468._28_4_ = 0x7f800000;
      auVar165 = vblendvps_avx(auVar71,auVar468,auVar165);
      auVar32 = vmaxps_avx(local_2a0,auVar402);
      auVar32 = vmaxps_avx(auVar32,auVar471);
      auVar165 = vminps_avx(auVar131,auVar165);
      auVar390 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar471 = vsubps_avx(auVar390,auVar469);
      auVar469 = vsubps_avx(auVar390,local_980);
      auVar72._4_4_ = auVar469._4_4_ * -fVar406;
      auVar72._0_4_ = auVar469._0_4_ * -fVar393;
      auVar72._8_4_ = auVar469._8_4_ * -fVar408;
      auVar72._12_4_ = auVar469._12_4_ * -fVar410;
      auVar72._16_4_ = auVar469._16_4_ * -fVar412;
      auVar72._20_4_ = auVar469._20_4_ * -fVar414;
      auVar72._24_4_ = auVar469._24_4_ * -fVar416;
      auVar72._28_4_ = auVar469._28_4_;
      auVar73._4_4_ = fVar339 * auVar471._4_4_;
      auVar73._0_4_ = fVar329 * auVar471._0_4_;
      auVar73._8_4_ = fVar341 * auVar471._8_4_;
      auVar73._12_4_ = fVar343 * auVar471._12_4_;
      auVar73._16_4_ = fVar345 * auVar471._16_4_;
      auVar73._20_4_ = fVar347 * auVar471._20_4_;
      auVar73._24_4_ = fVar349 * auVar471._24_4_;
      auVar73._28_4_ = auVar471._28_4_;
      auVar471 = vsubps_avx(auVar72,auVar73);
      auVar162 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar469 = vsubps_avx(auVar162,local_780);
      auVar74._4_4_ = fVar311 * auVar469._4_4_;
      auVar74._0_4_ = fVar297 * auVar469._0_4_;
      auVar74._8_4_ = fVar313 * auVar469._8_4_;
      auVar74._12_4_ = fVar316 * auVar469._12_4_;
      auVar74._16_4_ = fVar319 * auVar469._16_4_;
      auVar74._20_4_ = fVar322 * auVar469._20_4_;
      uVar8 = auVar469._28_4_;
      auVar74._24_4_ = fVar325 * auVar469._24_4_;
      auVar74._28_4_ = uVar8;
      auVar390 = vsubps_avx(auVar471,auVar74);
      auVar75._4_4_ = -fVar406 * (float)local_960._4_4_;
      auVar75._0_4_ = -fVar393 * (float)local_960._0_4_;
      auVar75._8_4_ = -fVar408 * fStack_958;
      auVar75._12_4_ = -fVar410 * fStack_954;
      auVar75._16_4_ = -fVar412 * fStack_950;
      auVar75._20_4_ = -fVar414 * fStack_94c;
      auVar75._24_4_ = -fVar416 * fStack_948;
      auVar75._28_4_ = local_920._28_4_ ^ 0x80000000;
      auVar76._4_4_ = (float)local_7e0._4_4_ * fVar339;
      auVar76._0_4_ = (float)local_7e0._0_4_ * fVar329;
      auVar76._8_4_ = fStack_7d8 * fVar341;
      auVar76._12_4_ = fStack_7d4 * fVar343;
      auVar76._16_4_ = fStack_7d0 * fVar345;
      auVar76._20_4_ = fStack_7cc * fVar347;
      auVar76._24_4_ = fStack_7c8 * fVar349;
      auVar76._28_4_ = uVar8;
      auVar471 = vsubps_avx(auVar75,auVar76);
      auVar77._4_4_ = fVar206 * fVar311;
      auVar77._0_4_ = fVar206 * fVar297;
      auVar77._8_4_ = fVar206 * fVar313;
      auVar77._12_4_ = fVar206 * fVar316;
      auVar77._16_4_ = fVar206 * fVar319;
      auVar77._20_4_ = fVar206 * fVar322;
      auVar77._24_4_ = fVar206 * fVar325;
      auVar77._28_4_ = uVar8;
      auVar131 = vsubps_avx(auVar471,auVar77);
      auVar471 = vrcpps_avx(auVar131);
      fVar233 = auVar471._0_4_;
      fVar235 = auVar471._4_4_;
      auVar78._4_4_ = auVar131._4_4_ * fVar235;
      auVar78._0_4_ = auVar131._0_4_ * fVar233;
      fVar248 = auVar471._8_4_;
      auVar78._8_4_ = auVar131._8_4_ * fVar248;
      fVar252 = auVar471._12_4_;
      auVar78._12_4_ = auVar131._12_4_ * fVar252;
      fVar253 = auVar471._16_4_;
      auVar78._16_4_ = auVar131._16_4_ * fVar253;
      fVar254 = auVar471._20_4_;
      auVar78._20_4_ = auVar131._20_4_ * fVar254;
      fVar268 = auVar471._24_4_;
      auVar78._24_4_ = auVar131._24_4_ * fVar268;
      auVar78._28_4_ = fVar206;
      auVar136._8_4_ = 0x3f800000;
      auVar136._0_8_ = 0x3f8000003f800000;
      auVar136._12_4_ = 0x3f800000;
      auVar136._16_4_ = 0x3f800000;
      auVar136._20_4_ = 0x3f800000;
      auVar136._24_4_ = 0x3f800000;
      auVar136._28_4_ = 0x3f800000;
      auVar336 = ZEXT3264(auVar136);
      auVar132 = vsubps_avx(auVar136,auVar78);
      auVar137._8_4_ = 0x7fffffff;
      auVar137._0_8_ = 0x7fffffff7fffffff;
      auVar137._12_4_ = 0x7fffffff;
      auVar137._16_4_ = 0x7fffffff;
      auVar137._20_4_ = 0x7fffffff;
      auVar137._24_4_ = 0x7fffffff;
      auVar137._28_4_ = 0x7fffffff;
      auVar471 = vandps_avx(auVar131,auVar137);
      auVar469 = vcmpps_avx(auVar471,auVar358,1);
      auVar79._4_4_ = (fVar235 + fVar235 * auVar132._4_4_) * -auVar390._4_4_;
      auVar79._0_4_ = (fVar233 + fVar233 * auVar132._0_4_) * -auVar390._0_4_;
      auVar79._8_4_ = (fVar248 + fVar248 * auVar132._8_4_) * -auVar390._8_4_;
      auVar79._12_4_ = (fVar252 + fVar252 * auVar132._12_4_) * -auVar390._12_4_;
      auVar79._16_4_ = (fVar253 + fVar253 * auVar132._16_4_) * -auVar390._16_4_;
      auVar79._20_4_ = (fVar254 + fVar254 * auVar132._20_4_) * -auVar390._20_4_;
      auVar79._24_4_ = (fVar268 + fVar268 * auVar132._24_4_) * -auVar390._24_4_;
      auVar79._28_4_ = auVar390._28_4_ ^ 0x80000000;
      auVar471 = vcmpps_avx(auVar131,auVar162,1);
      auVar471 = vorps_avx(auVar469,auVar471);
      auVar471 = vblendvps_avx(auVar79,auVar465,auVar471);
      _local_640 = vmaxps_avx(auVar32,auVar471);
      auVar471 = vcmpps_avx(auVar131,auVar162,6);
      auVar471 = vorps_avx(auVar469,auVar471);
      auVar471 = vblendvps_avx(auVar79,auVar468,auVar471);
      auVar130 = vandps_avx(local_280,auVar130);
      local_340 = vminps_avx(auVar165,auVar471);
      auVar471 = vcmpps_avx(_local_640,local_340,2);
      auVar469 = auVar130 & auVar471;
      if ((((((((auVar469 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar469 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar469 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar469 >> 0x7f,0) != '\0') ||
            (auVar469 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar469 >> 0xbf,0) != '\0') ||
          (auVar469 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar469[0x1f] < '\0') {
        auVar469 = vminps_avx(auVar262,auVar135);
        auVar29 = vminps_avx(auVar29,auVar30);
        auVar469 = vminps_avx(auVar469,auVar29);
        auVar28 = vsubps_avx(auVar469,auVar28);
        auVar130 = vandps_avx(auVar471,auVar130);
        auVar102._4_4_ = fStack_2fc;
        auVar102._0_4_ = local_300;
        auVar102._8_4_ = fStack_2f8;
        auVar102._12_4_ = fStack_2f4;
        auVar102._16_4_ = fStack_2f0;
        auVar102._20_4_ = fStack_2ec;
        auVar102._24_4_ = fStack_2e8;
        auVar102._28_4_ = fStack_2e4;
        auVar471 = vminps_avx(auVar102,auVar136);
        auVar471 = vmaxps_avx(auVar471,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar117 + fVar148 * (auVar471._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar146 + fVar175 * (auVar471._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar147 + fVar177 * (auVar471._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fStack_b44 + fVar179 * (auVar471._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar117 + fVar148 * (auVar471._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar146 + fVar175 * (auVar471._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar147 + fVar177 * (auVar471._24_4_ + 6.0) * 0.125;
        fStack_184 = fStack_b44 + auVar471._28_4_ + 7.0;
        auVar101._4_4_ = fStack_31c;
        auVar101._0_4_ = local_320;
        auVar101._8_4_ = fStack_318;
        auVar101._12_4_ = fStack_314;
        auVar101._16_4_ = fStack_310;
        auVar101._20_4_ = fStack_30c;
        auVar101._24_4_ = fStack_308;
        auVar101._28_4_ = fStack_304;
        auVar471 = vminps_avx(auVar101,auVar136);
        auVar471 = vmaxps_avx(auVar471,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar117 + fVar148 * (auVar471._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar146 + fVar175 * (auVar471._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar147 + fVar177 * (auVar471._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fStack_b44 + fVar179 * (auVar471._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar117 + fVar148 * (auVar471._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar146 + fVar175 * (auVar471._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar147 + fVar177 * (auVar471._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fStack_b44 + auVar471._28_4_ + 7.0;
        auVar80._4_4_ = auVar28._4_4_ * 0.99999976;
        auVar80._0_4_ = auVar28._0_4_ * 0.99999976;
        auVar80._8_4_ = auVar28._8_4_ * 0.99999976;
        auVar80._12_4_ = auVar28._12_4_ * 0.99999976;
        auVar80._16_4_ = auVar28._16_4_ * 0.99999976;
        auVar80._20_4_ = auVar28._20_4_ * 0.99999976;
        auVar80._24_4_ = auVar28._24_4_ * 0.99999976;
        auVar80._28_4_ = 0x3f7ffffc;
        auVar471 = vmaxps_avx(auVar162,auVar80);
        auVar81._4_4_ = auVar471._4_4_ * auVar471._4_4_;
        auVar81._0_4_ = auVar471._0_4_ * auVar471._0_4_;
        auVar81._8_4_ = auVar471._8_4_ * auVar471._8_4_;
        auVar81._12_4_ = auVar471._12_4_ * auVar471._12_4_;
        auVar81._16_4_ = auVar471._16_4_ * auVar471._16_4_;
        auVar81._20_4_ = auVar471._20_4_ * auVar471._20_4_;
        auVar81._24_4_ = auVar471._24_4_ * auVar471._24_4_;
        auVar81._28_4_ = auVar471._28_4_;
        auVar28 = vsubps_avx(auVar35,auVar81);
        auVar82._4_4_ = auVar28._4_4_ * fVar443 * 4.0;
        auVar82._0_4_ = auVar28._0_4_ * fVar441 * 4.0;
        auVar82._8_4_ = auVar28._8_4_ * fVar450 * 4.0;
        auVar82._12_4_ = auVar28._12_4_ * fVar452 * 4.0;
        auVar82._16_4_ = auVar28._16_4_ * fVar454 * 4.0;
        auVar82._20_4_ = auVar28._20_4_ * fVar456 * 4.0;
        auVar82._24_4_ = auVar28._24_4_ * fVar377 * 4.0;
        auVar82._28_4_ = auVar471._28_4_;
        auVar403 = vsubps_avx(auVar64,auVar82);
        auVar471 = vcmpps_avx(auVar403,ZEXT832(0) << 0x20,5);
        auVar469 = ZEXT832(0) << 0x20;
        if ((((((((auVar471 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar471 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar471 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar471 >> 0x7f,0) == '\0') &&
              (auVar471 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar471 >> 0xbf,0) == '\0') &&
            (auVar471 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar471[0x1f]) {
          auVar165 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_820 = ZEXT832(0) << 0x20;
          _local_840 = ZEXT832(0) << 0x20;
          auVar220 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar242 = ZEXT828(0) << 0x20;
          auVar282._8_4_ = 0x7f800000;
          auVar282._0_8_ = 0x7f8000007f800000;
          auVar282._12_4_ = 0x7f800000;
          auVar282._16_4_ = 0x7f800000;
          auVar282._20_4_ = 0x7f800000;
          auVar282._24_4_ = 0x7f800000;
          auVar282._28_4_ = 0x7f800000;
          auVar306._8_4_ = 0xff800000;
          auVar306._0_8_ = 0xff800000ff800000;
          auVar306._12_4_ = 0xff800000;
          auVar306._16_4_ = 0xff800000;
          auVar306._20_4_ = 0xff800000;
          auVar306._24_4_ = 0xff800000;
          auVar306._28_4_ = 0xff800000;
          _local_800 = _local_820;
        }
        else {
          auVar29 = vsqrtps_avx(auVar403);
          auVar226._0_4_ = fVar441 + fVar441;
          auVar226._4_4_ = fVar443 + fVar443;
          auVar226._8_4_ = fVar450 + fVar450;
          auVar226._12_4_ = fVar452 + fVar452;
          auVar226._16_4_ = fVar454 + fVar454;
          auVar226._20_4_ = fVar456 + fVar456;
          auVar226._24_4_ = fVar377 + fVar377;
          auVar226._28_4_ = fVar229 + fVar229;
          auVar469 = vrcpps_avx(auVar226);
          fVar229 = auVar469._0_4_;
          fVar233 = auVar469._4_4_;
          auVar83._4_4_ = auVar226._4_4_ * fVar233;
          auVar83._0_4_ = auVar226._0_4_ * fVar229;
          fVar235 = auVar469._8_4_;
          auVar83._8_4_ = auVar226._8_4_ * fVar235;
          fVar248 = auVar469._12_4_;
          auVar83._12_4_ = auVar226._12_4_ * fVar248;
          fVar252 = auVar469._16_4_;
          auVar83._16_4_ = auVar226._16_4_ * fVar252;
          fVar253 = auVar469._20_4_;
          auVar83._20_4_ = auVar226._20_4_ * fVar253;
          fVar254 = auVar469._24_4_;
          auVar83._24_4_ = auVar226._24_4_ * fVar254;
          auVar83._28_4_ = auVar226._28_4_;
          auVar30 = vsubps_avx(auVar136,auVar83);
          fVar229 = fVar229 + fVar229 * auVar30._0_4_;
          fVar233 = fVar233 + fVar233 * auVar30._4_4_;
          fVar235 = fVar235 + fVar235 * auVar30._8_4_;
          fVar248 = fVar248 + fVar248 * auVar30._12_4_;
          fVar252 = fVar252 + fVar252 * auVar30._16_4_;
          fVar253 = fVar253 + fVar253 * auVar30._20_4_;
          fVar254 = fVar254 + fVar254 * auVar30._24_4_;
          fVar268 = auVar469._28_4_ + auVar30._28_4_;
          auVar244._0_8_ = auVar463._0_8_ ^ 0x8000000080000000;
          auVar244._8_4_ = -auVar463._8_4_;
          auVar244._12_4_ = -auVar463._12_4_;
          auVar244._16_4_ = -auVar463._16_4_;
          auVar244._20_4_ = -auVar463._20_4_;
          auVar244._24_4_ = -auVar463._24_4_;
          auVar244._28_4_ = -auVar463._28_4_;
          auVar469 = vsubps_avx(auVar244,auVar29);
          fVar421 = auVar469._0_4_ * fVar229;
          fVar451 = auVar469._4_4_ * fVar233;
          auVar84._4_4_ = fVar451;
          auVar84._0_4_ = fVar421;
          fVar453 = auVar469._8_4_ * fVar235;
          auVar84._8_4_ = fVar453;
          fVar455 = auVar469._12_4_ * fVar248;
          auVar84._12_4_ = fVar455;
          fVar435 = auVar469._16_4_ * fVar252;
          auVar84._16_4_ = fVar435;
          fVar437 = auVar469._20_4_ * fVar253;
          auVar84._20_4_ = fVar437;
          fVar439 = auVar469._24_4_ * fVar254;
          auVar84._24_4_ = fVar439;
          auVar84._28_4_ = local_280._28_4_;
          auVar29 = vsubps_avx(auVar29,auVar463);
          fVar229 = auVar29._0_4_ * fVar229;
          fVar233 = auVar29._4_4_ * fVar233;
          auVar85._4_4_ = fVar233;
          auVar85._0_4_ = fVar229;
          fVar235 = auVar29._8_4_ * fVar235;
          auVar85._8_4_ = fVar235;
          fVar248 = auVar29._12_4_ * fVar248;
          auVar85._12_4_ = fVar248;
          fVar252 = auVar29._16_4_ * fVar252;
          auVar85._16_4_ = fVar252;
          fVar253 = auVar29._20_4_ * fVar253;
          auVar85._20_4_ = fVar253;
          fVar254 = auVar29._24_4_ * fVar254;
          auVar85._24_4_ = fVar254;
          auVar85._28_4_ = fVar434;
          fVar270 = fVar457 * (fVar421 * local_540 + fVar394);
          fVar272 = fVar458 * (fVar451 * fStack_53c + fVar407);
          fVar351 = fVar288 * (fVar453 * fStack_538 + fVar409);
          fVar359 = fVar290 * (fVar455 * fStack_534 + fVar411);
          fVar362 = fVar291 * (fVar435 * fStack_530 + fVar413);
          fVar374 = fVar293 * (fVar437 * fStack_52c + fVar415);
          fVar418 = fVar295 * (fVar439 * fStack_528 + fVar417);
          auStack_610._12_4_ = auVar31._28_4_;
          auVar166._0_4_ = fVar352 + fVar232 * fVar270;
          auVar166._4_4_ = fVar360 + fVar251 * fVar272;
          auVar166._8_4_ = fVar363 + fVar267 * fVar351;
          auVar166._12_4_ = fVar366 + fVar273 * fVar359;
          auVar166._16_4_ = fVar369 + fVar371 * fVar362;
          auVar166._20_4_ = fVar372 + fVar380 * fVar374;
          auVar166._24_4_ = fVar375 + fVar431 * fVar418;
          auVar166._28_4_ = fVar378 + auVar29._28_4_ + fVar419;
          auVar86._4_4_ = fVar206 * fVar451;
          auVar86._0_4_ = fVar206 * fVar421;
          auVar86._8_4_ = fVar206 * fVar453;
          auVar86._12_4_ = fVar206 * fVar455;
          auVar86._16_4_ = fVar206 * fVar435;
          auVar86._20_4_ = fVar206 * fVar437;
          auVar86._24_4_ = fVar206 * fVar439;
          auVar86._28_4_ = fVar268;
          auVar165 = vsubps_avx(auVar86,auVar166);
          auVar227._0_4_ = fVar353 + fVar176 * fVar270;
          auVar227._4_4_ = fVar361 + fVar249 * fVar272;
          auVar227._8_4_ = fVar364 + fVar265 * fVar351;
          auVar227._12_4_ = fVar367 + fVar269 * fVar359;
          auVar227._16_4_ = fVar370 + fVar365 * fVar362;
          auVar227._20_4_ = fVar373 + fVar429 * fVar374;
          auVar227._24_4_ = fVar376 + fVar420 * fVar418;
          auVar227._28_4_ = fVar379 + fVar268;
          auVar283._0_4_ = (float)local_7e0._0_4_ * fVar421;
          auVar283._4_4_ = (float)local_7e0._4_4_ * fVar451;
          auVar283._8_4_ = fStack_7d8 * fVar453;
          auVar283._12_4_ = fStack_7d4 * fVar455;
          auVar283._16_4_ = fStack_7d0 * fVar435;
          auVar283._20_4_ = fStack_7cc * fVar437;
          auVar283._24_4_ = fStack_7c8 * fVar439;
          auVar283._28_4_ = 0;
          local_980 = vsubps_avx(auVar283,auVar227);
          auVar245._0_4_ = local_8c0 + fVar231 * fVar270;
          auVar245._4_4_ = fStack_8bc + fVar250 * fVar272;
          auVar245._8_4_ = fStack_8b8 + fVar266 * fVar351;
          auVar245._12_4_ = fStack_8b4 + fVar271 * fVar359;
          auVar245._16_4_ = fStack_8b0 + fVar368 * fVar362;
          auVar245._20_4_ = fStack_8ac + fVar432 * fVar374;
          auVar245._24_4_ = fStack_8a8 + fVar428 * fVar418;
          auVar245._28_4_ = fStack_8a4 + auVar469._28_4_;
          auVar87._4_4_ = (float)local_960._4_4_ * fVar451;
          auVar87._0_4_ = (float)local_960._0_4_ * fVar421;
          auVar87._8_4_ = fStack_958 * fVar453;
          auVar87._12_4_ = fStack_954 * fVar455;
          auVar87._16_4_ = fStack_950 * fVar435;
          auVar87._20_4_ = fStack_94c * fVar437;
          auVar87._24_4_ = fStack_948 * fVar439;
          auVar87._28_4_ = 0;
          auVar469 = vsubps_avx(auVar87,auVar245);
          auVar242 = auVar469._0_28_;
          fVar457 = fVar457 * (fVar229 * local_540 + fVar394);
          fVar458 = fVar458 * (fVar233 * fStack_53c + fVar407);
          fVar288 = fVar288 * (fVar235 * fStack_538 + fVar409);
          fVar290 = fVar290 * (fVar248 * fStack_534 + fVar411);
          fVar291 = fVar291 * (fVar252 * fStack_530 + fVar413);
          fVar293 = fVar293 * (fVar253 * fStack_52c + fVar415);
          fVar295 = fVar295 * (fVar254 * fStack_528 + fVar417);
          auVar307._0_4_ = fVar352 + fVar232 * fVar457;
          auVar307._4_4_ = fVar360 + fVar251 * fVar458;
          auVar307._8_4_ = fVar363 + fVar267 * fVar288;
          auVar307._12_4_ = fVar366 + fVar273 * fVar290;
          auVar307._16_4_ = fVar369 + fVar371 * fVar291;
          auVar307._20_4_ = fVar372 + fVar380 * fVar293;
          auVar307._24_4_ = fVar375 + fVar431 * fVar295;
          auVar307._28_4_ = fVar378 + (float)auStack_610._12_4_;
          auVar88._4_4_ = fVar206 * fVar233;
          auVar88._0_4_ = fVar206 * fVar229;
          auVar88._8_4_ = fVar206 * fVar235;
          auVar88._12_4_ = fVar206 * fVar248;
          auVar88._16_4_ = fVar206 * fVar252;
          auVar88._20_4_ = fVar206 * fVar253;
          auVar88._24_4_ = fVar206 * fVar254;
          auVar88._28_4_ = fVar378;
          _local_800 = vsubps_avx(auVar88,auVar307);
          auVar308._0_4_ = fVar353 + fVar176 * fVar457;
          auVar308._4_4_ = fVar361 + fVar249 * fVar458;
          auVar308._8_4_ = fVar364 + fVar265 * fVar288;
          auVar308._12_4_ = fVar367 + fVar269 * fVar290;
          auVar308._16_4_ = fVar370 + fVar365 * fVar291;
          auVar308._20_4_ = fVar373 + fVar429 * fVar293;
          auVar308._24_4_ = fVar376 + fVar420 * fVar295;
          auVar308._28_4_ = fVar379 + local_800._28_4_;
          auVar89._4_4_ = (float)local_7e0._4_4_ * fVar233;
          auVar89._0_4_ = (float)local_7e0._0_4_ * fVar229;
          auVar89._8_4_ = fStack_7d8 * fVar235;
          auVar89._12_4_ = fStack_7d4 * fVar248;
          auVar89._16_4_ = fStack_7d0 * fVar252;
          auVar89._20_4_ = fStack_7cc * fVar253;
          auVar89._24_4_ = fStack_7c8 * fVar254;
          auVar89._28_4_ = fVar378;
          _local_820 = vsubps_avx(auVar89,auVar308);
          auVar284._0_4_ = local_8c0 + fVar231 * fVar457;
          auVar284._4_4_ = fStack_8bc + fVar250 * fVar458;
          auVar284._8_4_ = fStack_8b8 + fVar266 * fVar288;
          auVar284._12_4_ = fStack_8b4 + fVar271 * fVar290;
          auVar284._16_4_ = fStack_8b0 + fVar368 * fVar291;
          auVar284._20_4_ = fStack_8ac + fVar432 * fVar293;
          auVar284._24_4_ = fStack_8a8 + fVar428 * fVar295;
          auVar284._28_4_ = fStack_8a4 + fVar419 + 0.0;
          auVar90._4_4_ = (float)local_960._4_4_ * fVar233;
          auVar90._0_4_ = (float)local_960._0_4_ * fVar229;
          auVar90._8_4_ = fStack_958 * fVar235;
          auVar90._12_4_ = fStack_954 * fVar248;
          auVar90._16_4_ = fStack_950 * fVar252;
          auVar90._20_4_ = fStack_94c * fVar253;
          auVar90._24_4_ = fStack_948 * fVar254;
          auVar90._28_4_ = local_820._28_4_;
          auVar469 = ZEXT1232(ZEXT812(0)) << 0x20;
          _local_840 = vsubps_avx(auVar90,auVar284);
          auVar390 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar30 = vcmpps_avx(auVar403,auVar390,5);
          auVar285._8_4_ = 0x7f800000;
          auVar285._0_8_ = 0x7f8000007f800000;
          auVar285._12_4_ = 0x7f800000;
          auVar285._16_4_ = 0x7f800000;
          auVar285._20_4_ = 0x7f800000;
          auVar285._24_4_ = 0x7f800000;
          auVar285._28_4_ = 0x7f800000;
          auVar282 = vblendvps_avx(auVar285,auVar84,auVar30);
          auVar391._8_4_ = 0x7fffffff;
          auVar391._0_8_ = 0x7fffffff7fffffff;
          auVar391._12_4_ = 0x7fffffff;
          auVar391._16_4_ = 0x7fffffff;
          auVar391._20_4_ = 0x7fffffff;
          auVar391._24_4_ = 0x7fffffff;
          auVar391._28_4_ = 0x7fffffff;
          auVar29 = vandps_avx(auVar391,auVar63);
          auVar29 = vmaxps_avx(local_500,auVar29);
          auVar403._8_4_ = 0x36000000;
          auVar403._0_8_ = 0x3600000036000000;
          auVar403._12_4_ = 0x36000000;
          auVar403._16_4_ = 0x36000000;
          auVar403._20_4_ = 0x36000000;
          auVar403._24_4_ = 0x36000000;
          auVar403._28_4_ = 0x36000000;
          auVar91._4_4_ = auVar29._4_4_ * 1.9073486e-06;
          auVar91._0_4_ = auVar29._0_4_ * 1.9073486e-06;
          auVar91._8_4_ = auVar29._8_4_ * 1.9073486e-06;
          auVar91._12_4_ = auVar29._12_4_ * 1.9073486e-06;
          auVar91._16_4_ = auVar29._16_4_ * 1.9073486e-06;
          auVar91._20_4_ = auVar29._20_4_ * 1.9073486e-06;
          auVar91._24_4_ = auVar29._24_4_ * 1.9073486e-06;
          auVar91._28_4_ = auVar29._28_4_;
          auVar29 = vandps_avx(auVar391,local_520);
          auVar29 = vcmpps_avx(auVar29,auVar91,1);
          auVar309._8_4_ = 0xff800000;
          auVar309._0_8_ = 0xff800000ff800000;
          auVar309._12_4_ = 0xff800000;
          auVar309._16_4_ = 0xff800000;
          auVar309._20_4_ = 0xff800000;
          auVar309._24_4_ = 0xff800000;
          auVar309._28_4_ = 0xff800000;
          auVar306 = vblendvps_avx(auVar309,auVar85,auVar30);
          auVar32 = auVar30 & auVar29;
          if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar32 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar32 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar32 >> 0x7f,0) != '\0') ||
                (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar32 >> 0xbf,0) != '\0') ||
              (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar32[0x1f] < '\0') {
            auVar471 = vandps_avx(auVar29,auVar30);
            auVar190 = vpackssdw_avx(auVar471._0_16_,auVar471._16_16_);
            auVar29 = vcmpps_avx(auVar28,auVar390,2);
            auVar449._8_4_ = 0xff800000;
            auVar449._0_8_ = 0xff800000ff800000;
            auVar449._12_4_ = 0xff800000;
            auVar449._16_4_ = 0xff800000;
            auVar449._20_4_ = 0xff800000;
            auVar449._24_4_ = 0xff800000;
            auVar449._28_4_ = 0xff800000;
            auVar466._8_4_ = 0x7f800000;
            auVar466._0_8_ = 0x7f8000007f800000;
            auVar466._12_4_ = 0x7f800000;
            auVar466._16_4_ = 0x7f800000;
            auVar466._20_4_ = 0x7f800000;
            auVar466._24_4_ = 0x7f800000;
            auVar466._28_4_ = 0x7f800000;
            auVar28 = vblendvps_avx(auVar466,auVar449,auVar29);
            auVar215 = vpmovsxwd_avx(auVar190);
            auVar190 = vpunpckhwd_avx(auVar190,auVar190);
            auVar392._16_16_ = auVar190;
            auVar392._0_16_ = auVar215;
            auVar282 = vblendvps_avx(auVar282,auVar28,auVar392);
            auVar403 = vblendvps_avx(auVar449,auVar466,auVar29);
            auVar306 = vblendvps_avx(auVar306,auVar403,auVar392);
            auVar28 = vcmpps_avx(auVar469,auVar469,0xf);
            auVar144._0_4_ = auVar28._0_4_ ^ auVar471._0_4_;
            auVar144._4_4_ = auVar28._4_4_ ^ auVar471._4_4_;
            auVar144._8_4_ = auVar28._8_4_ ^ auVar471._8_4_;
            auVar144._12_4_ = auVar28._12_4_ ^ auVar471._12_4_;
            auVar144._16_4_ = auVar28._16_4_ ^ auVar471._16_4_;
            auVar144._20_4_ = auVar28._20_4_ ^ auVar471._20_4_;
            auVar144._24_4_ = auVar28._24_4_ ^ auVar471._24_4_;
            auVar144._28_4_ = auVar28._28_4_ ^ auVar471._28_4_;
            auVar471 = vorps_avx(auVar29,auVar144);
            auVar471 = vandps_avx(auVar30,auVar471);
          }
          auVar220 = local_980._0_28_;
        }
        auVar404 = ZEXT3264(auVar403);
        _local_3a0 = _local_640;
        local_380 = vminps_avx(local_340,auVar282);
        _local_660 = vmaxps_avx(_local_640,auVar306);
        local_360 = _local_660;
        auVar28 = vcmpps_avx(_local_640,local_380,2);
        local_5a0 = vandps_avx(auVar28,auVar130);
        auVar28 = vcmpps_avx(_local_660,local_340,2);
        local_680 = vandps_avx(auVar28,auVar130);
        auVar130 = vorps_avx(local_680,local_5a0);
        auVar336 = ZEXT1664(local_560);
        if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar130 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar130 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar130 >> 0x7f,0) != '\0') ||
              (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar130 >> 0xbf,0) != '\0') ||
            (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar130[0x1f] < '\0') {
          local_6a0 = vcmpps_avx(auVar469,auVar469,0xf);
          local_5e0._0_4_ = auVar471._0_4_ ^ local_6a0._0_4_;
          local_5e0._4_4_ = auVar471._4_4_ ^ local_6a0._4_4_;
          local_5e0._8_4_ = auVar471._8_4_ ^ local_6a0._8_4_;
          local_5e0._12_4_ = auVar471._12_4_ ^ local_6a0._12_4_;
          local_5e0._16_4_ = auVar471._16_4_ ^ local_6a0._16_4_;
          local_5e0._20_4_ = auVar471._20_4_ ^ local_6a0._20_4_;
          local_5e0._24_4_ = auVar471._24_4_ ^ local_6a0._24_4_;
          local_5e0._28_4_ = (uint)auVar471._28_4_ ^ local_6a0._28_4_;
          auVar140._0_4_ =
               auVar165._0_4_ * fVar206 +
               (float)local_7e0._0_4_ * auVar220._0_4_ + (float)local_960._0_4_ * auVar242._0_4_;
          auVar140._4_4_ =
               auVar165._4_4_ * fVar206 +
               (float)local_7e0._4_4_ * auVar220._4_4_ + (float)local_960._4_4_ * auVar242._4_4_;
          auVar140._8_4_ =
               auVar165._8_4_ * fVar206 + fStack_7d8 * auVar220._8_4_ + fStack_958 * auVar242._8_4_;
          auVar140._12_4_ =
               auVar165._12_4_ * fVar206 +
               fStack_7d4 * auVar220._12_4_ + fStack_954 * auVar242._12_4_;
          auVar140._16_4_ =
               auVar165._16_4_ * fVar206 +
               fStack_7d0 * auVar220._16_4_ + fStack_950 * auVar242._16_4_;
          auVar140._20_4_ =
               auVar165._20_4_ * fVar206 +
               fStack_7cc * auVar220._20_4_ + fStack_94c * auVar242._20_4_;
          auVar140._24_4_ =
               auVar165._24_4_ * fVar206 +
               fStack_7c8 * auVar220._24_4_ + fStack_948 * auVar242._24_4_;
          auVar140._28_4_ = auVar471._28_4_ + auVar165._28_4_ + fStack_7c4;
          auVar168._8_4_ = 0x7fffffff;
          auVar168._0_8_ = 0x7fffffff7fffffff;
          auVar168._12_4_ = 0x7fffffff;
          auVar168._16_4_ = 0x7fffffff;
          auVar168._20_4_ = 0x7fffffff;
          auVar168._24_4_ = 0x7fffffff;
          auVar168._28_4_ = 0x7fffffff;
          auVar130 = vandps_avx(auVar140,auVar168);
          auVar169._8_4_ = 0x3e99999a;
          auVar169._0_8_ = 0x3e99999a3e99999a;
          auVar169._12_4_ = 0x3e99999a;
          auVar169._16_4_ = 0x3e99999a;
          auVar169._20_4_ = 0x3e99999a;
          auVar169._24_4_ = 0x3e99999a;
          auVar169._28_4_ = 0x3e99999a;
          auVar130 = vcmpps_avx(auVar130,auVar169,1);
          auVar130 = vorps_avx(auVar130,local_5e0);
          auVar170._8_4_ = 3;
          auVar170._0_8_ = 0x300000003;
          auVar170._12_4_ = 3;
          auVar170._16_4_ = 3;
          auVar170._20_4_ = 3;
          auVar170._24_4_ = 3;
          auVar170._28_4_ = 3;
          auVar199._8_4_ = 2;
          auVar199._0_8_ = 0x200000002;
          auVar199._12_4_ = 2;
          auVar199._16_4_ = 2;
          auVar199._20_4_ = 2;
          auVar199._24_4_ = 2;
          auVar199._28_4_ = 2;
          auVar130 = vblendvps_avx(auVar199,auVar170,auVar130);
          local_600 = ZEXT432(local_be8);
          local_620 = vpshufd_avx(ZEXT416(local_be8),0);
          fVar229 = 0.0;
          auVar190 = vpcmpgtd_avx(auVar130._16_16_,local_620);
          auStack_610 = auVar31._16_16_;
          auVar215 = vpcmpgtd_avx(auVar130._0_16_,local_620);
          auVar171._16_16_ = auVar190;
          auVar171._0_16_ = auVar215;
          local_5c0 = vblendps_avx(ZEXT1632(auVar215),auVar171,0xf0);
          local_580 = vandnps_avx(local_5c0,local_5a0);
          auVar336 = ZEXT3264(local_580);
          auVar130 = local_5a0 & ~local_5c0;
          local_a80 = auVar13._0_4_;
          fStack_a7c = auVar13._4_4_;
          fStack_a78 = auVar13._8_4_;
          fStack_a74 = auVar13._12_4_;
          local_a60 = auVar11._0_4_;
          fStack_a5c = auVar11._4_4_;
          fStack_a58 = auVar11._8_4_;
          fStack_a54 = auVar11._12_4_;
          local_a70 = auVar12._0_4_;
          fStack_a6c = auVar12._4_4_;
          fStack_a68 = auVar12._8_4_;
          fStack_a64 = auVar12._12_4_;
          local_a50 = auVar34._0_4_;
          fStack_a4c = auVar34._4_4_;
          fStack_a48 = auVar34._8_4_;
          fStack_a44 = auVar34._12_4_;
          if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar130 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar130 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar130 >> 0x7f,0) == '\0') &&
                (auVar130 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar130 >> 0xbf,0) == '\0') &&
              (auVar130 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar130[0x1f]) {
            auVar190 = vshufps_avx(local_560,local_560,0);
            auVar141._16_16_ = auVar190;
            auVar141._0_16_ = auVar190;
            fVar176 = (float)local_960._0_4_;
            fVar233 = (float)local_960._4_4_;
            fVar235 = fStack_958;
            fVar248 = fStack_954;
            fVar249 = fStack_950;
            fVar250 = fStack_94c;
            fVar251 = fStack_948;
          }
          else {
            local_8e0._4_4_ = fVar205 + (float)local_640._4_4_;
            local_8e0._0_4_ = fVar178 + (float)local_640._0_4_;
            fStack_8d8 = fVar405 + fStack_638;
            fStack_8d4 = fVar230 + fStack_634;
            fStack_8d0 = fVar178 + fStack_630;
            fStack_8cc = fVar205 + fStack_62c;
            fStack_8c8 = fVar405 + fStack_628;
            fStack_8c4 = fVar230 + fStack_624;
            do {
              auVar142._8_4_ = 0x7f800000;
              auVar142._0_8_ = 0x7f8000007f800000;
              auVar142._12_4_ = 0x7f800000;
              auVar142._16_4_ = 0x7f800000;
              auVar142._20_4_ = 0x7f800000;
              auVar142._24_4_ = 0x7f800000;
              auVar142._28_4_ = 0x7f800000;
              auVar130 = auVar336._0_32_;
              auVar471 = vblendvps_avx(auVar142,_local_640,auVar130);
              auVar28 = vshufps_avx(auVar471,auVar471,0xb1);
              auVar28 = vminps_avx(auVar471,auVar28);
              auVar469 = vshufpd_avx(auVar28,auVar28,5);
              auVar28 = vminps_avx(auVar28,auVar469);
              auVar469 = vperm2f128_avx(auVar28,auVar28,1);
              auVar28 = vminps_avx(auVar28,auVar469);
              auVar471 = vcmpps_avx(auVar471,auVar28,0);
              auVar28 = auVar130 & auVar471;
              if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar28 >> 0x7f,0) != '\0') ||
                    (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar28 >> 0xbf,0) != '\0') ||
                  (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar28[0x1f] < '\0') {
                auVar130 = vandps_avx(auVar471,auVar130);
              }
              uVar104 = vmovmskps_avx(auVar130);
              uVar107 = 0;
              if (uVar104 != 0) {
                for (; (uVar104 >> uVar107 & 1) == 0; uVar107 = uVar107 + 1) {
                }
              }
              uVar106 = (ulong)uVar107;
              *(undefined4 *)(local_580 + uVar106 * 4) = 0;
              fVar229 = local_1a0[uVar106];
              uVar107 = *(uint *)(local_3a0 + uVar106 * 4);
              fVar176 = auVar152._0_4_;
              if ((float)local_900._0_4_ < 0.0) {
                fVar176 = sqrtf((float)local_900._0_4_);
              }
              auVar215 = vminps_avx(auVar34,auVar12);
              auVar190 = vmaxps_avx(auVar34,auVar12);
              auVar126 = vminps_avx(auVar11,auVar13);
              auVar156 = vminps_avx(auVar215,auVar126);
              auVar215 = vmaxps_avx(auVar11,auVar13);
              auVar126 = vmaxps_avx(auVar190,auVar215);
              auVar209._8_4_ = 0x7fffffff;
              auVar209._0_8_ = 0x7fffffff7fffffff;
              auVar209._12_4_ = 0x7fffffff;
              auVar190 = vandps_avx(auVar156,auVar209);
              auVar215 = vandps_avx(auVar126,auVar209);
              auVar190 = vmaxps_avx(auVar190,auVar215);
              auVar215 = vmovshdup_avx(auVar190);
              auVar215 = vmaxss_avx(auVar215,auVar190);
              auVar190 = vshufpd_avx(auVar190,auVar190,1);
              auVar190 = vmaxss_avx(auVar190,auVar215);
              fVar231 = auVar190._0_4_ * 1.9073486e-06;
              local_780._0_4_ = fVar176 * 1.9073486e-06;
              local_7c0._0_16_ = vshufps_avx(auVar126,auVar126,0xff);
              auVar190 = vinsertps_avx(ZEXT416(uVar107),ZEXT416((uint)fVar229),0x10);
              auVar404 = ZEXT1664(auVar190);
              bVar115 = true;
              uVar106 = 0;
              do {
                auVar395 = auVar404._0_16_;
                auVar190 = vshufps_avx(auVar395,auVar395,0);
                auVar121._0_4_ = auVar190._0_4_ * (float)local_8f0._0_4_ + 0.0;
                auVar121._4_4_ = auVar190._4_4_ * (float)local_8f0._4_4_ + 0.0;
                auVar121._8_4_ = auVar190._8_4_ * fStack_8e8 + 0.0;
                auVar121._12_4_ = auVar190._12_4_ * fStack_8e4 + 0.0;
                auVar190 = vmovshdup_avx(auVar395);
                fVar233 = auVar190._0_4_;
                fVar176 = 1.0 - fVar233;
                fVar229 = fVar233 * 3.0;
                auVar190 = ZEXT416((uint)(fVar233 * fVar233 * -fVar176 * 0.5));
                auVar190 = vshufps_avx(auVar190,auVar190,0);
                auVar215 = ZEXT416((uint)((fVar176 * fVar176 * (fVar176 * 3.0 + -5.0) + 2.0) * 0.5))
                ;
                auVar215 = vshufps_avx(auVar215,auVar215,0);
                auVar126 = ZEXT416((uint)((fVar233 * fVar233 * (fVar229 + -5.0) + 2.0) * 0.5));
                auVar126 = vshufps_avx(auVar126,auVar126,0);
                auVar156 = ZEXT416((uint)(fVar176 * fVar176 * -fVar233 * 0.5));
                auVar156 = vshufps_avx(auVar156,auVar156,0);
                auVar181._0_4_ =
                     auVar156._0_4_ * local_a50 +
                     auVar126._0_4_ * local_a70 +
                     auVar215._0_4_ * local_a60 + auVar190._0_4_ * local_a80;
                auVar181._4_4_ =
                     auVar156._4_4_ * fStack_a4c +
                     auVar126._4_4_ * fStack_a6c +
                     auVar215._4_4_ * fStack_a5c + auVar190._4_4_ * fStack_a7c;
                auVar181._8_4_ =
                     auVar156._8_4_ * fStack_a48 +
                     auVar126._8_4_ * fStack_a68 +
                     auVar215._8_4_ * fStack_a58 + auVar190._8_4_ * fStack_a78;
                auVar181._12_4_ =
                     auVar156._12_4_ * fStack_a44 +
                     auVar126._12_4_ * fStack_a64 +
                     auVar215._12_4_ * fStack_a54 + auVar190._12_4_ * fStack_a74;
                local_980._0_16_ = auVar181;
                auVar190 = vsubps_avx(auVar121,auVar181);
                local_8c0 = auVar190._0_4_;
                fStack_8bc = auVar190._4_4_;
                fStack_8b8 = auVar190._8_4_;
                fStack_8b4 = auVar190._12_4_;
                auVar190 = vdpps_avx(auVar190,auVar190,0x7f);
                fVar232 = auVar190._0_4_;
                if (fVar232 < 0.0) {
                  local_920._0_4_ = fVar229;
                  local_940._0_4_ = fVar233 * 9.0;
                  local_7a0._0_4_ = fVar176 * -2.0;
                  fVar235 = sqrtf(fVar232);
                  fVar250 = (float)local_940._0_4_;
                  fVar248 = (float)local_7a0._0_4_;
                  fVar249 = (float)local_920._0_4_;
                }
                else {
                  auVar215 = vsqrtss_avx(auVar190,auVar190);
                  fVar235 = auVar215._0_4_;
                  fVar250 = fVar233 * 9.0;
                  fVar248 = fVar176 * -2.0;
                  fVar249 = fVar229;
                }
                auVar215 = ZEXT416((uint)((fVar233 * fVar233 + fVar233 * fVar248) * 0.5));
                auVar215 = vshufps_avx(auVar215,auVar215,0);
                auVar126 = ZEXT416((uint)(((fVar176 + fVar176) * (fVar249 + 2.0) +
                                          fVar176 * fVar176 * -3.0) * 0.5));
                auVar126 = vshufps_avx(auVar126,auVar126,0);
                auVar156 = ZEXT416((uint)(((fVar229 + -5.0) * (fVar233 + fVar233) +
                                          fVar233 * fVar249) * 0.5));
                auVar156 = vshufps_avx(auVar156,auVar156,0);
                auVar157 = ZEXT416((uint)((fVar233 * (fVar176 + fVar176) - fVar176 * fVar176) * 0.5)
                                  );
                auVar157 = vshufps_avx(auVar157,auVar157,0);
                auVar381._0_4_ =
                     local_a50 * auVar157._0_4_ +
                     local_a70 * auVar156._0_4_ +
                     local_a80 * auVar215._0_4_ + local_a60 * auVar126._0_4_;
                auVar381._4_4_ =
                     fStack_a4c * auVar157._4_4_ +
                     fStack_a6c * auVar156._4_4_ +
                     fStack_a7c * auVar215._4_4_ + fStack_a5c * auVar126._4_4_;
                auVar381._8_4_ =
                     fStack_a48 * auVar157._8_4_ +
                     fStack_a68 * auVar156._8_4_ +
                     fStack_a78 * auVar215._8_4_ + fStack_a58 * auVar126._8_4_;
                auVar381._12_4_ =
                     fStack_a44 * auVar157._12_4_ +
                     fStack_a64 * auVar156._12_4_ +
                     fStack_a74 * auVar215._12_4_ + fStack_a54 * auVar126._12_4_;
                auVar157 = vpermilps_avx(ZEXT416((uint)(fVar229 + -1.0)),0);
                auVar14 = vpermilps_avx(ZEXT416((uint)(fVar233 * -9.0 + 4.0)),0);
                auVar215 = vshufps_avx(ZEXT416((uint)(fVar250 + -5.0)),
                                       ZEXT416((uint)(fVar250 + -5.0)),0);
                auVar126 = ZEXT416((uint)(fVar233 * -3.0 + 2.0));
                auVar156 = vshufps_avx(auVar126,auVar126,0);
                auVar126 = vdpps_avx(auVar381,auVar381,0x7f);
                auVar153._0_4_ =
                     local_a50 * auVar156._0_4_ +
                     local_a70 * auVar215._0_4_ +
                     local_a60 * auVar14._0_4_ + local_a80 * auVar157._0_4_;
                auVar153._4_4_ =
                     fStack_a4c * auVar156._4_4_ +
                     fStack_a6c * auVar215._4_4_ +
                     fStack_a5c * auVar14._4_4_ + fStack_a7c * auVar157._4_4_;
                auVar153._8_4_ =
                     fStack_a48 * auVar156._8_4_ +
                     fStack_a68 * auVar215._8_4_ +
                     fStack_a58 * auVar14._8_4_ + fStack_a78 * auVar157._8_4_;
                auVar153._12_4_ =
                     fStack_a44 * auVar156._12_4_ +
                     fStack_a64 * auVar215._12_4_ +
                     fStack_a54 * auVar14._12_4_ + fStack_a74 * auVar157._12_4_;
                auVar215 = vblendps_avx(auVar126,_DAT_01f7aa10,0xe);
                auVar156 = vrsqrtss_avx(auVar215,auVar215);
                fVar176 = auVar156._0_4_;
                fVar229 = auVar126._0_4_;
                auVar156 = vdpps_avx(auVar381,auVar153,0x7f);
                auVar157 = vshufps_avx(auVar126,auVar126,0);
                auVar154._0_4_ = auVar153._0_4_ * auVar157._0_4_;
                auVar154._4_4_ = auVar153._4_4_ * auVar157._4_4_;
                auVar154._8_4_ = auVar153._8_4_ * auVar157._8_4_;
                auVar154._12_4_ = auVar153._12_4_ * auVar157._12_4_;
                auVar156 = vshufps_avx(auVar156,auVar156,0);
                auVar238._0_4_ = auVar381._0_4_ * auVar156._0_4_;
                auVar238._4_4_ = auVar381._4_4_ * auVar156._4_4_;
                auVar238._8_4_ = auVar381._8_4_ * auVar156._8_4_;
                auVar238._12_4_ = auVar381._12_4_ * auVar156._12_4_;
                auVar14 = vsubps_avx(auVar154,auVar238);
                auVar156 = vrcpss_avx(auVar215,auVar215);
                auVar215 = vmaxss_avx(ZEXT416((uint)fVar231),
                                      ZEXT416((uint)(auVar404._0_4_ * (float)local_780._0_4_)));
                auVar156 = ZEXT416((uint)(auVar156._0_4_ * (2.0 - fVar229 * auVar156._0_4_)));
                auVar156 = vshufps_avx(auVar156,auVar156,0);
                uVar93 = CONCAT44(auVar381._4_4_,auVar381._0_4_);
                auVar257._0_8_ = uVar93 ^ 0x8000000080000000;
                auVar257._8_4_ = -auVar381._8_4_;
                auVar257._12_4_ = -auVar381._12_4_;
                auVar157 = ZEXT416((uint)(fVar176 * 1.5 +
                                         fVar229 * -0.5 * fVar176 * fVar176 * fVar176));
                auVar157 = vshufps_avx(auVar157,auVar157,0);
                auVar210._0_4_ = auVar157._0_4_ * auVar14._0_4_ * auVar156._0_4_;
                auVar210._4_4_ = auVar157._4_4_ * auVar14._4_4_ * auVar156._4_4_;
                auVar210._8_4_ = auVar157._8_4_ * auVar14._8_4_ * auVar156._8_4_;
                auVar210._12_4_ = auVar157._12_4_ * auVar14._12_4_ * auVar156._12_4_;
                auVar277._0_4_ = auVar381._0_4_ * auVar157._0_4_;
                auVar277._4_4_ = auVar381._4_4_ * auVar157._4_4_;
                auVar277._8_4_ = auVar381._8_4_ * auVar157._8_4_;
                auVar277._12_4_ = auVar381._12_4_ * auVar157._12_4_;
                if (fVar229 < 0.0) {
                  fVar229 = sqrtf(fVar229);
                }
                else {
                  auVar126 = vsqrtss_avx(auVar126,auVar126);
                  fVar229 = auVar126._0_4_;
                }
                auVar98._4_4_ = fStack_8bc;
                auVar98._0_4_ = local_8c0;
                auVar98._8_4_ = fStack_8b8;
                auVar98._12_4_ = fStack_8b4;
                auVar126 = vdpps_avx(auVar98,auVar277,0x7f);
                fVar229 = (fVar231 / fVar229) * (fVar235 + 1.0) + auVar215._0_4_ + fVar235 * fVar231
                ;
                auVar156 = vdpps_avx(auVar257,auVar277,0x7f);
                auVar157 = vdpps_avx(auVar98,auVar210,0x7f);
                auVar14 = vdpps_avx(_local_8f0,auVar277,0x7f);
                auVar15 = vdpps_avx(auVar98,auVar257,0x7f);
                fVar176 = auVar156._0_4_ + auVar157._0_4_;
                fVar233 = auVar126._0_4_;
                auVar122._0_4_ = fVar233 * fVar233;
                auVar122._4_4_ = auVar126._4_4_ * auVar126._4_4_;
                auVar122._8_4_ = auVar126._8_4_ * auVar126._8_4_;
                auVar122._12_4_ = auVar126._12_4_ * auVar126._12_4_;
                auVar157 = vsubps_avx(auVar190,auVar122);
                auVar156 = vdpps_avx(auVar98,_local_8f0,0x7f);
                fVar248 = auVar15._0_4_ - fVar233 * fVar176;
                fVar235 = auVar156._0_4_ - fVar233 * auVar14._0_4_;
                auVar156 = vrsqrtss_avx(auVar157,auVar157);
                fVar249 = auVar157._0_4_;
                fVar233 = auVar156._0_4_;
                fVar233 = fVar233 * 1.5 + fVar249 * -0.5 * fVar233 * fVar233 * fVar233;
                if (fVar249 < 0.0) {
                  local_920._0_4_ = fVar248;
                  local_940._0_4_ = fVar235;
                  fVar249 = sqrtf(fVar249);
                  fVar248 = (float)local_920._0_4_;
                  fVar235 = (float)local_940._0_4_;
                }
                else {
                  auVar156 = vsqrtss_avx(auVar157,auVar157);
                  fVar249 = auVar156._0_4_;
                }
                auVar15 = vpermilps_avx(local_980._0_16_,0xff);
                auVar16 = vshufps_avx(auVar381,auVar381,0xff);
                fVar248 = fVar248 * fVar233 - auVar16._0_4_;
                fVar235 = fVar235 * fVar233;
                auVar239._0_8_ = auVar14._0_8_ ^ 0x8000000080000000;
                auVar239._8_4_ = auVar14._8_4_ ^ 0x80000000;
                auVar239._12_4_ = auVar14._12_4_ ^ 0x80000000;
                auVar258._0_4_ = -fVar248;
                auVar258._4_4_ = 0x80000000;
                auVar258._8_4_ = 0x80000000;
                auVar258._12_4_ = 0x80000000;
                auVar156 = vinsertps_avx(auVar258,ZEXT416((uint)fVar235),0x1c);
                auVar14 = vmovsldup_avx(ZEXT416((uint)(fVar176 * fVar235 - auVar14._0_4_ * fVar248))
                                       );
                auVar156 = vdivps_avx(auVar156,auVar14);
                auVar157 = vinsertps_avx(ZEXT416((uint)fVar176),auVar239,0x10);
                auVar157 = vdivps_avx(auVar157,auVar14);
                auVar14 = vmovsldup_avx(auVar126);
                auVar160 = ZEXT416((uint)(fVar249 - auVar15._0_4_));
                auVar15 = vmovsldup_avx(auVar160);
                auVar182._0_4_ = auVar14._0_4_ * auVar156._0_4_ + auVar15._0_4_ * auVar157._0_4_;
                auVar182._4_4_ = auVar14._4_4_ * auVar156._4_4_ + auVar15._4_4_ * auVar157._4_4_;
                auVar182._8_4_ = auVar14._8_4_ * auVar156._8_4_ + auVar15._8_4_ * auVar157._8_4_;
                auVar182._12_4_ =
                     auVar14._12_4_ * auVar156._12_4_ + auVar15._12_4_ * auVar157._12_4_;
                auVar156 = vsubps_avx(auVar395,auVar182);
                auVar404 = ZEXT1664(auVar156);
                auVar183._8_4_ = 0x7fffffff;
                auVar183._0_8_ = 0x7fffffff7fffffff;
                auVar183._12_4_ = 0x7fffffff;
                auVar126 = vandps_avx(auVar126,auVar183);
                fVar176 = (float)local_960._0_4_;
                fVar233 = (float)local_960._4_4_;
                fVar235 = fStack_958;
                fVar248 = fStack_954;
                fVar249 = fStack_950;
                fVar250 = fStack_94c;
                fVar251 = fStack_948;
                if (auVar126._0_4_ < fVar229) {
                  auVar211._8_4_ = 0x7fffffff;
                  auVar211._0_8_ = 0x7fffffff7fffffff;
                  auVar211._12_4_ = 0x7fffffff;
                  auVar126 = vandps_avx(auVar160,auVar211);
                  if (auVar126._0_4_ <
                      (float)local_7c0._0_4_ * 1.9073486e-06 + auVar215._0_4_ + fVar229) {
                    fVar229 = auVar156._0_4_ + (float)local_870._0_4_;
                    if (fVar229 < fVar174) {
                      bVar116 = 0;
                    }
                    else {
                      fVar231 = *(float *)(ray + k * 4 + 0x80);
                      if (fVar231 < fVar229) {
                        bVar116 = 0;
                      }
                      else {
                        auVar215 = vmovshdup_avx(auVar156);
                        bVar116 = 0;
                        if ((0.0 <= auVar215._0_4_) && (auVar215._0_4_ <= 1.0)) {
                          auVar190 = vrsqrtss_avx(auVar190,auVar190);
                          fVar252 = auVar190._0_4_;
                          pGVar24 = (context->scene->geometries).items[uVar103].ptr;
                          if ((pGVar24->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                            bVar116 = 0;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar116 = 1, pGVar24->occlusionFilterN != (RTCFilterFunctionN)0x0
                                  )) {
                            auVar190 = ZEXT416((uint)(fVar252 * 1.5 +
                                                     fVar232 * -0.5 * fVar252 * fVar252 * fVar252));
                            auVar190 = vshufps_avx(auVar190,auVar190,0);
                            auVar184._0_4_ = auVar190._0_4_ * local_8c0;
                            auVar184._4_4_ = auVar190._4_4_ * fStack_8bc;
                            auVar184._8_4_ = auVar190._8_4_ * fStack_8b8;
                            auVar184._12_4_ = auVar190._12_4_ * fStack_8b4;
                            auVar123._0_4_ = auVar381._0_4_ + auVar16._0_4_ * auVar184._0_4_;
                            auVar123._4_4_ = auVar381._4_4_ + auVar16._4_4_ * auVar184._4_4_;
                            auVar123._8_4_ = auVar381._8_4_ + auVar16._8_4_ * auVar184._8_4_;
                            auVar123._12_4_ = auVar381._12_4_ + auVar16._12_4_ * auVar184._12_4_;
                            auVar190 = vshufps_avx(auVar184,auVar184,0xc9);
                            auVar215 = vshufps_avx(auVar381,auVar381,0xc9);
                            auVar185._0_4_ = auVar215._0_4_ * auVar184._0_4_;
                            auVar185._4_4_ = auVar215._4_4_ * auVar184._4_4_;
                            auVar185._8_4_ = auVar215._8_4_ * auVar184._8_4_;
                            auVar185._12_4_ = auVar215._12_4_ * auVar184._12_4_;
                            auVar212._0_4_ = auVar381._0_4_ * auVar190._0_4_;
                            auVar212._4_4_ = auVar381._4_4_ * auVar190._4_4_;
                            auVar212._8_4_ = auVar381._8_4_ * auVar190._8_4_;
                            auVar212._12_4_ = auVar381._12_4_ * auVar190._12_4_;
                            auVar126 = vsubps_avx(auVar212,auVar185);
                            auVar190 = vshufps_avx(auVar126,auVar126,0xc9);
                            auVar215 = vshufps_avx(auVar123,auVar123,0xc9);
                            auVar213._0_4_ = auVar215._0_4_ * auVar190._0_4_;
                            auVar213._4_4_ = auVar215._4_4_ * auVar190._4_4_;
                            auVar213._8_4_ = auVar215._8_4_ * auVar190._8_4_;
                            auVar213._12_4_ = auVar215._12_4_ * auVar190._12_4_;
                            auVar190 = vshufps_avx(auVar126,auVar126,0xd2);
                            auVar124._0_4_ = auVar123._0_4_ * auVar190._0_4_;
                            auVar124._4_4_ = auVar123._4_4_ * auVar190._4_4_;
                            auVar124._8_4_ = auVar123._8_4_ * auVar190._8_4_;
                            auVar124._12_4_ = auVar123._12_4_ * auVar190._12_4_;
                            auVar190 = vsubps_avx(auVar213,auVar124);
                            local_710 = vshufps_avx(auVar156,auVar156,0x55);
                            local_740 = (RTCHitN  [16])vshufps_avx(auVar190,auVar190,0x55);
                            auStack_730 = vshufps_avx(auVar190,auVar190,0xaa);
                            local_720 = vshufps_avx(auVar190,auVar190,0);
                            local_700 = ZEXT816(0) << 0x20;
                            local_6f0 = local_760._0_8_;
                            uStack_6e8 = local_760._8_8_;
                            local_6e0 = local_750._0_8_;
                            uStack_6d8 = local_750._8_8_;
                            uVar107 = context->user->instID[0];
                            _local_6d0 = CONCAT44(uVar107,uVar107);
                            _uStack_6c8 = CONCAT44(uVar107,uVar107);
                            uVar107 = context->user->instPrimID[0];
                            _uStack_6c0 = CONCAT44(uVar107,uVar107);
                            _uStack_6b8 = CONCAT44(uVar107,uVar107);
                            *(float *)(ray + k * 4 + 0x80) = fVar229;
                            auVar190 = *(undefined1 (*) [16])
                                        (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                            local_8a0._0_16_ = auVar190;
                            local_9b0.valid = (int *)local_8a0;
                            local_9b0.geometryUserPtr = pGVar24->userPtr;
                            local_9b0.context = context->user;
                            local_9b0.hit = local_740;
                            local_9b0.N = 4;
                            local_9b0.ray = (RTCRayN *)ray;
                            if (pGVar24->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar404 = ZEXT1664(auVar156);
                              (*pGVar24->occlusionFilterN)(&local_9b0);
                              auVar190 = local_8a0._0_16_;
                              fVar176 = (float)local_960._0_4_;
                              fVar233 = (float)local_960._4_4_;
                              fVar235 = fStack_958;
                              fVar248 = fStack_954;
                              fVar249 = fStack_950;
                              fVar250 = fStack_94c;
                              fVar251 = fStack_948;
                            }
                            if (auVar190 == (undefined1  [16])0x0) {
                              auVar190 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar190 = auVar190 ^ _DAT_01f7ae20;
                            }
                            else {
                              p_Var27 = context->args->filter;
                              if ((p_Var27 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar24->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar404 = ZEXT1664(auVar404._0_16_);
                                (*p_Var27)(&local_9b0);
                                auVar190 = local_8a0._0_16_;
                                fVar176 = (float)local_960._0_4_;
                                fVar233 = (float)local_960._4_4_;
                                fVar235 = fStack_958;
                                fVar248 = fStack_954;
                                fVar249 = fStack_950;
                                fVar250 = fStack_94c;
                                fVar251 = fStack_948;
                              }
                              auVar215 = vpcmpeqd_avx(auVar190,_DAT_01f7aa10);
                              auVar190 = auVar215 ^ _DAT_01f7ae20;
                              auVar186._8_4_ = 0xff800000;
                              auVar186._0_8_ = 0xff800000ff800000;
                              auVar186._12_4_ = 0xff800000;
                              auVar215 = vblendvps_avx(auVar186,*(undefined1 (*) [16])
                                                                 (local_9b0.ray + 0x80),auVar215);
                              *(undefined1 (*) [16])(local_9b0.ray + 0x80) = auVar215;
                            }
                            auVar155._8_8_ = 0x100000001;
                            auVar155._0_8_ = 0x100000001;
                            bVar116 = (auVar155 & auVar190) != (undefined1  [16])0x0;
                            if (!(bool)bVar116) {
                              *(float *)(ray + k * 4 + 0x80) = fVar231;
                            }
                          }
                        }
                      }
                    }
                    goto LAB_011aa091;
                  }
                }
                bVar115 = uVar106 < 4;
                uVar106 = uVar106 + 1;
              } while (uVar106 != 5);
              bVar115 = false;
              bVar116 = 5;
LAB_011aa091:
              bVar114 = (bool)(bVar114 | bVar115 & bVar116);
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar141._4_4_ = uVar8;
              auVar141._0_4_ = uVar8;
              auVar141._8_4_ = uVar8;
              auVar141._12_4_ = uVar8;
              auVar141._16_4_ = uVar8;
              auVar141._20_4_ = uVar8;
              auVar141._24_4_ = uVar8;
              auVar141._28_4_ = uVar8;
              auVar471 = vcmpps_avx(_local_8e0,auVar141,2);
              fVar229 = auVar471._28_4_;
              auVar130 = vandps_avx(auVar471,local_580);
              auVar336 = ZEXT3264(auVar130);
              auVar471 = local_580 & auVar471;
              local_580 = auVar130;
            } while ((((((((auVar471 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar471 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar471 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar471 >> 0x7f,0) != '\0') ||
                       (auVar471 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar471 >> 0xbf,0) != '\0') ||
                     (auVar471 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar471[0x1f] < '\0');
            auVar336 = ZEXT3264(local_360);
          }
          auVar172._0_4_ =
               fVar206 * (float)local_800._0_4_ +
               (float)local_7e0._0_4_ * (float)local_820._0_4_ + fVar176 * (float)local_840._0_4_;
          auVar172._4_4_ =
               fVar206 * (float)local_800._4_4_ +
               (float)local_7e0._4_4_ * (float)local_820._4_4_ + fVar233 * (float)local_840._4_4_;
          auVar172._8_4_ = fVar206 * fStack_7f8 + fStack_7d8 * fStack_818 + fVar235 * fStack_838;
          auVar172._12_4_ = fVar206 * fStack_7f4 + fStack_7d4 * fStack_814 + fVar248 * fStack_834;
          auVar172._16_4_ = fVar206 * fStack_7f0 + fStack_7d0 * fStack_810 + fVar249 * fStack_830;
          auVar172._20_4_ = fVar206 * fStack_7ec + fStack_7cc * fStack_80c + fVar250 * fStack_82c;
          auVar172._24_4_ = fVar206 * fStack_7e8 + fStack_7c8 * fStack_808 + fVar251 * fStack_828;
          auVar172._28_4_ = fVar229 + fVar229 + auVar336._28_4_;
          auVar200._8_4_ = 0x7fffffff;
          auVar200._0_8_ = 0x7fffffff7fffffff;
          auVar200._12_4_ = 0x7fffffff;
          auVar200._16_4_ = 0x7fffffff;
          auVar200._20_4_ = 0x7fffffff;
          auVar200._24_4_ = 0x7fffffff;
          auVar200._28_4_ = 0x7fffffff;
          auVar130 = vandps_avx(auVar172,auVar200);
          auVar201._8_4_ = 0x3e99999a;
          auVar201._0_8_ = 0x3e99999a3e99999a;
          auVar201._12_4_ = 0x3e99999a;
          auVar201._16_4_ = 0x3e99999a;
          auVar201._20_4_ = 0x3e99999a;
          auVar201._24_4_ = 0x3e99999a;
          auVar201._28_4_ = 0x3e99999a;
          auVar130 = vcmpps_avx(auVar130,auVar201,1);
          auVar471 = vorps_avx(auVar130,local_5e0);
          auVar202._0_4_ = (float)local_660._0_4_ + fVar178;
          auVar202._4_4_ = (float)local_660._4_4_ + fVar205;
          auVar202._8_4_ = fStack_658 + fVar405;
          auVar202._12_4_ = fStack_654 + fVar230;
          auVar202._16_4_ = fStack_650 + fVar178;
          auVar202._20_4_ = fStack_64c + fVar205;
          auVar202._24_4_ = fStack_648 + fVar405;
          auVar202._28_4_ = fStack_644 + fVar230;
          auVar130 = vcmpps_avx(auVar202,auVar141,2);
          _local_840 = vandps_avx(auVar130,local_680);
          auVar203._8_4_ = 3;
          auVar203._0_8_ = 0x300000003;
          auVar203._12_4_ = 3;
          auVar203._16_4_ = 3;
          auVar203._20_4_ = 3;
          auVar203._24_4_ = 3;
          auVar203._28_4_ = 3;
          auVar228._8_4_ = 2;
          auVar228._0_8_ = 0x200000002;
          auVar228._12_4_ = 2;
          auVar228._16_4_ = 2;
          auVar228._20_4_ = 2;
          auVar228._24_4_ = 2;
          auVar228._28_4_ = 2;
          auVar130 = vblendvps_avx(auVar228,auVar203,auVar471);
          auVar190 = vpcmpgtd_avx(auVar130._16_16_,local_620);
          auVar215 = vpshufd_avx(local_600._0_16_,0);
          auVar215 = vpcmpgtd_avx(auVar130._0_16_,auVar215);
          auVar204._16_16_ = auVar190;
          auVar204._0_16_ = auVar141._0_16_;
          _local_820 = vblendps_avx(ZEXT1632(auVar215),auVar204,0xf0);
          auVar130 = vandnps_avx(_local_820,_local_840);
          auVar471 = _local_840 & ~_local_820;
          local_8a0 = auVar130;
          if ((((((((auVar471 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar471 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar471 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar471 >> 0x7f,0) != '\0') ||
                (auVar471 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar471 >> 0xbf,0) != '\0') ||
              (auVar471 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar471[0x1f] < '\0') {
            local_800._4_4_ = fVar205 + local_360._4_4_;
            local_800._0_4_ = fVar178 + local_360._0_4_;
            fStack_7f8 = fVar405 + local_360._8_4_;
            fStack_7f4 = fVar230 + local_360._12_4_;
            fStack_7f0 = fVar178 + local_360._16_4_;
            fStack_7ec = fVar205 + local_360._20_4_;
            fStack_7e8 = fVar405 + local_360._24_4_;
            fStack_7e4 = fVar230 + local_360._28_4_;
            _local_8e0 = local_360;
            do {
              auVar143._8_4_ = 0x7f800000;
              auVar143._0_8_ = 0x7f8000007f800000;
              auVar143._12_4_ = 0x7f800000;
              auVar143._16_4_ = 0x7f800000;
              auVar143._20_4_ = 0x7f800000;
              auVar143._24_4_ = 0x7f800000;
              auVar143._28_4_ = 0x7f800000;
              auVar471 = vblendvps_avx(auVar143,_local_8e0,auVar130);
              auVar28 = vshufps_avx(auVar471,auVar471,0xb1);
              auVar28 = vminps_avx(auVar471,auVar28);
              auVar469 = vshufpd_avx(auVar28,auVar28,5);
              auVar28 = vminps_avx(auVar28,auVar469);
              auVar469 = vperm2f128_avx(auVar28,auVar28,1);
              auVar28 = vminps_avx(auVar28,auVar469);
              auVar28 = vcmpps_avx(auVar471,auVar28,0);
              auVar469 = auVar130 & auVar28;
              auVar471 = auVar130;
              if ((((((((auVar469 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar469 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar469 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar469 >> 0x7f,0) != '\0') ||
                    (auVar469 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar469 >> 0xbf,0) != '\0') ||
                  (auVar469 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar469[0x1f] < '\0') {
                auVar471 = vandps_avx(auVar28,auVar130);
              }
              uVar104 = vmovmskps_avx(auVar471);
              uVar107 = 0;
              if (uVar104 != 0) {
                for (; (uVar104 >> uVar107 & 1) == 0; uVar107 = uVar107 + 1) {
                }
              }
              uVar106 = (ulong)uVar107;
              local_8a0 = auVar130;
              *(undefined4 *)(local_8a0 + uVar106 * 4) = 0;
              fVar229 = local_1c0[uVar106];
              uVar107 = *(uint *)(local_340 + uVar106 * 4);
              fVar176 = auVar10._0_4_;
              if ((float)local_900._0_4_ < 0.0) {
                fVar176 = sqrtf((float)local_900._0_4_);
              }
              auVar215 = vminps_avx(auVar34,auVar12);
              auVar190 = vmaxps_avx(auVar34,auVar12);
              auVar126 = vminps_avx(auVar11,auVar13);
              auVar156 = vminps_avx(auVar215,auVar126);
              auVar215 = vmaxps_avx(auVar11,auVar13);
              auVar126 = vmaxps_avx(auVar190,auVar215);
              auVar214._8_4_ = 0x7fffffff;
              auVar214._0_8_ = 0x7fffffff7fffffff;
              auVar214._12_4_ = 0x7fffffff;
              auVar190 = vandps_avx(auVar156,auVar214);
              auVar215 = vandps_avx(auVar126,auVar214);
              auVar190 = vmaxps_avx(auVar190,auVar215);
              auVar215 = vmovshdup_avx(auVar190);
              auVar215 = vmaxss_avx(auVar215,auVar190);
              auVar190 = vshufpd_avx(auVar190,auVar190,1);
              auVar190 = vmaxss_avx(auVar190,auVar215);
              fVar231 = auVar190._0_4_ * 1.9073486e-06;
              local_780._0_4_ = fVar176 * 1.9073486e-06;
              local_7c0._0_16_ = vshufps_avx(auVar126,auVar126,0xff);
              auVar190 = vinsertps_avx(ZEXT416(uVar107),ZEXT416((uint)fVar229),0x10);
              auVar404 = ZEXT1664(auVar190);
              bVar115 = true;
              uVar106 = 0;
              do {
                auVar395 = auVar404._0_16_;
                auVar190 = vshufps_avx(auVar395,auVar395,0);
                auVar125._0_4_ = auVar190._0_4_ * (float)local_8f0._0_4_ + 0.0;
                auVar125._4_4_ = auVar190._4_4_ * (float)local_8f0._4_4_ + 0.0;
                auVar125._8_4_ = auVar190._8_4_ * fStack_8e8 + 0.0;
                auVar125._12_4_ = auVar190._12_4_ * fStack_8e4 + 0.0;
                auVar190 = vmovshdup_avx(auVar395);
                fVar233 = auVar190._0_4_;
                fVar176 = 1.0 - fVar233;
                fVar229 = fVar233 * 3.0;
                auVar190 = ZEXT416((uint)(fVar233 * fVar233 * -fVar176 * 0.5));
                auVar190 = vshufps_avx(auVar190,auVar190,0);
                auVar215 = ZEXT416((uint)((fVar176 * fVar176 * (fVar176 * 3.0 + -5.0) + 2.0) * 0.5))
                ;
                auVar215 = vshufps_avx(auVar215,auVar215,0);
                auVar126 = ZEXT416((uint)((fVar233 * fVar233 * (fVar229 + -5.0) + 2.0) * 0.5));
                auVar126 = vshufps_avx(auVar126,auVar126,0);
                auVar156 = ZEXT416((uint)(fVar176 * fVar176 * -fVar233 * 0.5));
                auVar156 = vshufps_avx(auVar156,auVar156,0);
                auVar187._0_4_ =
                     auVar156._0_4_ * local_a50 +
                     auVar126._0_4_ * local_a70 +
                     auVar215._0_4_ * local_a60 + auVar190._0_4_ * local_a80;
                auVar187._4_4_ =
                     auVar156._4_4_ * fStack_a4c +
                     auVar126._4_4_ * fStack_a6c +
                     auVar215._4_4_ * fStack_a5c + auVar190._4_4_ * fStack_a7c;
                auVar187._8_4_ =
                     auVar156._8_4_ * fStack_a48 +
                     auVar126._8_4_ * fStack_a68 +
                     auVar215._8_4_ * fStack_a58 + auVar190._8_4_ * fStack_a78;
                auVar187._12_4_ =
                     auVar156._12_4_ * fStack_a44 +
                     auVar126._12_4_ * fStack_a64 +
                     auVar215._12_4_ * fStack_a54 + auVar190._12_4_ * fStack_a74;
                local_980._0_16_ = auVar187;
                auVar190 = vsubps_avx(auVar125,auVar187);
                local_8c0 = auVar190._0_4_;
                fStack_8bc = auVar190._4_4_;
                fStack_8b8 = auVar190._8_4_;
                fStack_8b4 = auVar190._12_4_;
                auVar190 = vdpps_avx(auVar190,auVar190,0x7f);
                fVar232 = auVar190._0_4_;
                if (fVar232 < 0.0) {
                  local_920._0_4_ = fVar229;
                  local_940._0_4_ = fVar233 * 9.0;
                  local_7a0._0_4_ = fVar176 * -2.0;
                  fVar235 = sqrtf(fVar232);
                  fVar250 = (float)local_940._0_4_;
                  fVar248 = (float)local_7a0._0_4_;
                  fVar249 = (float)local_920._0_4_;
                }
                else {
                  auVar215 = vsqrtss_avx(auVar190,auVar190);
                  fVar235 = auVar215._0_4_;
                  fVar250 = fVar233 * 9.0;
                  fVar248 = fVar176 * -2.0;
                  fVar249 = fVar229;
                }
                auVar215 = ZEXT416((uint)((fVar233 * fVar233 + fVar233 * fVar248) * 0.5));
                auVar215 = vshufps_avx(auVar215,auVar215,0);
                auVar126 = ZEXT416((uint)(((fVar176 + fVar176) * (fVar249 + 2.0) +
                                          fVar176 * fVar176 * -3.0) * 0.5));
                auVar126 = vshufps_avx(auVar126,auVar126,0);
                auVar156 = ZEXT416((uint)(((fVar229 + -5.0) * (fVar233 + fVar233) +
                                          fVar233 * fVar249) * 0.5));
                auVar156 = vshufps_avx(auVar156,auVar156,0);
                auVar157 = ZEXT416((uint)((fVar233 * (fVar176 + fVar176) - fVar176 * fVar176) * 0.5)
                                  );
                auVar157 = vshufps_avx(auVar157,auVar157,0);
                auVar382._0_4_ =
                     local_a50 * auVar157._0_4_ +
                     local_a70 * auVar156._0_4_ +
                     local_a80 * auVar215._0_4_ + local_a60 * auVar126._0_4_;
                auVar382._4_4_ =
                     fStack_a4c * auVar157._4_4_ +
                     fStack_a6c * auVar156._4_4_ +
                     fStack_a7c * auVar215._4_4_ + fStack_a5c * auVar126._4_4_;
                auVar382._8_4_ =
                     fStack_a48 * auVar157._8_4_ +
                     fStack_a68 * auVar156._8_4_ +
                     fStack_a78 * auVar215._8_4_ + fStack_a58 * auVar126._8_4_;
                auVar382._12_4_ =
                     fStack_a44 * auVar157._12_4_ +
                     fStack_a64 * auVar156._12_4_ +
                     fStack_a74 * auVar215._12_4_ + fStack_a54 * auVar126._12_4_;
                auVar157 = vpermilps_avx(ZEXT416((uint)(fVar229 + -1.0)),0);
                auVar14 = vpermilps_avx(ZEXT416((uint)(fVar233 * -9.0 + 4.0)),0);
                auVar215 = vshufps_avx(ZEXT416((uint)(fVar250 + -5.0)),
                                       ZEXT416((uint)(fVar250 + -5.0)),0);
                auVar126 = ZEXT416((uint)(fVar233 * -3.0 + 2.0));
                auVar156 = vshufps_avx(auVar126,auVar126,0);
                auVar126 = vdpps_avx(auVar382,auVar382,0x7f);
                auVar158._0_4_ =
                     local_a50 * auVar156._0_4_ +
                     local_a70 * auVar215._0_4_ +
                     local_a60 * auVar14._0_4_ + local_a80 * auVar157._0_4_;
                auVar158._4_4_ =
                     fStack_a4c * auVar156._4_4_ +
                     fStack_a6c * auVar215._4_4_ +
                     fStack_a5c * auVar14._4_4_ + fStack_a7c * auVar157._4_4_;
                auVar158._8_4_ =
                     fStack_a48 * auVar156._8_4_ +
                     fStack_a68 * auVar215._8_4_ +
                     fStack_a58 * auVar14._8_4_ + fStack_a78 * auVar157._8_4_;
                auVar158._12_4_ =
                     fStack_a44 * auVar156._12_4_ +
                     fStack_a64 * auVar215._12_4_ +
                     fStack_a54 * auVar14._12_4_ + fStack_a74 * auVar157._12_4_;
                auVar215 = vblendps_avx(auVar126,_DAT_01f7aa10,0xe);
                auVar156 = vrsqrtss_avx(auVar215,auVar215);
                fVar176 = auVar156._0_4_;
                fVar229 = auVar126._0_4_;
                auVar156 = vdpps_avx(auVar382,auVar158,0x7f);
                auVar157 = vshufps_avx(auVar126,auVar126,0);
                auVar159._0_4_ = auVar158._0_4_ * auVar157._0_4_;
                auVar159._4_4_ = auVar158._4_4_ * auVar157._4_4_;
                auVar159._8_4_ = auVar158._8_4_ * auVar157._8_4_;
                auVar159._12_4_ = auVar158._12_4_ * auVar157._12_4_;
                auVar156 = vshufps_avx(auVar156,auVar156,0);
                auVar240._0_4_ = auVar382._0_4_ * auVar156._0_4_;
                auVar240._4_4_ = auVar382._4_4_ * auVar156._4_4_;
                auVar240._8_4_ = auVar382._8_4_ * auVar156._8_4_;
                auVar240._12_4_ = auVar382._12_4_ * auVar156._12_4_;
                auVar14 = vsubps_avx(auVar159,auVar240);
                auVar156 = vrcpss_avx(auVar215,auVar215);
                auVar215 = vmaxss_avx(ZEXT416((uint)fVar231),
                                      ZEXT416((uint)(auVar404._0_4_ * (float)local_780._0_4_)));
                auVar156 = ZEXT416((uint)(auVar156._0_4_ * (2.0 - fVar229 * auVar156._0_4_)));
                auVar156 = vshufps_avx(auVar156,auVar156,0);
                uVar93 = CONCAT44(auVar382._4_4_,auVar382._0_4_);
                auVar259._0_8_ = uVar93 ^ 0x8000000080000000;
                auVar259._8_4_ = -auVar382._8_4_;
                auVar259._12_4_ = -auVar382._12_4_;
                auVar157 = ZEXT416((uint)(fVar176 * 1.5 +
                                         fVar229 * -0.5 * fVar176 * fVar176 * fVar176));
                auVar157 = vshufps_avx(auVar157,auVar157,0);
                auVar216._0_4_ = auVar157._0_4_ * auVar14._0_4_ * auVar156._0_4_;
                auVar216._4_4_ = auVar157._4_4_ * auVar14._4_4_ * auVar156._4_4_;
                auVar216._8_4_ = auVar157._8_4_ * auVar14._8_4_ * auVar156._8_4_;
                auVar216._12_4_ = auVar157._12_4_ * auVar14._12_4_ * auVar156._12_4_;
                auVar278._0_4_ = auVar382._0_4_ * auVar157._0_4_;
                auVar278._4_4_ = auVar382._4_4_ * auVar157._4_4_;
                auVar278._8_4_ = auVar382._8_4_ * auVar157._8_4_;
                auVar278._12_4_ = auVar382._12_4_ * auVar157._12_4_;
                if (fVar229 < 0.0) {
                  fVar229 = sqrtf(fVar229);
                }
                else {
                  auVar126 = vsqrtss_avx(auVar126,auVar126);
                  fVar229 = auVar126._0_4_;
                }
                auVar99._4_4_ = fStack_8bc;
                auVar99._0_4_ = local_8c0;
                auVar99._8_4_ = fStack_8b8;
                auVar99._12_4_ = fStack_8b4;
                auVar126 = vdpps_avx(auVar99,auVar278,0x7f);
                fVar229 = (fVar231 / fVar229) * (fVar235 + 1.0) + auVar215._0_4_ + fVar235 * fVar231
                ;
                auVar156 = vdpps_avx(auVar259,auVar278,0x7f);
                auVar157 = vdpps_avx(auVar99,auVar216,0x7f);
                auVar14 = vdpps_avx(_local_8f0,auVar278,0x7f);
                auVar15 = vdpps_avx(auVar99,auVar259,0x7f);
                fVar176 = auVar156._0_4_ + auVar157._0_4_;
                fVar233 = auVar126._0_4_;
                auVar127._0_4_ = fVar233 * fVar233;
                auVar127._4_4_ = auVar126._4_4_ * auVar126._4_4_;
                auVar127._8_4_ = auVar126._8_4_ * auVar126._8_4_;
                auVar127._12_4_ = auVar126._12_4_ * auVar126._12_4_;
                auVar157 = vsubps_avx(auVar190,auVar127);
                auVar156 = vdpps_avx(auVar99,_local_8f0,0x7f);
                fVar248 = auVar15._0_4_ - fVar233 * fVar176;
                fVar235 = auVar156._0_4_ - fVar233 * auVar14._0_4_;
                auVar156 = vrsqrtss_avx(auVar157,auVar157);
                fVar249 = auVar157._0_4_;
                fVar233 = auVar156._0_4_;
                fVar233 = fVar233 * 1.5 + fVar249 * -0.5 * fVar233 * fVar233 * fVar233;
                if (fVar249 < 0.0) {
                  local_920._0_4_ = fVar248;
                  local_940._0_4_ = fVar235;
                  fVar249 = sqrtf(fVar249);
                  fVar248 = (float)local_920._0_4_;
                  fVar235 = (float)local_940._0_4_;
                }
                else {
                  auVar156 = vsqrtss_avx(auVar157,auVar157);
                  fVar249 = auVar156._0_4_;
                }
                auVar15 = vpermilps_avx(local_980._0_16_,0xff);
                auVar16 = vshufps_avx(auVar382,auVar382,0xff);
                fVar248 = fVar248 * fVar233 - auVar16._0_4_;
                fVar235 = fVar235 * fVar233;
                auVar241._0_8_ = auVar14._0_8_ ^ 0x8000000080000000;
                auVar241._8_4_ = auVar14._8_4_ ^ 0x80000000;
                auVar241._12_4_ = auVar14._12_4_ ^ 0x80000000;
                auVar260._0_4_ = -fVar248;
                auVar260._4_4_ = 0x80000000;
                auVar260._8_4_ = 0x80000000;
                auVar260._12_4_ = 0x80000000;
                auVar156 = vinsertps_avx(auVar260,ZEXT416((uint)fVar235),0x1c);
                auVar14 = vmovsldup_avx(ZEXT416((uint)(fVar176 * fVar235 - auVar14._0_4_ * fVar248))
                                       );
                auVar156 = vdivps_avx(auVar156,auVar14);
                auVar157 = vinsertps_avx(ZEXT416((uint)fVar176),auVar241,0x10);
                auVar157 = vdivps_avx(auVar157,auVar14);
                auVar14 = vmovsldup_avx(auVar126);
                auVar160 = ZEXT416((uint)(fVar249 - auVar15._0_4_));
                auVar15 = vmovsldup_avx(auVar160);
                auVar188._0_4_ = auVar14._0_4_ * auVar156._0_4_ + auVar15._0_4_ * auVar157._0_4_;
                auVar188._4_4_ = auVar14._4_4_ * auVar156._4_4_ + auVar15._4_4_ * auVar157._4_4_;
                auVar188._8_4_ = auVar14._8_4_ * auVar156._8_4_ + auVar15._8_4_ * auVar157._8_4_;
                auVar188._12_4_ =
                     auVar14._12_4_ * auVar156._12_4_ + auVar15._12_4_ * auVar157._12_4_;
                auVar156 = vsubps_avx(auVar395,auVar188);
                auVar404 = ZEXT1664(auVar156);
                auVar189._8_4_ = 0x7fffffff;
                auVar189._0_8_ = 0x7fffffff7fffffff;
                auVar189._12_4_ = 0x7fffffff;
                auVar126 = vandps_avx(auVar126,auVar189);
                if (auVar126._0_4_ < fVar229) {
                  auVar217._8_4_ = 0x7fffffff;
                  auVar217._0_8_ = 0x7fffffff7fffffff;
                  auVar217._12_4_ = 0x7fffffff;
                  auVar126 = vandps_avx(auVar160,auVar217);
                  if (auVar126._0_4_ <
                      (float)local_7c0._0_4_ * 1.9073486e-06 + auVar215._0_4_ + fVar229) {
                    fVar229 = auVar156._0_4_ + (float)local_870._0_4_;
                    if (fVar229 < fVar174) {
                      bVar116 = 0;
                    }
                    else {
                      fVar176 = *(float *)(ray + k * 4 + 0x80);
                      if (fVar176 < fVar229) {
                        bVar116 = 0;
                      }
                      else {
                        auVar215 = vmovshdup_avx(auVar156);
                        bVar116 = 0;
                        if ((0.0 <= auVar215._0_4_) && (auVar215._0_4_ <= 1.0)) {
                          auVar190 = vrsqrtss_avx(auVar190,auVar190);
                          fVar231 = auVar190._0_4_;
                          pGVar24 = (context->scene->geometries).items[uVar103].ptr;
                          if ((pGVar24->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                            bVar116 = 0;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar116 = 1, pGVar24->occlusionFilterN != (RTCFilterFunctionN)0x0
                                  )) {
                            auVar190 = ZEXT416((uint)(fVar231 * 1.5 +
                                                     fVar232 * -0.5 * fVar231 * fVar231 * fVar231));
                            auVar190 = vshufps_avx(auVar190,auVar190,0);
                            auVar191._0_4_ = auVar190._0_4_ * local_8c0;
                            auVar191._4_4_ = auVar190._4_4_ * fStack_8bc;
                            auVar191._8_4_ = auVar190._8_4_ * fStack_8b8;
                            auVar191._12_4_ = auVar190._12_4_ * fStack_8b4;
                            auVar128._0_4_ = auVar382._0_4_ + auVar16._0_4_ * auVar191._0_4_;
                            auVar128._4_4_ = auVar382._4_4_ + auVar16._4_4_ * auVar191._4_4_;
                            auVar128._8_4_ = auVar382._8_4_ + auVar16._8_4_ * auVar191._8_4_;
                            auVar128._12_4_ = auVar382._12_4_ + auVar16._12_4_ * auVar191._12_4_;
                            auVar190 = vshufps_avx(auVar191,auVar191,0xc9);
                            auVar215 = vshufps_avx(auVar382,auVar382,0xc9);
                            auVar192._0_4_ = auVar215._0_4_ * auVar191._0_4_;
                            auVar192._4_4_ = auVar215._4_4_ * auVar191._4_4_;
                            auVar192._8_4_ = auVar215._8_4_ * auVar191._8_4_;
                            auVar192._12_4_ = auVar215._12_4_ * auVar191._12_4_;
                            auVar218._0_4_ = auVar382._0_4_ * auVar190._0_4_;
                            auVar218._4_4_ = auVar382._4_4_ * auVar190._4_4_;
                            auVar218._8_4_ = auVar382._8_4_ * auVar190._8_4_;
                            auVar218._12_4_ = auVar382._12_4_ * auVar190._12_4_;
                            auVar126 = vsubps_avx(auVar218,auVar192);
                            auVar190 = vshufps_avx(auVar126,auVar126,0xc9);
                            auVar215 = vshufps_avx(auVar128,auVar128,0xc9);
                            auVar219._0_4_ = auVar215._0_4_ * auVar190._0_4_;
                            auVar219._4_4_ = auVar215._4_4_ * auVar190._4_4_;
                            auVar219._8_4_ = auVar215._8_4_ * auVar190._8_4_;
                            auVar219._12_4_ = auVar215._12_4_ * auVar190._12_4_;
                            auVar190 = vshufps_avx(auVar126,auVar126,0xd2);
                            auVar129._0_4_ = auVar128._0_4_ * auVar190._0_4_;
                            auVar129._4_4_ = auVar128._4_4_ * auVar190._4_4_;
                            auVar129._8_4_ = auVar128._8_4_ * auVar190._8_4_;
                            auVar129._12_4_ = auVar128._12_4_ * auVar190._12_4_;
                            auVar190 = vsubps_avx(auVar219,auVar129);
                            local_710 = vshufps_avx(auVar156,auVar156,0x55);
                            local_740 = (RTCHitN  [16])vshufps_avx(auVar190,auVar190,0x55);
                            auStack_730 = vshufps_avx(auVar190,auVar190,0xaa);
                            local_720 = vshufps_avx(auVar190,auVar190,0);
                            local_700 = ZEXT816(0) << 0x20;
                            local_6f0 = local_760._0_8_;
                            uStack_6e8 = local_760._8_8_;
                            local_6e0 = local_750._0_8_;
                            uStack_6d8 = local_750._8_8_;
                            uVar107 = context->user->instID[0];
                            _local_6d0 = CONCAT44(uVar107,uVar107);
                            _uStack_6c8 = CONCAT44(uVar107,uVar107);
                            uVar107 = context->user->instPrimID[0];
                            _uStack_6c0 = CONCAT44(uVar107,uVar107);
                            _uStack_6b8 = CONCAT44(uVar107,uVar107);
                            *(float *)(ray + k * 4 + 0x80) = fVar229;
                            local_860 = *(undefined1 (*) [16])
                                         (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                            local_9b0.valid = (int *)local_860;
                            local_9b0.geometryUserPtr = pGVar24->userPtr;
                            local_9b0.context = context->user;
                            local_9b0.hit = local_740;
                            local_9b0.N = 4;
                            local_9b0.ray = (RTCRayN *)ray;
                            if (pGVar24->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar404 = ZEXT1664(auVar156);
                              (*pGVar24->occlusionFilterN)(&local_9b0);
                            }
                            if (local_860 == (undefined1  [16])0x0) {
                              auVar190 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar190 = auVar190 ^ _DAT_01f7ae20;
                            }
                            else {
                              p_Var27 = context->args->filter;
                              if ((p_Var27 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar24->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar404 = ZEXT1664(auVar404._0_16_);
                                (*p_Var27)(&local_9b0);
                              }
                              auVar215 = vpcmpeqd_avx(local_860,_DAT_01f7aa10);
                              auVar190 = auVar215 ^ _DAT_01f7ae20;
                              auVar193._8_4_ = 0xff800000;
                              auVar193._0_8_ = 0xff800000ff800000;
                              auVar193._12_4_ = 0xff800000;
                              auVar215 = vblendvps_avx(auVar193,*(undefined1 (*) [16])
                                                                 (local_9b0.ray + 0x80),auVar215);
                              *(undefined1 (*) [16])(local_9b0.ray + 0x80) = auVar215;
                            }
                            auVar161._8_8_ = 0x100000001;
                            auVar161._0_8_ = 0x100000001;
                            bVar116 = (auVar161 & auVar190) != (undefined1  [16])0x0;
                            if (!(bool)bVar116) {
                              *(float *)(ray + k * 4 + 0x80) = fVar176;
                            }
                          }
                        }
                      }
                    }
                    goto LAB_011aacf0;
                  }
                }
                bVar115 = uVar106 < 4;
                uVar106 = uVar106 + 1;
              } while (uVar106 != 5);
              bVar115 = false;
              bVar116 = 5;
LAB_011aacf0:
              bVar114 = (bool)(bVar114 | bVar115 & bVar116);
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar141._4_4_ = uVar8;
              auVar141._0_4_ = uVar8;
              auVar141._8_4_ = uVar8;
              auVar141._12_4_ = uVar8;
              auVar141._16_4_ = uVar8;
              auVar141._20_4_ = uVar8;
              auVar141._24_4_ = uVar8;
              auVar141._28_4_ = uVar8;
              auVar471 = vcmpps_avx(_local_800,auVar141,2);
              auVar130 = vandps_avx(auVar471,local_8a0);
              auVar471 = local_8a0 & auVar471;
              local_8a0 = auVar130;
            } while ((((((((auVar471 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar471 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar471 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar471 >> 0x7f,0) != '\0') ||
                       (auVar471 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar471 >> 0xbf,0) != '\0') ||
                     (auVar471 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar471[0x1f] < '\0');
          }
          auVar336 = ZEXT3264(local_360);
          auVar130 = vandps_avx(local_5c0,local_5a0);
          auVar471 = vandps_avx(_local_840,_local_820);
          auVar246._0_4_ = fVar178 + local_3a0._0_4_;
          auVar246._4_4_ = fVar205 + local_3a0._4_4_;
          auVar246._8_4_ = fVar405 + local_3a0._8_4_;
          auVar246._12_4_ = fVar230 + local_3a0._12_4_;
          auVar246._16_4_ = fVar178 + local_3a0._16_4_;
          auVar246._20_4_ = fVar205 + local_3a0._20_4_;
          auVar246._24_4_ = fVar405 + local_3a0._24_4_;
          auVar246._28_4_ = fVar230 + local_3a0._28_4_;
          auVar28 = vcmpps_avx(auVar246,auVar141,2);
          auVar130 = vandps_avx(auVar28,auVar130);
          auVar247._0_4_ = local_360._0_4_ + fVar178;
          auVar247._4_4_ = local_360._4_4_ + fVar205;
          auVar247._8_4_ = local_360._8_4_ + fVar405;
          auVar247._12_4_ = local_360._12_4_ + fVar230;
          auVar247._16_4_ = local_360._16_4_ + fVar178;
          auVar247._20_4_ = local_360._20_4_ + fVar205;
          auVar247._24_4_ = local_360._24_4_ + fVar405;
          auVar247._28_4_ = local_360._28_4_ + fVar230;
          auVar28 = vcmpps_avx(auVar247,auVar141,2);
          auVar471 = vandps_avx(auVar28,auVar471);
          auVar471 = vorps_avx(auVar130,auVar471);
          if ((((((((auVar471 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar471 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar471 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar471 >> 0x7f,0) != '\0') ||
                (auVar471 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar471 >> 0xbf,0) != '\0') ||
              (auVar471 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar471[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar110 * 0x60) = auVar471;
            auVar130 = vblendvps_avx(local_360,_local_3a0,auVar130);
            *(undefined1 (*) [32])(auStack_160 + uVar110 * 0x60) = auVar130;
            uVar9 = vmovlps_avx(local_550);
            (&uStack_140)[uVar110 * 0xc] = uVar9;
            aiStack_138[uVar110 * 0x18] = local_be8 + 1;
            iVar109 = iVar109 + 1;
          }
        }
      }
    }
    if (iVar109 == 0) break;
    uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar138._4_4_ = uVar8;
    auVar138._0_4_ = uVar8;
    auVar138._8_4_ = uVar8;
    auVar138._12_4_ = uVar8;
    auVar138._16_4_ = uVar8;
    auVar138._20_4_ = uVar8;
    auVar138._24_4_ = uVar8;
    auVar138._28_4_ = uVar8;
    uVar107 = -iVar109;
    pauVar105 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar109 - 1) * 0x60);
    while( true ) {
      auVar130 = pauVar105[1];
      auVar167._0_4_ = fVar178 + auVar130._0_4_;
      auVar167._4_4_ = fVar205 + auVar130._4_4_;
      auVar167._8_4_ = fVar405 + auVar130._8_4_;
      auVar167._12_4_ = fVar230 + auVar130._12_4_;
      auVar167._16_4_ = fVar178 + auVar130._16_4_;
      auVar167._20_4_ = fVar205 + auVar130._20_4_;
      auVar167._24_4_ = fVar405 + auVar130._24_4_;
      auVar167._28_4_ = fVar230 + auVar130._28_4_;
      auVar471 = vcmpps_avx(auVar167,auVar138,2);
      _local_740 = vandps_avx(auVar471,*pauVar105);
      auVar471 = *pauVar105 & auVar471;
      if ((((((((auVar471 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar471 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar471 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar471 >> 0x7f,0) != '\0') ||
            (auVar471 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar471 >> 0xbf,0) != '\0') ||
          (auVar471 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar471[0x1f] < '\0') break;
      pauVar105 = pauVar105 + -3;
      uVar107 = uVar107 + 1;
      if (uVar107 == 0) goto LAB_011ab1e7;
    }
    auVar139._8_4_ = 0x7f800000;
    auVar139._0_8_ = 0x7f8000007f800000;
    auVar139._12_4_ = 0x7f800000;
    auVar139._16_4_ = 0x7f800000;
    auVar139._20_4_ = 0x7f800000;
    auVar139._24_4_ = 0x7f800000;
    auVar139._28_4_ = 0x7f800000;
    auVar130 = vblendvps_avx(auVar139,auVar130,_local_740);
    auVar471 = vshufps_avx(auVar130,auVar130,0xb1);
    auVar471 = vminps_avx(auVar130,auVar471);
    auVar28 = vshufpd_avx(auVar471,auVar471,5);
    auVar471 = vminps_avx(auVar471,auVar28);
    auVar28 = vperm2f128_avx(auVar471,auVar471,1);
    auVar471 = vminps_avx(auVar471,auVar28);
    auVar471 = vcmpps_avx(auVar130,auVar471,0);
    auVar28 = _local_740 & auVar471;
    auVar130 = _local_740;
    if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar28 >> 0x7f,0) != '\0') ||
          (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar28 >> 0xbf,0) != '\0') ||
        (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar28[0x1f] < '\0')
    {
      auVar130 = vandps_avx(auVar471,_local_740);
    }
    auVar120._8_8_ = 0;
    auVar120._0_8_ = *(ulong *)pauVar105[2];
    local_be8 = *(uint *)(pauVar105[2] + 8);
    uVar108 = vmovmskps_avx(auVar130);
    uVar104 = 0;
    if (uVar108 != 0) {
      for (; (uVar108 >> uVar104 & 1) == 0; uVar104 = uVar104 + 1) {
      }
    }
    *(undefined4 *)(local_740 + (ulong)uVar104 * 4) = 0;
    *pauVar105 = _local_740;
    uVar108 = ~uVar107;
    if ((((((((_local_740 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_740 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_740 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_740 >> 0x7f,0) != '\0') ||
          (_local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_740 >> 0xbf,0) != '\0') ||
        (_local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_740[0x1f] < '\0') {
      uVar108 = -uVar107;
    }
    uVar110 = (ulong)uVar108;
    auVar190 = vshufps_avx(auVar120,auVar120,0);
    auVar215 = vshufps_avx(auVar120,auVar120,0x55);
    auVar215 = vsubps_avx(auVar215,auVar190);
    local_3a0._4_4_ = auVar190._4_4_ + auVar215._4_4_ * 0.14285715;
    local_3a0._0_4_ = auVar190._0_4_ + auVar215._0_4_ * 0.0;
    fStack_398 = auVar190._8_4_ + auVar215._8_4_ * 0.2857143;
    fStack_394 = auVar190._12_4_ + auVar215._12_4_ * 0.42857146;
    fStack_390 = auVar190._0_4_ + auVar215._0_4_ * 0.5714286;
    fStack_38c = auVar190._4_4_ + auVar215._4_4_ * 0.71428573;
    fStack_388 = auVar190._8_4_ + auVar215._8_4_ * 0.8571429;
    fStack_384 = auVar190._12_4_ + auVar215._12_4_;
    local_550._8_8_ = 0;
    local_550._0_8_ = *(ulong *)(local_3a0 + (ulong)uVar104 * 4);
  } while( true );
LAB_011ab1e7:
  if (bVar114 != false) {
    return bVar114;
  }
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar145._4_4_ = uVar8;
  auVar145._0_4_ = uVar8;
  auVar145._8_4_ = uVar8;
  auVar145._12_4_ = uVar8;
  auVar145._16_4_ = uVar8;
  auVar145._20_4_ = uVar8;
  auVar145._24_4_ = uVar8;
  auVar145._28_4_ = uVar8;
  auVar130 = vcmpps_avx(local_2c0,auVar145,2);
  uVar103 = vmovmskps_avx(auVar130);
  uVar103 = (uint)local_848 - 1 & (uint)local_848 & uVar103;
  if (uVar103 == 0) {
    return false;
  }
  goto LAB_011a841d;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }